

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution_x86_fma::forward
          (Deconvolution_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int *piVar11;
  float *pfVar12;
  size_t sVar13;
  size_t sVar14;
  _func_int **pp_Var15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  long lVar34;
  Mat *pMVar35;
  int iVar36;
  int iVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  _func_int *p_Var45;
  long lVar46;
  ulong uVar47;
  ulong uVar48;
  long lVar49;
  _func_int **pp_Var50;
  uint uVar51;
  int iVar52;
  int iVar53;
  _func_int *p_Var54;
  ulong uVar55;
  _func_int ***ppp_Var56;
  uint uVar57;
  int iVar58;
  int iVar59;
  int i;
  uint uVar60;
  int iVar61;
  long lVar62;
  ulong uVar63;
  int iVar64;
  ulong uVar65;
  ulong uVar66;
  void *pvVar67;
  void *pvVar68;
  int y_4;
  int y_3;
  int iVar69;
  void *pvVar70;
  long lVar71;
  long lVar72;
  ulong uVar73;
  int y;
  ulong uVar74;
  float fVar75;
  float fVar76;
  __m128 one;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  __m128 pos;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [28];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar165 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar183 [16];
  undefined1 auVar245 [32];
  float fVar246;
  float fVar247;
  undefined1 auVar248 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar249 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [64];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [64];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [64];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [64];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  undefined1 auVar406 [64];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  undefined1 auVar435 [32];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [32];
  undefined1 auVar443 [32];
  undefined1 auVar444 [32];
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [64];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [32];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 auVar461 [64];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [32];
  undefined1 auVar465 [32];
  undefined1 auVar466 [32];
  undefined1 auVar467 [32];
  undefined1 auVar468 [64];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [32];
  undefined1 auVar472 [32];
  undefined1 auVar473 [32];
  undefined1 auVar474 [32];
  undefined1 auVar475 [32];
  undefined1 auVar476 [32];
  undefined1 auVar477 [32];
  undefined1 auVar478 [32];
  undefined1 auVar479 [32];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [32];
  undefined1 auVar487 [32];
  undefined1 auVar488 [32];
  undefined1 auVar489 [32];
  undefined1 auVar490 [32];
  undefined1 auVar492 [36];
  undefined1 auVar491 [64];
  _func_int ***local_188;
  _func_int ***local_128;
  _func_int ***local_108;
  Mat local_b8;
  _func_int **local_68;
  Mat *local_60;
  Allocator *local_58;
  long local_50;
  ulong local_48;
  long local_40;
  Option *local_38;
  undefined1 auVar92 [32];
  undefined1 auVar95 [32];
  undefined1 auVar136 [32];
  undefined1 auVar145 [32];
  undefined1 auVar159 [32];
  undefined1 auVar239 [32];
  
  iVar59 = bottom_blob->w;
  iVar7 = bottom_blob->h;
  uVar65 = bottom_blob->elemsize;
  iVar61 = bottom_blob->elempack;
  p_Var45 = this->_vptr_Deconvolution_x86_fma[-3];
  if (opt->use_packing_layout == true) {
    uVar51 = 8;
    if ((*(uint *)(&this->field_0xd0 + (long)p_Var45) & 7) != 0) {
      uVar51 = (uint)((*(uint *)(&this->field_0xd0 + (long)p_Var45) & 3) == 0) * 3 + 1;
    }
  }
  else {
    uVar51 = 1;
  }
  iVar52 = (*(int *)(&this->field_0xd4 + (long)p_Var45) + -1) *
           *(int *)(&this->field_0xdc + (long)p_Var45);
  iVar58 = *(int *)(&this->field_0xe4 + (long)p_Var45);
  iVar53 = (*(int *)(&this->field_0xd8 + (long)p_Var45) + -1) *
           *(int *)(&this->field_0xe0 + (long)p_Var45);
  iVar64 = *(int *)(&this->field_0xe8 + (long)p_Var45);
  iVar69 = *(int *)(&this->field_0xfc + (long)p_Var45);
  iVar42 = *(int *)(&this->field_0x100 + (long)p_Var45);
  local_b8.cstep = 0;
  local_b8.data = (Allocator *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_b8.elempack = 0;
  local_b8.h = 0;
  p_Var54 = this->_vptr_Deconvolution_x86_fma[-3];
  p_Var45 = (_func_int *)((long)&this->_vptr_Deconvolution_x86_fma + (long)p_Var54);
  lVar49 = 0x10;
  local_b8.allocator = (Allocator *)local_b8.data;
  local_b8.dims = (int)local_b8.refcount;
  local_b8.w = local_b8.refcount._4_4_;
  local_b8.d = (int)local_b8.refcount;
  local_b8.c = local_b8.elempack;
  if (((((*(int *)(&this->field_0xec + (long)p_Var54) < 1) && (*(int *)(p_Var45 + 0xf0) < 1)) &&
       (*(int *)(p_Var45 + 0xf4) < 1)) && (*(int *)(p_Var45 + 0xf8) < 1)) &&
     ((*(int *)(p_Var45 + 0x104) < 1 || (*(int *)(p_Var45 + 0x108) < 1)))) {
    if (&local_b8 != top_blob) {
      piVar11 = top_blob->refcount;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      local_b8.data = top_blob->data;
      local_b8.refcount._0_4_ = (int)top_blob->refcount;
      local_b8.refcount._4_4_ = (uint)((ulong)top_blob->refcount >> 0x20);
      local_b8.elemsize = top_blob->elemsize;
      local_b8.elempack = top_blob->elempack;
      local_b8.allocator = top_blob->allocator;
      uVar3 = top_blob->dims;
      uVar4 = top_blob->w;
      uVar5 = top_blob->h;
      uVar6 = top_blob->d;
      local_b8.c = top_blob->c;
      local_b8.cstep = top_blob->cstep;
      p_Var54 = this->_vptr_Deconvolution_x86_fma[-3];
      local_b8.dims = uVar3;
      local_b8.w = uVar4;
      local_b8.h = uVar5;
      local_b8.d = uVar6;
    }
    p_Var45 = (_func_int *)((long)&this->_vptr_Deconvolution_x86_fma + (long)p_Var54);
    lVar49 = 8;
  }
  local_60 = top_blob;
  local_38 = opt;
  Mat::create(&local_b8,iVar69 + (iVar59 + -1) * iVar58 + iVar52 + 1,
              (iVar7 + -1) * iVar64 + iVar53 + iVar42 + 1,*(int *)(p_Var45 + 0xd0) / (int)uVar51,
              (uVar65 / (ulong)(long)iVar61) * (ulong)uVar51,uVar51,
              *(Allocator **)(&opt->lightmode + lVar49));
  iVar59 = -100;
  if (((Allocator *)local_b8.data != (Allocator *)0x0) && (local_b8.cstep * (long)local_b8.c != 0))
  {
    local_68 = this->_vptr_Deconvolution_x86_fma;
    p_Var45 = local_68[-3];
    uVar8 = *(uint *)(&this->field_0xd4 + (long)p_Var45);
    local_40 = (long)(int)uVar8;
    uVar9 = *(uint *)(&this->field_0xd8 + (long)p_Var45);
    if ((iVar61 == 8) && (uVar51 == 8)) {
      iVar59 = *(int *)(&this->field_0xdc + (long)p_Var45);
      iVar7 = *(int *)(&this->field_0xe0 + (long)p_Var45);
      iVar58 = *(int *)(&this->field_0xe4 + (long)p_Var45);
      iVar64 = *(int *)(&this->field_0xe8 + (long)p_Var45);
      iVar69 = *(int *)(&this->field_0x114 + (long)p_Var45);
      lVar49 = *(long *)(&this->field_0x1a8 + (long)p_Var45);
      uVar65 = 0;
      if (0 < (int)uVar8) {
        uVar65 = (ulong)uVar8;
      }
      uVar73 = 0;
      if (0 < (int)uVar9) {
        uVar73 = (ulong)uVar9;
      }
      uVar10 = local_b8.c;
      if (local_b8.c < 1) {
        uVar10 = 0;
      }
      auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar325 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar370 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar471._8_4_ = 0x3e2aaaaa;
      auVar471._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar471._12_4_ = 0x3e2aaaaa;
      auVar471._16_4_ = 0x3e2aaaaa;
      auVar471._20_4_ = 0x3e2aaaaa;
      auVar471._24_4_ = 0x3e2aaaaa;
      auVar471._28_4_ = 0x3e2aaaaa;
      auVar107._8_4_ = 0x3f800000;
      auVar107._0_8_ = 0x3f8000003f800000;
      auVar107._12_4_ = 0x3f800000;
      for (uVar55 = 0; uVar55 != uVar10; uVar55 = uVar55 + 1) {
        local_108 = (_func_int ***)
                    ((long)(_func_int ***)local_b8.data +
                    local_b8.cstep * uVar55 * local_b8.elemsize);
        iVar42 = bottom_blob->w;
        iVar43 = bottom_blob->h;
        uVar57 = 0;
        uVar39 = bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar39 = uVar57;
        }
        uVar60 = local_b8.w;
        if (local_b8.w < 1) {
          uVar60 = uVar57;
        }
        uVar40 = local_b8.h;
        if (local_b8.h < 1) {
          uVar40 = uVar57;
        }
        for (; uVar57 != uVar40; uVar57 = uVar57 + 1) {
          iVar44 = (1 - uVar8) * iVar59;
          for (uVar38 = 0; uVar38 != uVar60; uVar38 = uVar38 + 1) {
            if (lVar49 == 0) {
              auVar164 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar164 = ZEXT3264(*(undefined1 (*) [32])(lVar49 + uVar55 * 0x20));
            }
            pvVar67 = bottom_blob->data;
            lVar71 = (long)(this->weight_data_tm).data +
                     (this->weight_data_tm).cstep * uVar55 * (this->weight_data_tm).elemsize + 0xe0;
            for (uVar47 = 0; uVar47 != uVar39; uVar47 = uVar47 + 1) {
              lVar72 = lVar71;
              for (uVar74 = 0; uVar74 != uVar73; uVar74 = uVar74 + 1) {
                iVar36 = (((int)uVar74 - uVar9) + 1) * iVar7 + uVar57;
                if (((-1 < iVar36) && (iVar37 = iVar36 / iVar64, iVar36 % iVar64 == 0)) &&
                   (iVar37 < iVar43)) {
                  lVar34 = (long)iVar37 * (long)bottom_blob->w * bottom_blob->elemsize +
                           bottom_blob->cstep * bottom_blob->elemsize * uVar47;
                  iVar36 = iVar44;
                  for (lVar62 = 0; uVar65 * 0x100 != lVar62; lVar62 = lVar62 + 0x100) {
                    if (((-1 < iVar36) && (iVar37 = iVar36 / iVar58, iVar36 % iVar58 == 0)) &&
                       (iVar37 < iVar42)) {
                      lVar46 = (long)(iVar37 << 3);
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34);
                      auVar144._4_4_ = uVar1;
                      auVar144._0_4_ = uVar1;
                      auVar144._8_4_ = uVar1;
                      auVar144._12_4_ = uVar1;
                      auVar144._16_4_ = uVar1;
                      auVar144._20_4_ = uVar1;
                      auVar144._24_4_ = uVar1;
                      auVar144._28_4_ = uVar1;
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34 + 4);
                      auVar135._4_4_ = uVar1;
                      auVar135._0_4_ = uVar1;
                      auVar135._8_4_ = uVar1;
                      auVar135._12_4_ = uVar1;
                      auVar135._16_4_ = uVar1;
                      auVar135._20_4_ = uVar1;
                      auVar135._24_4_ = uVar1;
                      auVar135._28_4_ = uVar1;
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34 + 8);
                      auVar90._4_4_ = uVar1;
                      auVar90._0_4_ = uVar1;
                      auVar90._8_4_ = uVar1;
                      auVar90._12_4_ = uVar1;
                      auVar90._16_4_ = uVar1;
                      auVar90._20_4_ = uVar1;
                      auVar90._24_4_ = uVar1;
                      auVar90._28_4_ = uVar1;
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34 + 0xc);
                      auVar428._4_4_ = uVar1;
                      auVar428._0_4_ = uVar1;
                      auVar428._8_4_ = uVar1;
                      auVar428._12_4_ = uVar1;
                      auVar428._16_4_ = uVar1;
                      auVar428._20_4_ = uVar1;
                      auVar428._24_4_ = uVar1;
                      auVar428._28_4_ = uVar1;
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34 + 0x10);
                      auVar442._4_4_ = uVar1;
                      auVar442._0_4_ = uVar1;
                      auVar442._8_4_ = uVar1;
                      auVar442._12_4_ = uVar1;
                      auVar442._16_4_ = uVar1;
                      auVar442._20_4_ = uVar1;
                      auVar442._24_4_ = uVar1;
                      auVar442._28_4_ = uVar1;
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34 + 0x14);
                      auVar486._4_4_ = uVar1;
                      auVar486._0_4_ = uVar1;
                      auVar486._8_4_ = uVar1;
                      auVar486._12_4_ = uVar1;
                      auVar486._16_4_ = uVar1;
                      auVar486._20_4_ = uVar1;
                      auVar486._24_4_ = uVar1;
                      auVar486._28_4_ = uVar1;
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34 + 0x18);
                      auVar154._4_4_ = uVar1;
                      auVar154._0_4_ = uVar1;
                      auVar154._8_4_ = uVar1;
                      auVar154._12_4_ = uVar1;
                      auVar154._16_4_ = uVar1;
                      auVar154._20_4_ = uVar1;
                      auVar154._24_4_ = uVar1;
                      auVar154._28_4_ = uVar1;
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34 + 0x1c);
                      auVar464._4_4_ = uVar1;
                      auVar464._0_4_ = uVar1;
                      auVar464._8_4_ = uVar1;
                      auVar464._12_4_ = uVar1;
                      auVar464._16_4_ = uVar1;
                      auVar464._20_4_ = uVar1;
                      auVar464._24_4_ = uVar1;
                      auVar464._28_4_ = uVar1;
                      auVar248 = vfmadd231ps_fma(auVar164._0_32_,auVar144,
                                                 *(undefined1 (*) [32])(lVar72 + -0xe0 + lVar62));
                      auVar248 = vfmadd231ps_fma(ZEXT1632(auVar248),auVar135,
                                                 *(undefined1 (*) [32])(lVar72 + -0xc0 + lVar62));
                      auVar248 = vfmadd231ps_fma(ZEXT1632(auVar248),auVar90,
                                                 *(undefined1 (*) [32])(lVar72 + -0xa0 + lVar62));
                      auVar248 = vfmadd231ps_fma(ZEXT1632(auVar248),auVar428,
                                                 *(undefined1 (*) [32])(lVar72 + -0x80 + lVar62));
                      auVar248 = vfmadd231ps_fma(ZEXT1632(auVar248),auVar442,
                                                 *(undefined1 (*) [32])(lVar72 + -0x60 + lVar62));
                      auVar248 = vfmadd231ps_fma(ZEXT1632(auVar248),auVar486,
                                                 *(undefined1 (*) [32])(lVar72 + -0x40 + lVar62));
                      auVar248 = vfmadd231ps_fma(ZEXT1632(auVar248),auVar154,
                                                 *(undefined1 (*) [32])(lVar72 + -0x20 + lVar62));
                      auVar248 = vfmadd231ps_fma(ZEXT1632(auVar248),auVar464,
                                                 *(undefined1 (*) [32])(lVar72 + lVar62));
                      auVar164 = ZEXT1664(auVar248);
                    }
                    iVar36 = iVar36 + iVar59;
                  }
                }
                lVar72 = lVar72 + local_40 * 0x100;
              }
              lVar71 = lVar71 + (long)(int)(uVar8 * uVar9 * 0x40) * 4;
            }
            auVar135 = auVar164._0_32_;
            auVar144 = auVar135;
            if (5 < iVar69 - 1U) goto switchD_002835e2_caseD_1;
            auVar90 = auVar97._0_32_;
            auVar144 = vmaxps_avx(auVar135,auVar90);
            auVar492 = ZEXT436(auVar144._28_4_);
            auVar442 = auVar370._0_32_;
            auVar428 = auVar325._0_32_;
            fVar76 = auVar370._0_4_;
            fVar75 = auVar370._4_4_;
            fVar2 = auVar370._8_4_;
            fVar246 = auVar370._12_4_;
            fVar247 = auVar370._16_4_;
            fVar16 = auVar370._20_4_;
            fVar17 = auVar370._24_4_;
            fVar18 = auVar370._28_4_;
            switch(iVar69) {
            case 2:
              auVar135 = vminps_avx(auVar135,auVar90);
              uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var45);
              auVar213._4_4_ = uVar1;
              auVar213._0_4_ = uVar1;
              auVar213._8_4_ = uVar1;
              auVar213._12_4_ = uVar1;
              auVar213._16_4_ = uVar1;
              auVar213._20_4_ = uVar1;
              auVar213._24_4_ = uVar1;
              auVar213._28_4_ = uVar1;
              auVar248 = vfmadd231ps_fma(auVar144,auVar135,auVar213);
              auVar144 = ZEXT1632(auVar248);
              break;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var45);
              auVar220._4_4_ = uVar1;
              auVar220._0_4_ = uVar1;
              auVar220._8_4_ = uVar1;
              auVar220._12_4_ = uVar1;
              auVar220._16_4_ = uVar1;
              auVar220._20_4_ = uVar1;
              auVar220._24_4_ = uVar1;
              auVar220._28_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var45))[1];
              auVar488._4_4_ = uVar1;
              auVar488._0_4_ = uVar1;
              auVar488._8_4_ = uVar1;
              auVar488._12_4_ = uVar1;
              auVar488._16_4_ = uVar1;
              auVar488._20_4_ = uVar1;
              auVar488._24_4_ = uVar1;
              auVar488._28_4_ = uVar1;
              auVar144 = vmaxps_avx(auVar135,auVar220);
              auVar144 = vminps_avx(auVar488,auVar144);
              break;
            case 4:
              auVar134._0_8_ = auVar164._0_8_ ^ 0x8000000080000000;
              auVar134._8_4_ = -auVar164._8_4_;
              auVar134._12_4_ = -auVar164._12_4_;
              auVar134._16_4_ = -auVar164._16_4_;
              auVar134._20_4_ = -auVar164._20_4_;
              auVar134._24_4_ = -auVar164._24_4_;
              auVar134._28_4_ = auVar164._28_4_ ^ 0x80000000;
              auVar221._8_4_ = 0x42b0c0a5;
              auVar221._0_8_ = 0x42b0c0a542b0c0a5;
              auVar221._12_4_ = 0x42b0c0a5;
              auVar221._16_4_ = 0x42b0c0a5;
              auVar221._20_4_ = 0x42b0c0a5;
              auVar221._24_4_ = 0x42b0c0a5;
              auVar221._28_4_ = 0x42b0c0a5;
              auVar144 = vminps_avx(auVar134,auVar221);
              auVar222._8_4_ = 0xc2b0c0a5;
              auVar222._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar222._12_4_ = 0xc2b0c0a5;
              auVar222._16_4_ = 0xc2b0c0a5;
              auVar222._20_4_ = 0xc2b0c0a5;
              auVar222._24_4_ = 0xc2b0c0a5;
              auVar222._28_4_ = 0xc2b0c0a5;
              auVar135 = vmaxps_avx(auVar144,auVar222);
              auVar223._8_4_ = 0x3fb8aa3b;
              auVar223._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar223._12_4_ = 0x3fb8aa3b;
              auVar223._16_4_ = 0x3fb8aa3b;
              auVar223._20_4_ = 0x3fb8aa3b;
              auVar223._24_4_ = 0x3fb8aa3b;
              auVar223._28_4_ = 0x3fb8aa3b;
              auVar248 = vfmadd213ps_fma(auVar223,auVar135,auVar428);
              auVar90 = vroundps_avx(ZEXT1632(auVar248),1);
              auVar144 = vcmpps_avx(ZEXT1632(auVar248),auVar90,1);
              auVar144 = vandps_avx(auVar144,auVar442);
              auVar144 = vsubps_avx(auVar90,auVar144);
              auVar260._8_4_ = 0x3f318000;
              auVar260._0_8_ = 0x3f3180003f318000;
              auVar260._12_4_ = 0x3f318000;
              auVar260._16_4_ = 0x3f318000;
              auVar260._20_4_ = 0x3f318000;
              auVar260._24_4_ = 0x3f318000;
              auVar260._28_4_ = 0x3f318000;
              auVar248 = vfmsub231ps_fma(auVar135,auVar144,auVar260);
              auVar261._8_4_ = 0x395e8083;
              auVar261._0_8_ = 0x395e8083395e8083;
              auVar261._12_4_ = 0x395e8083;
              auVar261._16_4_ = 0x395e8083;
              auVar261._20_4_ = 0x395e8083;
              auVar261._24_4_ = 0x395e8083;
              auVar261._28_4_ = 0x395e8083;
              auVar407 = vfmsub231ps_fma(ZEXT1632(auVar248),auVar144,auVar261);
              auVar135 = ZEXT1632(auVar407);
              auVar22._28_4_ = auVar90._28_4_;
              auVar22._0_28_ =
                   ZEXT1628(CONCAT412(auVar407._12_4_ * auVar407._12_4_,
                                      CONCAT48(auVar407._8_4_ * auVar407._8_4_,
                                               CONCAT44(auVar407._4_4_ * auVar407._4_4_,
                                                        auVar407._0_4_ * auVar407._0_4_))));
              auVar432._8_4_ = 0x39506967;
              auVar432._0_8_ = 0x3950696739506967;
              auVar432._12_4_ = 0x39506967;
              auVar432._16_4_ = 0x39506967;
              auVar432._20_4_ = 0x39506967;
              auVar432._24_4_ = 0x39506967;
              auVar432._28_4_ = 0x39506967;
              auVar262._8_4_ = 0x3ab743ce;
              auVar262._0_8_ = 0x3ab743ce3ab743ce;
              auVar262._12_4_ = 0x3ab743ce;
              auVar262._16_4_ = 0x3ab743ce;
              auVar262._20_4_ = 0x3ab743ce;
              auVar262._24_4_ = 0x3ab743ce;
              auVar262._28_4_ = 0x3ab743ce;
              auVar248 = vfmadd213ps_fma(auVar432,auVar135,auVar262);
              auVar263._8_4_ = 0x3c088908;
              auVar263._0_8_ = 0x3c0889083c088908;
              auVar263._12_4_ = 0x3c088908;
              auVar263._16_4_ = 0x3c088908;
              auVar263._20_4_ = 0x3c088908;
              auVar263._24_4_ = 0x3c088908;
              auVar263._28_4_ = 0x3c088908;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar135,auVar263);
              auVar264._8_4_ = 0x3d2aa9c1;
              auVar264._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar264._12_4_ = 0x3d2aa9c1;
              auVar264._16_4_ = 0x3d2aa9c1;
              auVar264._20_4_ = 0x3d2aa9c1;
              auVar264._24_4_ = 0x3d2aa9c1;
              auVar264._28_4_ = 0x3d2aa9c1;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar135,auVar264);
              auVar265._8_4_ = 0x3e2aaaaa;
              auVar265._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar265._12_4_ = 0x3e2aaaaa;
              auVar265._16_4_ = 0x3e2aaaaa;
              auVar265._20_4_ = 0x3e2aaaaa;
              auVar265._24_4_ = 0x3e2aaaaa;
              auVar265._28_4_ = 0x3e2aaaaa;
              auVar135 = ZEXT1632(auVar407);
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar135,auVar265);
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar135,auVar428);
              auVar380 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar22,auVar135);
              auVar99._0_4_ = (int)auVar144._0_4_;
              auVar99._4_4_ = (int)auVar144._4_4_;
              auVar99._8_4_ = (int)auVar144._8_4_;
              auVar99._12_4_ = (int)auVar144._12_4_;
              auVar136._16_4_ = (int)auVar144._16_4_;
              auVar136._0_16_ = auVar99;
              auVar136._20_4_ = (int)auVar144._20_4_;
              auVar136._24_4_ = (int)auVar144._24_4_;
              auVar136._28_4_ = (int)auVar144._28_4_;
              auVar407 = vpslld_avx(auVar99,0x17);
              auVar248 = vpslld_avx(auVar136._16_16_,0x17);
              auVar249._8_4_ = 0x3f800000;
              auVar249._0_8_ = 0x3f8000003f800000;
              auVar249._12_4_ = 0x3f800000;
              auVar248 = vpaddd_avx(auVar248,auVar249);
              auVar407 = vpaddd_avx(auVar407,auVar249);
              auVar489._16_16_ = auVar248;
              auVar489._0_16_ = auVar407;
              auVar137._0_4_ = auVar380._0_4_ + fVar76;
              auVar137._4_4_ = auVar380._4_4_ + fVar75;
              auVar137._8_4_ = auVar380._8_4_ + fVar2;
              auVar137._12_4_ = auVar380._12_4_ + fVar246;
              auVar137._16_4_ = fVar247 + 0.0;
              auVar137._20_4_ = fVar16 + 0.0;
              auVar137._24_4_ = fVar17 + 0.0;
              auVar137._28_4_ = fVar18 + 0.0;
              auVar248 = vfmadd213ps_fma(auVar489,auVar137,auVar442);
              auVar144 = vrcpps_avx(ZEXT1632(auVar248));
              auVar248 = vfmsub213ps_fma(ZEXT1632(auVar248),auVar144,auVar442);
              auVar248 = vfnmadd132ps_fma(ZEXT1632(auVar248),auVar144,auVar144);
              auVar144 = ZEXT1632(auVar248);
              break;
            case 5:
              auVar458._8_4_ = 0x42b0c0a5;
              auVar458._0_8_ = 0x42b0c0a542b0c0a5;
              auVar458._12_4_ = 0x42b0c0a5;
              auVar458._16_4_ = 0x42b0c0a5;
              auVar458._20_4_ = 0x42b0c0a5;
              auVar458._24_4_ = 0x42b0c0a5;
              auVar458._28_4_ = 0x42b0c0a5;
              auVar144 = vminps_avx(auVar458,auVar135);
              auVar465._8_4_ = 0xc2b0c0a5;
              auVar465._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar465._12_4_ = 0xc2b0c0a5;
              auVar465._16_4_ = 0xc2b0c0a5;
              auVar465._20_4_ = 0xc2b0c0a5;
              auVar465._24_4_ = 0xc2b0c0a5;
              auVar465._28_4_ = 0xc2b0c0a5;
              auVar135 = vmaxps_avx(auVar465,auVar144);
              auVar429._8_4_ = 0x3fb8aa3b;
              auVar429._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar429._12_4_ = 0x3fb8aa3b;
              auVar429._16_4_ = 0x3fb8aa3b;
              auVar429._20_4_ = 0x3fb8aa3b;
              auVar429._24_4_ = 0x3fb8aa3b;
              auVar429._28_4_ = 0x3fb8aa3b;
              auVar248 = vfmadd213ps_fma(auVar429,auVar135,auVar428);
              auVar90 = vroundps_avx(ZEXT1632(auVar248),1);
              auVar144 = vcmpps_avx(ZEXT1632(auVar248),auVar90,1);
              auVar144 = vandps_avx(auVar144,auVar442);
              auVar144 = vsubps_avx(auVar90,auVar144);
              auVar466._8_4_ = 0x3f318000;
              auVar466._0_8_ = 0x3f3180003f318000;
              auVar466._12_4_ = 0x3f318000;
              auVar466._16_4_ = 0x3f318000;
              auVar466._20_4_ = 0x3f318000;
              auVar466._24_4_ = 0x3f318000;
              auVar466._28_4_ = 0x3f318000;
              auVar248 = vfmsub231ps_fma(auVar135,auVar144,auVar466);
              auVar459._8_4_ = 0xb95e8083;
              auVar459._0_8_ = 0xb95e8083b95e8083;
              auVar459._12_4_ = 0xb95e8083;
              auVar459._16_4_ = 0xb95e8083;
              auVar459._20_4_ = 0xb95e8083;
              auVar459._24_4_ = 0xb95e8083;
              auVar459._28_4_ = 0xb95e8083;
              auVar407 = vfnmsub231ps_fma(ZEXT1632(auVar248),auVar144,auVar459);
              auVar135 = ZEXT1632(auVar407);
              auVar19._28_4_ = auVar90._28_4_;
              auVar19._0_28_ =
                   ZEXT1628(CONCAT412(auVar407._12_4_ * auVar407._12_4_,
                                      CONCAT48(auVar407._8_4_ * auVar407._8_4_,
                                               CONCAT44(auVar407._4_4_ * auVar407._4_4_,
                                                        auVar407._0_4_ * auVar407._0_4_))));
              auVar373._8_4_ = 0x39506967;
              auVar373._0_8_ = 0x3950696739506967;
              auVar373._12_4_ = 0x39506967;
              auVar373._16_4_ = 0x39506967;
              auVar373._20_4_ = 0x39506967;
              auVar373._24_4_ = 0x39506967;
              auVar373._28_4_ = 0x39506967;
              auVar398._8_4_ = 0x3ab743ce;
              auVar398._0_8_ = 0x3ab743ce3ab743ce;
              auVar398._12_4_ = 0x3ab743ce;
              auVar398._16_4_ = 0x3ab743ce;
              auVar398._20_4_ = 0x3ab743ce;
              auVar398._24_4_ = 0x3ab743ce;
              auVar398._28_4_ = 0x3ab743ce;
              auVar248 = vfmadd213ps_fma(auVar373,auVar135,auVar398);
              auVar315._8_4_ = 0x3c088908;
              auVar315._0_8_ = 0x3c0889083c088908;
              auVar315._12_4_ = 0x3c088908;
              auVar315._16_4_ = 0x3c088908;
              auVar315._20_4_ = 0x3c088908;
              auVar315._24_4_ = 0x3c088908;
              auVar315._28_4_ = 0x3c088908;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar135,auVar315);
              auVar368._8_4_ = 0x3d2aa9c1;
              auVar368._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar368._12_4_ = 0x3d2aa9c1;
              auVar368._16_4_ = 0x3d2aa9c1;
              auVar368._20_4_ = 0x3d2aa9c1;
              auVar368._24_4_ = 0x3d2aa9c1;
              auVar368._28_4_ = 0x3d2aa9c1;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar135,auVar368);
              auVar135 = ZEXT1632(auVar407);
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar135,auVar471);
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar135,auVar428);
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar19,auVar135);
              auVar214._0_4_ = auVar248._0_4_ + fVar76;
              auVar214._4_4_ = auVar248._4_4_ + fVar75;
              auVar214._8_4_ = auVar248._8_4_ + fVar2;
              auVar214._12_4_ = auVar248._12_4_ + fVar246;
              auVar214._16_4_ = fVar247 + 0.0;
              auVar214._20_4_ = fVar16 + 0.0;
              auVar214._24_4_ = fVar17 + 0.0;
              auVar214._28_4_ = fVar18 + 0.0;
              auVar407._0_4_ = (int)auVar144._0_4_;
              auVar407._4_4_ = (int)auVar144._4_4_;
              auVar407._8_4_ = (int)auVar144._8_4_;
              auVar407._12_4_ = (int)auVar144._12_4_;
              auVar253._16_4_ = (int)auVar144._16_4_;
              auVar253._0_16_ = auVar407;
              auVar253._20_4_ = (int)auVar144._20_4_;
              auVar253._24_4_ = (int)auVar144._24_4_;
              auVar253._28_4_ = (int)auVar144._28_4_;
              auVar407 = vpslld_avx(auVar407,0x17);
              auVar248 = vpslld_avx(auVar253._16_16_,0x17);
              auVar248 = vpaddd_avx(auVar107,auVar248);
              auVar407 = vpaddd_avx(auVar407,auVar107);
              auVar487._16_16_ = auVar248;
              auVar487._0_16_ = auVar407;
              auVar380 = vfmadd213ps_fma(auVar487,auVar214,auVar442);
              auVar492 = (undefined1  [36])0x0;
              auVar215._8_4_ = 0x800000;
              auVar215._0_8_ = 0x80000000800000;
              auVar215._12_4_ = 0x800000;
              auVar215._16_4_ = 0x800000;
              auVar215._20_4_ = 0x800000;
              auVar215._24_4_ = 0x800000;
              auVar215._28_4_ = 0x800000;
              auVar144 = vmaxps_avx(ZEXT1632(auVar380),auVar215);
              auVar407 = vpsrld_avx(auVar144._0_16_,0x17);
              auVar248 = vpsrld_avx(auVar144._16_16_,0x17);
              auVar336._8_4_ = 0x807fffff;
              auVar336._0_8_ = 0x807fffff807fffff;
              auVar336._12_4_ = 0x807fffff;
              auVar336._16_4_ = 0x807fffff;
              auVar336._20_4_ = 0x807fffff;
              auVar336._24_4_ = 0x807fffff;
              auVar336._28_4_ = 0x807fffff;
              auVar144 = vandps_avx(auVar144,auVar336);
              auVar90 = vorps_avx(auVar144,auVar428);
              auVar337._8_4_ = 0x3f3504f3;
              auVar337._0_8_ = 0x3f3504f33f3504f3;
              auVar337._12_4_ = 0x3f3504f3;
              auVar337._16_4_ = 0x3f3504f3;
              auVar337._20_4_ = 0x3f3504f3;
              auVar337._24_4_ = 0x3f3504f3;
              auVar337._28_4_ = 0x3f3504f3;
              auVar135 = vcmpps_avx(auVar337,auVar90,2);
              auVar144 = vandnps_avx(auVar135,auVar90);
              auVar399._8_4_ = 0xbf800000;
              auVar399._0_8_ = 0xbf800000bf800000;
              auVar399._12_4_ = 0xbf800000;
              auVar399._16_4_ = 0xbf800000;
              auVar399._20_4_ = 0xbf800000;
              auVar399._24_4_ = 0xbf800000;
              auVar399._28_4_ = 0xbf800000;
              auVar216._0_4_ = auVar144._0_4_ + auVar90._0_4_ + -1.0;
              auVar216._4_4_ = auVar144._4_4_ + auVar90._4_4_ + -1.0;
              auVar216._8_4_ = auVar144._8_4_ + auVar90._8_4_ + -1.0;
              auVar216._12_4_ = auVar144._12_4_ + auVar90._12_4_ + -1.0;
              auVar216._16_4_ = auVar144._16_4_ + auVar90._16_4_ + -1.0;
              auVar216._20_4_ = auVar144._20_4_ + auVar90._20_4_ + -1.0;
              auVar216._24_4_ = auVar144._24_4_ + auVar90._24_4_ + -1.0;
              auVar216._28_4_ = auVar144._28_4_ + auVar90._28_4_ + -1.0;
              auVar248 = vpsubd_avx(auVar248,auVar135._16_16_);
              auVar116._8_4_ = 0xffffff81;
              auVar116._0_8_ = 0xffffff81ffffff81;
              auVar116._12_4_ = 0xffffff81;
              auVar248 = vpaddd_avx(auVar248,auVar116);
              auVar407 = vpsubd_avx(auVar407,auVar135._0_16_);
              auVar407 = vpaddd_avx(auVar116,auVar407);
              auVar254._16_16_ = auVar248;
              auVar254._0_16_ = auVar407;
              auVar20._4_4_ = auVar216._4_4_ * auVar216._4_4_;
              auVar20._0_4_ = auVar216._0_4_ * auVar216._0_4_;
              auVar20._8_4_ = auVar216._8_4_ * auVar216._8_4_;
              auVar20._12_4_ = auVar216._12_4_ * auVar216._12_4_;
              auVar20._16_4_ = auVar216._16_4_ * auVar216._16_4_;
              auVar20._20_4_ = auVar216._20_4_ * auVar216._20_4_;
              auVar20._24_4_ = auVar216._24_4_ * auVar216._24_4_;
              auVar20._28_4_ = auVar135._28_4_;
              auVar430._8_4_ = 0x3d9021bb;
              auVar430._0_8_ = 0x3d9021bb3d9021bb;
              auVar430._12_4_ = 0x3d9021bb;
              auVar430._16_4_ = 0x3d9021bb;
              auVar430._20_4_ = 0x3d9021bb;
              auVar430._24_4_ = 0x3d9021bb;
              auVar430._28_4_ = 0x3d9021bb;
              auVar443._8_4_ = 0xbdebd1b8;
              auVar443._0_8_ = 0xbdebd1b8bdebd1b8;
              auVar443._12_4_ = 0xbdebd1b8;
              auVar443._16_4_ = 0xbdebd1b8;
              auVar443._20_4_ = 0xbdebd1b8;
              auVar443._24_4_ = 0xbdebd1b8;
              auVar443._28_4_ = 0xbdebd1b8;
              auVar248 = vfmadd213ps_fma(auVar430,auVar216,auVar443);
              auVar444._8_4_ = 0x3def251a;
              auVar444._0_8_ = 0x3def251a3def251a;
              auVar444._12_4_ = 0x3def251a;
              auVar444._16_4_ = 0x3def251a;
              auVar444._20_4_ = 0x3def251a;
              auVar444._24_4_ = 0x3def251a;
              auVar444._28_4_ = 0x3def251a;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar216,auVar444);
              auVar445._8_4_ = 0xbdfe5d4f;
              auVar445._0_8_ = 0xbdfe5d4fbdfe5d4f;
              auVar445._12_4_ = 0xbdfe5d4f;
              auVar445._16_4_ = 0xbdfe5d4f;
              auVar445._20_4_ = 0xbdfe5d4f;
              auVar445._24_4_ = 0xbdfe5d4f;
              auVar445._28_4_ = 0xbdfe5d4f;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar216,auVar445);
              auVar446._8_4_ = 0x3e11e9bf;
              auVar446._0_8_ = 0x3e11e9bf3e11e9bf;
              auVar446._12_4_ = 0x3e11e9bf;
              auVar446._16_4_ = 0x3e11e9bf;
              auVar446._20_4_ = 0x3e11e9bf;
              auVar446._24_4_ = 0x3e11e9bf;
              auVar446._28_4_ = 0x3e11e9bf;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar216,auVar446);
              auVar447._8_4_ = 0xbe2aae50;
              auVar447._0_8_ = 0xbe2aae50be2aae50;
              auVar447._12_4_ = 0xbe2aae50;
              auVar447._16_4_ = 0xbe2aae50;
              auVar447._20_4_ = 0xbe2aae50;
              auVar447._24_4_ = 0xbe2aae50;
              auVar447._28_4_ = 0xbe2aae50;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar216,auVar447);
              auVar448._8_4_ = 0x3e4cceac;
              auVar448._0_8_ = 0x3e4cceac3e4cceac;
              auVar448._12_4_ = 0x3e4cceac;
              auVar448._16_4_ = 0x3e4cceac;
              auVar448._20_4_ = 0x3e4cceac;
              auVar448._24_4_ = 0x3e4cceac;
              auVar448._28_4_ = 0x3e4cceac;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar216,auVar448);
              auVar449._8_4_ = 0xbe7ffffc;
              auVar449._0_8_ = 0xbe7ffffcbe7ffffc;
              auVar449._12_4_ = 0xbe7ffffc;
              auVar449._16_4_ = 0xbe7ffffc;
              auVar449._20_4_ = 0xbe7ffffc;
              auVar449._24_4_ = 0xbe7ffffc;
              auVar449._28_4_ = 0xbe7ffffc;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar216,auVar449);
              auVar450._8_4_ = 0x3eaaaaaa;
              auVar450._0_8_ = 0x3eaaaaaa3eaaaaaa;
              auVar450._12_4_ = 0x3eaaaaaa;
              auVar450._16_4_ = 0x3eaaaaaa;
              auVar450._20_4_ = 0x3eaaaaaa;
              auVar450._24_4_ = 0x3eaaaaaa;
              auVar450._28_4_ = 0x3eaaaaaa;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar216,auVar450);
              auVar431._0_4_ = auVar216._0_4_ * auVar216._0_4_ * auVar216._0_4_ * auVar248._0_4_;
              auVar431._4_4_ = auVar216._4_4_ * auVar216._4_4_ * auVar216._4_4_ * auVar248._4_4_;
              auVar431._8_4_ = auVar216._8_4_ * auVar216._8_4_ * auVar216._8_4_ * auVar248._8_4_;
              auVar431._12_4_ =
                   auVar216._12_4_ * auVar216._12_4_ * auVar216._12_4_ * auVar248._12_4_;
              auVar431._16_4_ = auVar216._16_4_ * auVar216._16_4_ * auVar216._16_4_ * 0.0;
              auVar431._20_4_ = auVar216._20_4_ * auVar216._20_4_ * auVar216._20_4_ * 0.0;
              auVar431._24_4_ = auVar216._24_4_ * auVar216._24_4_ * auVar216._24_4_ * 0.0;
              auVar431._28_4_ = 0;
              auVar135 = vcvtdq2ps_avx(auVar254);
              auVar248 = vfmadd231ps_fma(auVar431,auVar135,auVar459);
              auVar248 = vfmsub231ps_fma(ZEXT1632(auVar248),auVar428,auVar20);
              auVar144 = vcmpps_avx(ZEXT1632(auVar380),_DAT_004c71e0,2);
              auVar90 = vsubps_avx(ZEXT1632(auVar248),auVar216);
              auVar248 = vfmsub231ps_fma(auVar90,auVar466,auVar135);
              auVar451._8_4_ = 0xc0000000;
              auVar451._0_8_ = 0xc0000000c0000000;
              auVar451._12_4_ = 0xc0000000;
              auVar451._16_4_ = 0xc0000000;
              auVar451._20_4_ = 0xc0000000;
              auVar451._24_4_ = 0xc0000000;
              auVar451._28_4_ = 0xc0000000;
              auVar217._0_4_ = auVar248._0_4_ * -2.0;
              auVar217._4_4_ = auVar248._4_4_ * -2.0;
              auVar217._8_4_ = auVar248._8_4_ * -2.0;
              auVar217._12_4_ = auVar248._12_4_ * -2.0;
              auVar217._16_4_ = 0x80000000;
              auVar217._20_4_ = 0x80000000;
              auVar217._24_4_ = 0x80000000;
              auVar217._28_4_ = 0;
              auVar255._8_4_ = 0x7fffffff;
              auVar255._0_8_ = 0x7fffffff7fffffff;
              auVar255._12_4_ = 0x7fffffff;
              auVar255._16_4_ = 0x7fffffff;
              auVar255._20_4_ = 0x7fffffff;
              auVar255._24_4_ = 0x7fffffff;
              auVar255._28_4_ = 0x7fffffff;
              auVar144 = vblendvps_avx(auVar217,auVar255,auVar144);
              auVar256._8_4_ = 0x42b0c0a5;
              auVar256._0_8_ = 0x42b0c0a542b0c0a5;
              auVar256._12_4_ = 0x42b0c0a5;
              auVar256._16_4_ = 0x42b0c0a5;
              auVar256._20_4_ = 0x42b0c0a5;
              auVar256._24_4_ = 0x42b0c0a5;
              auVar256._28_4_ = 0x42b0c0a5;
              auVar144 = vminps_avx(auVar144,auVar256);
              auVar257._8_4_ = 0xc2b0c0a5;
              auVar257._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar257._12_4_ = 0xc2b0c0a5;
              auVar257._16_4_ = 0xc2b0c0a5;
              auVar257._20_4_ = 0xc2b0c0a5;
              auVar257._24_4_ = 0xc2b0c0a5;
              auVar257._28_4_ = 0xc2b0c0a5;
              auVar135 = vmaxps_avx(auVar144,auVar257);
              auVar258._8_4_ = 0x3fb8aa3b;
              auVar258._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar258._12_4_ = 0x3fb8aa3b;
              auVar258._16_4_ = 0x3fb8aa3b;
              auVar258._20_4_ = 0x3fb8aa3b;
              auVar258._24_4_ = 0x3fb8aa3b;
              auVar258._28_4_ = 0x3fb8aa3b;
              auVar248 = vfmadd213ps_fma(auVar258,auVar135,auVar428);
              auVar90 = vroundps_avx(ZEXT1632(auVar248),1);
              auVar144 = vcmpps_avx(ZEXT1632(auVar248),auVar90,1);
              auVar144 = vandps_avx(auVar144,auVar442);
              auVar144 = vsubps_avx(auVar90,auVar144);
              auVar248 = vfmsub231ps_fma(auVar135,auVar144,auVar466);
              auVar407 = vfnmsub231ps_fma(ZEXT1632(auVar248),auVar144,auVar459);
              auVar135 = ZEXT1632(auVar407);
              auVar21._28_4_ = auVar90._28_4_;
              auVar21._0_28_ =
                   ZEXT1628(CONCAT412(auVar407._12_4_ * auVar407._12_4_,
                                      CONCAT48(auVar407._8_4_ * auVar407._8_4_,
                                               CONCAT44(auVar407._4_4_ * auVar407._4_4_,
                                                        auVar407._0_4_ * auVar407._0_4_))));
              auVar374._8_4_ = 0x3ab743ce;
              auVar374._0_8_ = 0x3ab743ce3ab743ce;
              auVar374._12_4_ = 0x3ab743ce;
              auVar374._16_4_ = 0x3ab743ce;
              auVar374._20_4_ = 0x3ab743ce;
              auVar374._24_4_ = 0x3ab743ce;
              auVar374._28_4_ = 0x3ab743ce;
              auVar248 = vfmadd213ps_fma(auVar373,auVar135,auVar374);
              auVar375._8_4_ = 0x3c088908;
              auVar375._0_8_ = 0x3c0889083c088908;
              auVar375._12_4_ = 0x3c088908;
              auVar375._16_4_ = 0x3c088908;
              auVar375._20_4_ = 0x3c088908;
              auVar375._24_4_ = 0x3c088908;
              auVar375._28_4_ = 0x3c088908;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar135,auVar375);
              auVar97 = ZEXT864(0) << 0x20;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar135,auVar368);
              auVar370 = ZEXT3264(auVar442);
              auVar135 = ZEXT1632(auVar407);
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar135,auVar471);
              auVar325 = ZEXT3264(auVar428);
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar135,auVar428);
              auVar380 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar21,auVar135);
              auVar248._0_4_ = (int)auVar144._0_4_;
              auVar248._4_4_ = (int)auVar144._4_4_;
              auVar248._8_4_ = (int)auVar144._8_4_;
              auVar248._12_4_ = (int)auVar144._12_4_;
              auVar218._16_4_ = (int)auVar144._16_4_;
              auVar218._0_16_ = auVar248;
              auVar218._20_4_ = (int)auVar144._20_4_;
              auVar218._24_4_ = (int)auVar144._24_4_;
              auVar218._28_4_ = (int)auVar144._28_4_;
              auVar407 = vpslld_avx(auVar248,0x17);
              auVar248 = vpslld_avx(auVar218._16_16_,0x17);
              auVar248 = vpaddd_avx(auVar107,auVar248);
              auVar407 = vpaddd_avx(auVar107,auVar407);
              auVar219._16_16_ = auVar248;
              auVar219._0_16_ = auVar407;
              auVar259._0_4_ = auVar380._0_4_ + fVar76;
              auVar259._4_4_ = auVar380._4_4_ + fVar75;
              auVar259._8_4_ = auVar380._8_4_ + fVar2;
              auVar259._12_4_ = auVar380._12_4_ + fVar246;
              auVar259._16_4_ = fVar247 + 0.0;
              auVar259._20_4_ = fVar16 + 0.0;
              auVar259._24_4_ = fVar17 + 0.0;
              auVar259._28_4_ = fVar18 + 0.0;
              auVar248 = vfmadd213ps_fma(auVar219,auVar259,auVar442);
              auVar144 = vrcpps_avx(ZEXT1632(auVar248));
              auVar248 = vfmsub213ps_fma(ZEXT1632(auVar248),auVar144,auVar442);
              auVar248 = vfnmadd132ps_fma(ZEXT1632(auVar248),auVar144,auVar144);
              auVar248 = vfnmadd213ps_fma(ZEXT1632(auVar248),auVar451,auVar399);
              auVar212 = ZEXT1628(auVar248);
              goto LAB_00283a2a;
            case 6:
              uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var45);
              auVar224._4_4_ = uVar1;
              auVar224._0_4_ = uVar1;
              auVar224._8_4_ = uVar1;
              auVar224._12_4_ = uVar1;
              auVar224._16_4_ = uVar1;
              auVar224._20_4_ = uVar1;
              auVar224._24_4_ = uVar1;
              auVar224._28_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var45))[1];
              auVar266._4_4_ = uVar1;
              auVar266._0_4_ = uVar1;
              auVar266._8_4_ = uVar1;
              auVar266._12_4_ = uVar1;
              auVar266._16_4_ = uVar1;
              auVar266._20_4_ = uVar1;
              auVar266._24_4_ = uVar1;
              auVar266._28_4_ = uVar1;
              auVar248 = vfmadd231ps_fma(auVar266,auVar135,auVar224);
              auVar144 = vmaxps_avx(ZEXT1632(auVar248),auVar90);
              auVar144 = vminps_avx(auVar144,auVar442);
              auVar212 = auVar144._0_28_;
LAB_00283a2a:
              auVar377._0_4_ = auVar212._0_4_ * auVar164._0_4_;
              auVar377._4_4_ = auVar212._4_4_ * auVar164._4_4_;
              auVar377._8_4_ = auVar212._8_4_ * auVar164._8_4_;
              auVar377._12_4_ = auVar212._12_4_ * auVar164._12_4_;
              auVar377._16_4_ = auVar212._16_4_ * auVar164._16_4_;
              auVar377._20_4_ = auVar212._20_4_ * auVar164._20_4_;
              auVar377._24_4_ = auVar212._24_4_ * auVar164._24_4_;
              auVar377._28_36_ = auVar492;
              auVar144 = auVar377._0_32_;
            }
switchD_002835e2_caseD_1:
            *(undefined1 (*) [32])local_108 = auVar144;
            local_108 = local_108 + 4;
            iVar44 = iVar44 + 1;
          }
        }
      }
    }
    if ((iVar61 == 4) && (uVar51 == 8)) {
      p_Var45 = local_68[-3];
      uVar8 = *(uint *)(&this->field_0xd4 + (long)p_Var45);
      uVar10 = *(uint *)(&this->field_0xd8 + (long)p_Var45);
      iVar59 = *(int *)(&this->field_0xdc + (long)p_Var45);
      iVar7 = *(int *)(&this->field_0xe0 + (long)p_Var45);
      iVar58 = *(int *)(&this->field_0xe4 + (long)p_Var45);
      iVar64 = *(int *)(&this->field_0xe8 + (long)p_Var45);
      iVar69 = *(int *)(&this->field_0x114 + (long)p_Var45);
      lVar49 = *(long *)(&this->field_0x1a8 + (long)p_Var45);
      uVar73 = 0;
      uVar65 = 0;
      if (0 < (int)uVar8) {
        uVar65 = (ulong)uVar8;
      }
      uVar55 = 0;
      if (0 < (int)uVar10) {
        uVar55 = (ulong)uVar10;
      }
      uVar47 = (ulong)(uint)local_b8.c;
      if (local_b8.c < 1) {
        uVar47 = uVar73;
      }
      auVar97 = ZEXT3264(CONCAT428(0x3f000000,
                                   CONCAT424(0x3f000000,
                                             CONCAT420(0x3f000000,
                                                       CONCAT416(0x3f000000,
                                                                 CONCAT412(0x3f000000,
                                                                           CONCAT48(0x3f000000,
                                                                                                                                                                        
                                                  0x3f0000003f000000)))))));
      auVar325 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar370 = ZEXT3264(CONCAT428(0x3c088908,
                                    CONCAT424(0x3c088908,
                                              CONCAT420(0x3c088908,
                                                        CONCAT416(0x3c088908,
                                                                  CONCAT412(0x3c088908,
                                                                            CONCAT48(0x3c088908,
                                                                                                                                                                          
                                                  0x3c0889083c088908)))))));
      auVar107 = ZEXT816(0) << 0x40;
      auVar452._8_4_ = 0x42b0c0a5;
      auVar452._0_8_ = 0x42b0c0a542b0c0a5;
      auVar452._12_4_ = 0x42b0c0a5;
      auVar452._16_4_ = 0x42b0c0a5;
      auVar452._20_4_ = 0x42b0c0a5;
      auVar452._24_4_ = 0x42b0c0a5;
      auVar452._28_4_ = 0x42b0c0a5;
      auVar460._8_4_ = 0xc2b0c0a5;
      auVar460._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar460._12_4_ = 0xc2b0c0a5;
      auVar460._16_4_ = 0xc2b0c0a5;
      auVar460._20_4_ = 0xc2b0c0a5;
      auVar460._24_4_ = 0xc2b0c0a5;
      auVar460._28_4_ = 0xc2b0c0a5;
      auVar376._8_4_ = 0x3f318000;
      auVar376._0_8_ = 0x3f3180003f318000;
      auVar376._12_4_ = 0x3f318000;
      auVar376._16_4_ = 0x3f318000;
      auVar376._20_4_ = 0x3f318000;
      auVar376._24_4_ = 0x3f318000;
      auVar376._28_4_ = 0x3f318000;
      for (; uVar73 != uVar47; uVar73 = uVar73 + 1) {
        local_188 = (_func_int ***)
                    ((long)(_func_int ***)local_b8.data +
                    local_b8.cstep * uVar73 * local_b8.elemsize);
        iVar42 = bottom_blob->w;
        iVar43 = bottom_blob->h;
        uVar48 = 0;
        uVar74 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar74 = uVar48;
        }
        uVar39 = local_b8.w;
        if (local_b8.w < 1) {
          uVar39 = 0;
        }
        uVar57 = local_b8.h;
        if (local_b8.h < 1) {
          uVar57 = 0;
        }
        while (uVar60 = (uint)uVar48, uVar60 != uVar57) {
          iVar44 = (1 - uVar8) * iVar59;
          for (uVar40 = 0; uVar40 != uVar39; uVar40 = uVar40 + 1) {
            if (lVar49 == 0) {
              auVar164 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar164 = ZEXT3264(*(undefined1 (*) [32])(lVar49 + uVar73 * 0x20));
            }
            pvVar67 = bottom_blob->data;
            lVar71 = (long)(this->weight_data_tm).data +
                     (this->weight_data_tm).cstep * uVar73 * (this->weight_data_tm).elemsize + 0x60;
            for (uVar48 = 0; uVar48 != uVar74; uVar48 = uVar48 + 1) {
              lVar72 = lVar71;
              for (uVar66 = 0; uVar66 != uVar55; uVar66 = uVar66 + 1) {
                iVar36 = (((int)uVar66 - uVar10) + 1) * iVar7 + uVar60;
                if (((-1 < iVar36) && (iVar37 = iVar36 / iVar64, iVar36 % iVar64 == 0)) &&
                   (iVar37 < iVar43)) {
                  lVar34 = (long)iVar37 * (long)bottom_blob->w * bottom_blob->elemsize +
                           bottom_blob->cstep * bottom_blob->elemsize * uVar48;
                  iVar36 = iVar44;
                  for (lVar62 = 0; uVar65 * 0x80 != lVar62; lVar62 = lVar62 + 0x80) {
                    if (((-1 < iVar36) && (iVar37 = iVar36 / iVar58, iVar36 % iVar58 == 0)) &&
                       (iVar37 < iVar42)) {
                      lVar46 = (long)(iVar37 << 2);
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34);
                      auVar138._4_4_ = uVar1;
                      auVar138._0_4_ = uVar1;
                      auVar138._8_4_ = uVar1;
                      auVar138._12_4_ = uVar1;
                      auVar138._16_4_ = uVar1;
                      auVar138._20_4_ = uVar1;
                      auVar138._24_4_ = uVar1;
                      auVar138._28_4_ = uVar1;
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34 + 4);
                      auVar225._4_4_ = uVar1;
                      auVar225._0_4_ = uVar1;
                      auVar225._8_4_ = uVar1;
                      auVar225._12_4_ = uVar1;
                      auVar225._16_4_ = uVar1;
                      auVar225._20_4_ = uVar1;
                      auVar225._24_4_ = uVar1;
                      auVar225._28_4_ = uVar1;
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34 + 8);
                      auVar316._4_4_ = uVar1;
                      auVar316._0_4_ = uVar1;
                      auVar316._8_4_ = uVar1;
                      auVar316._12_4_ = uVar1;
                      auVar316._16_4_ = uVar1;
                      auVar316._20_4_ = uVar1;
                      auVar316._24_4_ = uVar1;
                      auVar316._28_4_ = uVar1;
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34 + 0xc);
                      auVar400._4_4_ = uVar1;
                      auVar400._0_4_ = uVar1;
                      auVar400._8_4_ = uVar1;
                      auVar400._12_4_ = uVar1;
                      auVar400._16_4_ = uVar1;
                      auVar400._20_4_ = uVar1;
                      auVar400._24_4_ = uVar1;
                      auVar400._28_4_ = uVar1;
                      auVar248 = vfmadd231ps_fma(auVar164._0_32_,auVar138,
                                                 *(undefined1 (*) [32])(lVar72 + -0x60 + lVar62));
                      auVar248 = vfmadd231ps_fma(ZEXT1632(auVar248),auVar225,
                                                 *(undefined1 (*) [32])(lVar72 + -0x40 + lVar62));
                      auVar248 = vfmadd231ps_fma(ZEXT1632(auVar248),auVar316,
                                                 *(undefined1 (*) [32])(lVar72 + -0x20 + lVar62));
                      auVar248 = vfmadd231ps_fma(ZEXT1632(auVar248),auVar400,
                                                 *(undefined1 (*) [32])(lVar72 + lVar62));
                      auVar164 = ZEXT1664(auVar248);
                    }
                    iVar36 = iVar36 + iVar59;
                  }
                }
                lVar72 = lVar72 + (long)(int)uVar8 * 0x80;
              }
              lVar71 = lVar71 + (long)(int)(uVar8 * uVar10 * 0x20) * 4;
            }
            auVar471 = auVar164._0_32_;
            auVar473 = auVar471;
            if (5 < iVar69 - 1U) goto switchD_00283dff_caseD_1;
            auVar473 = vmaxps_avx(ZEXT1632(auVar107),auVar471);
            auVar144 = auVar97._0_32_;
            auVar135 = auVar325._0_32_;
            switch(iVar69) {
            case 2:
              auVar471 = vminps_avx(ZEXT1632(auVar107),auVar471);
              uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var45);
              auVar139._4_4_ = uVar1;
              auVar139._0_4_ = uVar1;
              auVar139._8_4_ = uVar1;
              auVar139._12_4_ = uVar1;
              auVar139._16_4_ = uVar1;
              auVar139._20_4_ = uVar1;
              auVar139._24_4_ = uVar1;
              auVar139._28_4_ = uVar1;
              auVar248 = vfmadd231ps_fma(auVar473,auVar471,auVar139);
              auVar473 = ZEXT1632(auVar248);
              break;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var45);
              auVar147._4_4_ = uVar1;
              auVar147._0_4_ = uVar1;
              auVar147._8_4_ = uVar1;
              auVar147._12_4_ = uVar1;
              auVar147._16_4_ = uVar1;
              auVar147._20_4_ = uVar1;
              auVar147._24_4_ = uVar1;
              auVar147._28_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var45))[1];
              auVar474._4_4_ = uVar1;
              auVar474._0_4_ = uVar1;
              auVar474._8_4_ = uVar1;
              auVar474._12_4_ = uVar1;
              auVar474._16_4_ = uVar1;
              auVar474._20_4_ = uVar1;
              auVar474._24_4_ = uVar1;
              auVar474._28_4_ = uVar1;
              auVar471 = vmaxps_avx(auVar471,auVar147);
              auVar473 = vminps_avx(auVar474,auVar471);
              break;
            case 4:
              auVar91._0_8_ = auVar164._0_8_ ^ 0x8000000080000000;
              auVar91._8_4_ = -auVar164._8_4_;
              auVar91._12_4_ = -auVar164._12_4_;
              auVar91._16_4_ = -auVar164._16_4_;
              auVar91._20_4_ = -auVar164._20_4_;
              auVar91._24_4_ = -auVar164._24_4_;
              auVar91._28_4_ = auVar164._28_4_ ^ 0x80000000;
              auVar148._8_4_ = 0x42b0c0a5;
              auVar148._0_8_ = 0x42b0c0a542b0c0a5;
              auVar148._12_4_ = 0x42b0c0a5;
              auVar148._16_4_ = 0x42b0c0a5;
              auVar148._20_4_ = 0x42b0c0a5;
              auVar148._24_4_ = 0x42b0c0a5;
              auVar148._28_4_ = 0x42b0c0a5;
              auVar471 = vminps_avx(auVar91,auVar148);
              auVar149._8_4_ = 0xc2b0c0a5;
              auVar149._0_8_ = 0xc2b0c0a5c2b0c0a5;
              auVar149._12_4_ = 0xc2b0c0a5;
              auVar149._16_4_ = 0xc2b0c0a5;
              auVar149._20_4_ = 0xc2b0c0a5;
              auVar149._24_4_ = 0xc2b0c0a5;
              auVar149._28_4_ = 0xc2b0c0a5;
              auVar90 = vmaxps_avx(auVar471,auVar149);
              auVar150._8_4_ = 0x3fb8aa3b;
              auVar150._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar150._12_4_ = 0x3fb8aa3b;
              auVar150._16_4_ = 0x3fb8aa3b;
              auVar150._20_4_ = 0x3fb8aa3b;
              auVar150._24_4_ = 0x3fb8aa3b;
              auVar150._28_4_ = 0x3fb8aa3b;
              auVar248 = vfmadd213ps_fma(auVar150,auVar90,auVar144);
              auVar428 = vroundps_avx(ZEXT1632(auVar248),1);
              auVar471 = vcmpps_avx(ZEXT1632(auVar248),auVar428,1);
              auVar471 = vandps_avx(auVar471,auVar135);
              auVar471 = vsubps_avx(auVar428,auVar471);
              auVar232._8_4_ = 0x3f318000;
              auVar232._0_8_ = 0x3f3180003f318000;
              auVar232._12_4_ = 0x3f318000;
              auVar232._16_4_ = 0x3f318000;
              auVar232._20_4_ = 0x3f318000;
              auVar232._24_4_ = 0x3f318000;
              auVar232._28_4_ = 0x3f318000;
              auVar248 = vfmsub231ps_fma(auVar90,auVar471,auVar232);
              auVar233._8_4_ = 0x395e8083;
              auVar233._0_8_ = 0x395e8083395e8083;
              auVar233._12_4_ = 0x395e8083;
              auVar233._16_4_ = 0x395e8083;
              auVar233._20_4_ = 0x395e8083;
              auVar233._24_4_ = 0x395e8083;
              auVar233._28_4_ = 0x395e8083;
              auVar407 = vfmsub231ps_fma(ZEXT1632(auVar248),auVar471,auVar233);
              auVar90 = ZEXT1632(auVar407);
              auVar26._28_4_ = auVar428._28_4_;
              auVar26._0_28_ =
                   ZEXT1628(CONCAT412(auVar407._12_4_ * auVar407._12_4_,
                                      CONCAT48(auVar407._8_4_ * auVar407._8_4_,
                                               CONCAT44(auVar407._4_4_ * auVar407._4_4_,
                                                        auVar407._0_4_ * auVar407._0_4_))));
              auVar403._8_4_ = 0x39506967;
              auVar403._0_8_ = 0x3950696739506967;
              auVar403._12_4_ = 0x39506967;
              auVar403._16_4_ = 0x39506967;
              auVar403._20_4_ = 0x39506967;
              auVar403._24_4_ = 0x39506967;
              auVar403._28_4_ = 0x39506967;
              auVar234._8_4_ = 0x3ab743ce;
              auVar234._0_8_ = 0x3ab743ce3ab743ce;
              auVar234._12_4_ = 0x3ab743ce;
              auVar234._16_4_ = 0x3ab743ce;
              auVar234._20_4_ = 0x3ab743ce;
              auVar234._24_4_ = 0x3ab743ce;
              auVar234._28_4_ = 0x3ab743ce;
              auVar248 = vfmadd213ps_fma(auVar403,auVar90,auVar234);
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar90,auVar370._0_32_);
              auVar235._8_4_ = 0x3d2aa9c1;
              auVar235._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar235._12_4_ = 0x3d2aa9c1;
              auVar235._16_4_ = 0x3d2aa9c1;
              auVar235._20_4_ = 0x3d2aa9c1;
              auVar235._24_4_ = 0x3d2aa9c1;
              auVar235._28_4_ = 0x3d2aa9c1;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar90,auVar235);
              auVar236._8_4_ = 0x3e2aaaaa;
              auVar236._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar236._12_4_ = 0x3e2aaaaa;
              auVar236._16_4_ = 0x3e2aaaaa;
              auVar236._20_4_ = 0x3e2aaaaa;
              auVar236._24_4_ = 0x3e2aaaaa;
              auVar236._28_4_ = 0x3e2aaaaa;
              auVar90 = ZEXT1632(auVar407);
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar90,auVar236);
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar90,auVar144);
              auVar380 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar26,auVar90);
              auVar77._0_4_ = (int)auVar471._0_4_;
              auVar77._4_4_ = (int)auVar471._4_4_;
              auVar77._8_4_ = (int)auVar471._8_4_;
              auVar77._12_4_ = (int)auVar471._12_4_;
              auVar92._16_4_ = (int)auVar471._16_4_;
              auVar92._0_16_ = auVar77;
              auVar92._20_4_ = (int)auVar471._20_4_;
              auVar92._24_4_ = (int)auVar471._24_4_;
              auVar92._28_4_ = (int)auVar471._28_4_;
              auVar407 = vpslld_avx(auVar77,0x17);
              auVar248 = vpslld_avx(auVar92._16_16_,0x17);
              auVar165._8_4_ = 0x3f800000;
              auVar165._0_8_ = 0x3f8000003f800000;
              auVar165._12_4_ = 0x3f800000;
              auVar248 = vpaddd_avx(auVar248,auVar165);
              auVar407 = vpaddd_avx(auVar407,auVar165);
              auVar475._16_16_ = auVar248;
              auVar475._0_16_ = auVar407;
              auVar93._0_4_ = auVar380._0_4_ + auVar325._0_4_;
              auVar93._4_4_ = auVar380._4_4_ + auVar325._4_4_;
              auVar93._8_4_ = auVar380._8_4_ + auVar325._8_4_;
              auVar93._12_4_ = auVar380._12_4_ + auVar325._12_4_;
              auVar93._16_4_ = auVar325._16_4_ + 0.0;
              auVar93._20_4_ = auVar325._20_4_ + 0.0;
              auVar93._24_4_ = auVar325._24_4_ + 0.0;
              auVar93._28_4_ = auVar325._28_4_ + 0.0;
              auVar248 = vfmadd213ps_fma(auVar475,auVar93,auVar135);
              auVar471 = vrcpps_avx(ZEXT1632(auVar248));
              auVar248 = vfmsub213ps_fma(ZEXT1632(auVar248),auVar471,auVar135);
              auVar248 = vfnmadd132ps_fma(ZEXT1632(auVar248),auVar471,auVar471);
              auVar473 = ZEXT1632(auVar248);
              break;
            case 5:
              auVar471 = vminps_avx(auVar452,auVar471);
              auVar90 = vmaxps_avx(auVar460,auVar471);
              auVar467._8_4_ = 0x3fb8aa3b;
              auVar467._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar467._12_4_ = 0x3fb8aa3b;
              auVar467._16_4_ = 0x3fb8aa3b;
              auVar467._20_4_ = 0x3fb8aa3b;
              auVar467._24_4_ = 0x3fb8aa3b;
              auVar467._28_4_ = 0x3fb8aa3b;
              auVar248 = vfmadd213ps_fma(auVar467,auVar90,auVar144);
              auVar428 = vroundps_avx(ZEXT1632(auVar248),1);
              auVar471 = vcmpps_avx(ZEXT1632(auVar248),auVar428,1);
              auVar471 = vandps_avx(auVar471,auVar135);
              auVar471 = vsubps_avx(auVar428,auVar471);
              auVar248 = vfmsub231ps_fma(auVar90,auVar471,auVar376);
              auVar226._8_4_ = 0xb95e8083;
              auVar226._0_8_ = 0xb95e8083b95e8083;
              auVar226._12_4_ = 0xb95e8083;
              auVar226._16_4_ = 0xb95e8083;
              auVar226._20_4_ = 0xb95e8083;
              auVar226._24_4_ = 0xb95e8083;
              auVar226._28_4_ = 0xb95e8083;
              auVar407 = vfnmsub231ps_fma(ZEXT1632(auVar248),auVar471,auVar226);
              auVar90 = ZEXT1632(auVar407);
              auVar23._28_4_ = auVar428._28_4_;
              auVar23._0_28_ =
                   ZEXT1628(CONCAT412(auVar407._12_4_ * auVar407._12_4_,
                                      CONCAT48(auVar407._8_4_ * auVar407._8_4_,
                                               CONCAT44(auVar407._4_4_ * auVar407._4_4_,
                                                        auVar407._0_4_ * auVar407._0_4_))));
              auVar369._8_4_ = 0x39506967;
              auVar369._0_8_ = 0x3950696739506967;
              auVar369._12_4_ = 0x39506967;
              auVar369._16_4_ = 0x39506967;
              auVar369._20_4_ = 0x39506967;
              auVar369._24_4_ = 0x39506967;
              auVar369._28_4_ = 0x39506967;
              auVar391._8_4_ = 0x3ab743ce;
              auVar391._0_8_ = 0x3ab743ce3ab743ce;
              auVar391._12_4_ = 0x3ab743ce;
              auVar391._16_4_ = 0x3ab743ce;
              auVar391._20_4_ = 0x3ab743ce;
              auVar391._24_4_ = 0x3ab743ce;
              auVar391._28_4_ = 0x3ab743ce;
              auVar248 = vfmadd213ps_fma(auVar369,auVar90,auVar391);
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar90,auVar370._0_32_);
              auVar317._8_4_ = 0x3d2aa9c1;
              auVar317._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar317._12_4_ = 0x3d2aa9c1;
              auVar317._16_4_ = 0x3d2aa9c1;
              auVar317._20_4_ = 0x3d2aa9c1;
              auVar317._24_4_ = 0x3d2aa9c1;
              auVar317._28_4_ = 0x3d2aa9c1;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar90,auVar317);
              auVar318._8_4_ = 0x3e2aaaaa;
              auVar318._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar318._12_4_ = 0x3e2aaaaa;
              auVar318._16_4_ = 0x3e2aaaaa;
              auVar318._20_4_ = 0x3e2aaaaa;
              auVar318._24_4_ = 0x3e2aaaaa;
              auVar318._28_4_ = 0x3e2aaaaa;
              auVar90 = ZEXT1632(auVar407);
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar90,auVar318);
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar90,auVar144);
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar23,auVar90);
              auVar140._0_4_ = auVar248._0_4_ + auVar325._0_4_;
              auVar140._4_4_ = auVar248._4_4_ + auVar325._4_4_;
              auVar140._8_4_ = auVar248._8_4_ + auVar325._8_4_;
              auVar140._12_4_ = auVar248._12_4_ + auVar325._12_4_;
              auVar140._16_4_ = auVar325._16_4_ + 0.0;
              auVar140._20_4_ = auVar325._20_4_ + 0.0;
              auVar140._24_4_ = auVar325._24_4_ + 0.0;
              auVar140._28_4_ = auVar325._28_4_ + 0.0;
              auVar380._0_4_ = (int)auVar471._0_4_;
              auVar380._4_4_ = (int)auVar471._4_4_;
              auVar380._8_4_ = (int)auVar471._8_4_;
              auVar380._12_4_ = (int)auVar471._12_4_;
              auVar227._16_4_ = (int)auVar471._16_4_;
              auVar227._0_16_ = auVar380;
              auVar227._20_4_ = (int)auVar471._20_4_;
              auVar227._24_4_ = (int)auVar471._24_4_;
              auVar227._28_4_ = (int)auVar471._28_4_;
              auVar407 = vpslld_avx(auVar380,0x17);
              auVar248 = vpslld_avx(auVar227._16_16_,0x17);
              auVar270._8_4_ = 0x3f800000;
              auVar270._0_8_ = 0x3f8000003f800000;
              auVar270._12_4_ = 0x3f800000;
              auVar248 = vpaddd_avx(auVar248,auVar270);
              auVar407 = vpaddd_avx(auVar407,auVar270);
              auVar472._16_16_ = auVar248;
              auVar472._0_16_ = auVar407;
              auVar380 = vfmadd213ps_fma(auVar472,auVar140,auVar135);
              auVar141._8_4_ = 0x800000;
              auVar141._0_8_ = 0x80000000800000;
              auVar141._12_4_ = 0x800000;
              auVar141._16_4_ = 0x800000;
              auVar141._20_4_ = 0x800000;
              auVar141._24_4_ = 0x800000;
              auVar141._28_4_ = 0x800000;
              auVar471 = vmaxps_avx(ZEXT1632(auVar380),auVar141);
              auVar407 = vpsrld_avx(auVar471._0_16_,0x17);
              auVar248 = vpsrld_avx(auVar471._16_16_,0x17);
              auVar319._8_4_ = 0x807fffff;
              auVar319._0_8_ = 0x807fffff807fffff;
              auVar319._12_4_ = 0x807fffff;
              auVar319._16_4_ = 0x807fffff;
              auVar319._20_4_ = 0x807fffff;
              auVar319._24_4_ = 0x807fffff;
              auVar319._28_4_ = 0x807fffff;
              auVar471 = vandps_avx(auVar471,auVar319);
              auVar135 = vorps_avx(auVar471,auVar144);
              auVar320._8_4_ = 0x3f3504f3;
              auVar320._0_8_ = 0x3f3504f33f3504f3;
              auVar320._12_4_ = 0x3f3504f3;
              auVar320._16_4_ = 0x3f3504f3;
              auVar320._20_4_ = 0x3f3504f3;
              auVar320._24_4_ = 0x3f3504f3;
              auVar320._28_4_ = 0x3f3504f3;
              auVar144 = vcmpps_avx(auVar320,auVar135,2);
              auVar471 = vandnps_avx(auVar144,auVar135);
              auVar142._0_4_ = auVar471._0_4_ + auVar135._0_4_ + -1.0;
              auVar142._4_4_ = auVar471._4_4_ + auVar135._4_4_ + -1.0;
              auVar142._8_4_ = auVar471._8_4_ + auVar135._8_4_ + -1.0;
              auVar142._12_4_ = auVar471._12_4_ + auVar135._12_4_ + -1.0;
              auVar142._16_4_ = auVar471._16_4_ + auVar135._16_4_ + -1.0;
              auVar142._20_4_ = auVar471._20_4_ + auVar135._20_4_ + -1.0;
              auVar142._24_4_ = auVar471._24_4_ + auVar135._24_4_ + -1.0;
              auVar142._28_4_ = auVar471._28_4_ + auVar135._28_4_ + -1.0;
              auVar248 = vpsubd_avx(auVar248,auVar144._16_16_);
              auVar408._8_4_ = 0xffffff81;
              auVar408._0_8_ = 0xffffff81ffffff81;
              auVar408._12_4_ = 0xffffff81;
              auVar248 = vpaddd_avx(auVar248,auVar408);
              auVar407 = vpsubd_avx(auVar407,auVar144._0_16_);
              auVar407 = vpaddd_avx(auVar408,auVar407);
              auVar228._16_16_ = auVar248;
              auVar228._0_16_ = auVar407;
              auVar24._4_4_ = auVar142._4_4_ * auVar142._4_4_;
              auVar24._0_4_ = auVar142._0_4_ * auVar142._0_4_;
              auVar24._8_4_ = auVar142._8_4_ * auVar142._8_4_;
              auVar24._12_4_ = auVar142._12_4_ * auVar142._12_4_;
              auVar24._16_4_ = auVar142._16_4_ * auVar142._16_4_;
              auVar24._20_4_ = auVar142._20_4_ * auVar142._20_4_;
              auVar24._24_4_ = auVar142._24_4_ * auVar142._24_4_;
              auVar24._28_4_ = auVar144._28_4_;
              auVar401._8_4_ = 0x3d9021bb;
              auVar401._0_8_ = 0x3d9021bb3d9021bb;
              auVar401._12_4_ = 0x3d9021bb;
              auVar401._16_4_ = 0x3d9021bb;
              auVar401._20_4_ = 0x3d9021bb;
              auVar401._24_4_ = 0x3d9021bb;
              auVar401._28_4_ = 0x3d9021bb;
              auVar338._8_4_ = 0xbdebd1b8;
              auVar338._0_8_ = 0xbdebd1b8bdebd1b8;
              auVar338._12_4_ = 0xbdebd1b8;
              auVar338._16_4_ = 0xbdebd1b8;
              auVar338._20_4_ = 0xbdebd1b8;
              auVar338._24_4_ = 0xbdebd1b8;
              auVar338._28_4_ = 0xbdebd1b8;
              auVar248 = vfmadd213ps_fma(auVar401,auVar142,auVar338);
              auVar339._8_4_ = 0x3def251a;
              auVar339._0_8_ = 0x3def251a3def251a;
              auVar339._12_4_ = 0x3def251a;
              auVar339._16_4_ = 0x3def251a;
              auVar339._20_4_ = 0x3def251a;
              auVar339._24_4_ = 0x3def251a;
              auVar339._28_4_ = 0x3def251a;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar142,auVar339);
              auVar340._8_4_ = 0xbdfe5d4f;
              auVar340._0_8_ = 0xbdfe5d4fbdfe5d4f;
              auVar340._12_4_ = 0xbdfe5d4f;
              auVar340._16_4_ = 0xbdfe5d4f;
              auVar340._20_4_ = 0xbdfe5d4f;
              auVar340._24_4_ = 0xbdfe5d4f;
              auVar340._28_4_ = 0xbdfe5d4f;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar142,auVar340);
              auVar341._8_4_ = 0x3e11e9bf;
              auVar341._0_8_ = 0x3e11e9bf3e11e9bf;
              auVar341._12_4_ = 0x3e11e9bf;
              auVar341._16_4_ = 0x3e11e9bf;
              auVar341._20_4_ = 0x3e11e9bf;
              auVar341._24_4_ = 0x3e11e9bf;
              auVar341._28_4_ = 0x3e11e9bf;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar142,auVar341);
              auVar342._8_4_ = 0xbe2aae50;
              auVar342._0_8_ = 0xbe2aae50be2aae50;
              auVar342._12_4_ = 0xbe2aae50;
              auVar342._16_4_ = 0xbe2aae50;
              auVar342._20_4_ = 0xbe2aae50;
              auVar342._24_4_ = 0xbe2aae50;
              auVar342._28_4_ = 0xbe2aae50;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar142,auVar342);
              auVar343._8_4_ = 0x3e4cceac;
              auVar343._0_8_ = 0x3e4cceac3e4cceac;
              auVar343._12_4_ = 0x3e4cceac;
              auVar343._16_4_ = 0x3e4cceac;
              auVar343._20_4_ = 0x3e4cceac;
              auVar343._24_4_ = 0x3e4cceac;
              auVar343._28_4_ = 0x3e4cceac;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar142,auVar343);
              auVar344._8_4_ = 0xbe7ffffc;
              auVar344._0_8_ = 0xbe7ffffcbe7ffffc;
              auVar344._12_4_ = 0xbe7ffffc;
              auVar344._16_4_ = 0xbe7ffffc;
              auVar344._20_4_ = 0xbe7ffffc;
              auVar344._24_4_ = 0xbe7ffffc;
              auVar344._28_4_ = 0xbe7ffffc;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar142,auVar344);
              auVar345._8_4_ = 0x3eaaaaaa;
              auVar345._0_8_ = 0x3eaaaaaa3eaaaaaa;
              auVar345._12_4_ = 0x3eaaaaaa;
              auVar345._16_4_ = 0x3eaaaaaa;
              auVar345._20_4_ = 0x3eaaaaaa;
              auVar345._24_4_ = 0x3eaaaaaa;
              auVar345._28_4_ = 0x3eaaaaaa;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar142,auVar345);
              auVar402._0_4_ = auVar142._0_4_ * auVar142._0_4_ * auVar142._0_4_ * auVar248._0_4_;
              auVar402._4_4_ = auVar142._4_4_ * auVar142._4_4_ * auVar142._4_4_ * auVar248._4_4_;
              auVar402._8_4_ = auVar142._8_4_ * auVar142._8_4_ * auVar142._8_4_ * auVar248._8_4_;
              auVar402._12_4_ =
                   auVar142._12_4_ * auVar142._12_4_ * auVar142._12_4_ * auVar248._12_4_;
              auVar402._16_4_ = auVar142._16_4_ * auVar142._16_4_ * auVar142._16_4_ * 0.0;
              auVar402._20_4_ = auVar142._20_4_ * auVar142._20_4_ * auVar142._20_4_ * 0.0;
              auVar402._24_4_ = auVar142._24_4_ * auVar142._24_4_ * auVar142._24_4_ * 0.0;
              auVar402._28_4_ = 0;
              auVar392._8_4_ = 0x3f000000;
              auVar392._0_8_ = 0x3f0000003f000000;
              auVar392._12_4_ = 0x3f000000;
              auVar392._16_4_ = 0x3f000000;
              auVar392._20_4_ = 0x3f000000;
              auVar392._24_4_ = 0x3f000000;
              auVar392._28_4_ = 0x3f000000;
              auVar346._8_4_ = 0x3f800000;
              auVar346._0_8_ = 0x3f8000003f800000;
              auVar346._12_4_ = 0x3f800000;
              auVar346._16_4_ = 0x3f800000;
              auVar346._20_4_ = 0x3f800000;
              auVar346._24_4_ = 0x3f800000;
              auVar346._28_4_ = 0x3f800000;
              auVar144 = vcvtdq2ps_avx(auVar228);
              auVar433._8_4_ = 0xb95e8083;
              auVar433._0_8_ = 0xb95e8083b95e8083;
              auVar433._12_4_ = 0xb95e8083;
              auVar433._16_4_ = 0xb95e8083;
              auVar433._20_4_ = 0xb95e8083;
              auVar433._24_4_ = 0xb95e8083;
              auVar433._28_4_ = 0xb95e8083;
              auVar248 = vfmadd231ps_fma(auVar402,auVar144,auVar433);
              auVar248 = vfmsub231ps_fma(ZEXT1632(auVar248),auVar392,auVar24);
              auVar471 = vcmpps_avx(ZEXT1632(auVar380),ZEXT1632(auVar107),2);
              auVar135 = vsubps_avx(ZEXT1632(auVar248),auVar142);
              auVar248 = vfmsub231ps_fma(auVar135,auVar376,auVar144);
              auVar473._8_4_ = 0xc0000000;
              auVar473._0_8_ = 0xc0000000c0000000;
              auVar473._12_4_ = 0xc0000000;
              auVar473._16_4_ = 0xc0000000;
              auVar473._20_4_ = 0xc0000000;
              auVar473._24_4_ = 0xc0000000;
              auVar473._28_4_ = 0xc0000000;
              auVar143._0_4_ = auVar248._0_4_ * -2.0;
              auVar143._4_4_ = auVar248._4_4_ * -2.0;
              auVar143._8_4_ = auVar248._8_4_ * -2.0;
              auVar143._12_4_ = auVar248._12_4_ * -2.0;
              auVar143._16_4_ = 0x80000000;
              auVar143._20_4_ = 0x80000000;
              auVar143._24_4_ = 0x80000000;
              auVar143._28_4_ = 0;
              auVar229._8_4_ = 0x7fffffff;
              auVar229._0_8_ = 0x7fffffff7fffffff;
              auVar229._12_4_ = 0x7fffffff;
              auVar229._16_4_ = 0x7fffffff;
              auVar229._20_4_ = 0x7fffffff;
              auVar229._24_4_ = 0x7fffffff;
              auVar229._28_4_ = 0x7fffffff;
              auVar471 = vblendvps_avx(auVar143,auVar229,auVar471);
              auVar471 = vminps_avx(auVar452,auVar471);
              auVar144 = vmaxps_avx(auVar460,auVar471);
              auVar248 = vfmadd213ps_fma(auVar467,auVar144,auVar392);
              auVar135 = vroundps_avx(ZEXT1632(auVar248),1);
              auVar471 = vcmpps_avx(ZEXT1632(auVar248),auVar135,1);
              auVar471 = vandps_avx(auVar471,auVar346);
              auVar471 = vsubps_avx(auVar135,auVar471);
              auVar248 = vfmsub231ps_fma(auVar144,auVar471,auVar376);
              auVar321._8_4_ = 0xb95e8083;
              auVar321._0_8_ = 0xb95e8083b95e8083;
              auVar321._12_4_ = 0xb95e8083;
              auVar321._16_4_ = 0xb95e8083;
              auVar321._20_4_ = 0xb95e8083;
              auVar321._24_4_ = 0xb95e8083;
              auVar321._28_4_ = 0xb95e8083;
              auVar407 = vfnmsub231ps_fma(ZEXT1632(auVar248),auVar471,auVar321);
              auVar144 = ZEXT1632(auVar407);
              auVar25._28_4_ = 0xb95e8083;
              auVar25._0_28_ =
                   ZEXT1628(CONCAT412(auVar407._12_4_ * auVar407._12_4_,
                                      CONCAT48(auVar407._8_4_ * auVar407._8_4_,
                                               CONCAT44(auVar407._4_4_ * auVar407._4_4_,
                                                        auVar407._0_4_ * auVar407._0_4_))));
              auVar248 = vfmadd213ps_fma(auVar369,auVar144,auVar391);
              auVar267._8_4_ = 0x3c088908;
              auVar267._0_8_ = 0x3c0889083c088908;
              auVar267._12_4_ = 0x3c088908;
              auVar267._16_4_ = 0x3c088908;
              auVar267._20_4_ = 0x3c088908;
              auVar267._24_4_ = 0x3c088908;
              auVar267._28_4_ = 0x3c088908;
              auVar370 = ZEXT3264(auVar267);
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar144,auVar267);
              auVar268._8_4_ = 0x3d2aa9c1;
              auVar268._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar268._12_4_ = 0x3d2aa9c1;
              auVar268._16_4_ = 0x3d2aa9c1;
              auVar268._20_4_ = 0x3d2aa9c1;
              auVar268._24_4_ = 0x3d2aa9c1;
              auVar268._28_4_ = 0x3d2aa9c1;
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar144,auVar268);
              auVar269._8_4_ = 0x3e2aaaaa;
              auVar269._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar269._12_4_ = 0x3e2aaaaa;
              auVar269._16_4_ = 0x3e2aaaaa;
              auVar269._20_4_ = 0x3e2aaaaa;
              auVar269._24_4_ = 0x3e2aaaaa;
              auVar269._28_4_ = 0x3e2aaaaa;
              auVar144 = ZEXT1632(auVar407);
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar144,auVar269);
              auVar97 = ZEXT3264(auVar392);
              auVar248 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar144,auVar392);
              auVar380 = vfmadd213ps_fma(ZEXT1632(auVar248),auVar25,auVar144);
              auVar100._0_4_ = (int)auVar471._0_4_;
              auVar100._4_4_ = (int)auVar471._4_4_;
              auVar100._8_4_ = (int)auVar471._8_4_;
              auVar100._12_4_ = (int)auVar471._12_4_;
              auVar145._16_4_ = (int)auVar471._16_4_;
              auVar145._0_16_ = auVar100;
              auVar145._20_4_ = (int)auVar471._20_4_;
              auVar145._24_4_ = (int)auVar471._24_4_;
              auVar145._28_4_ = (int)auVar471._28_4_;
              auVar407 = vpslld_avx(auVar100,0x17);
              auVar248 = vpslld_avx(auVar145._16_16_,0x17);
              auVar385._8_4_ = 0x3f800000;
              auVar385._0_8_ = 0x3f8000003f800000;
              auVar385._12_4_ = 0x3f800000;
              auVar248 = vpaddd_avx(auVar248,auVar385);
              auVar407 = vpaddd_avx(auVar407,auVar385);
              auVar146._16_16_ = auVar248;
              auVar146._0_16_ = auVar407;
              auVar230._0_4_ = auVar380._0_4_ + 1.0;
              auVar230._4_4_ = auVar380._4_4_ + 1.0;
              auVar230._8_4_ = auVar380._8_4_ + 1.0;
              auVar230._12_4_ = auVar380._12_4_ + 1.0;
              auVar230._16_4_ = 0x3f800000;
              auVar230._20_4_ = 0x3f800000;
              auVar230._24_4_ = 0x3f800000;
              auVar230._28_4_ = 0x3f800000;
              auVar248 = vfmadd213ps_fma(auVar146,auVar230,auVar346);
              auVar471 = vrcpps_avx(ZEXT1632(auVar248));
              auVar325 = ZEXT3264(auVar346);
              auVar248 = vfmsub213ps_fma(ZEXT1632(auVar248),auVar471,auVar346);
              auVar248 = vfnmadd132ps_fma(ZEXT1632(auVar248),auVar471,auVar471);
              auVar231._8_4_ = 0xbf800000;
              auVar231._0_8_ = 0xbf800000bf800000;
              auVar231._12_4_ = 0xbf800000;
              auVar231._16_4_ = 0xbf800000;
              auVar231._20_4_ = 0xbf800000;
              auVar231._24_4_ = 0xbf800000;
              auVar231._28_4_ = 0xbf800000;
              auVar248 = vfnmadd213ps_fma(ZEXT1632(auVar248),auVar473,auVar231);
              auVar212 = ZEXT1628(auVar248);
              goto LAB_00284249;
            case 6:
              uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var45);
              auVar151._4_4_ = uVar1;
              auVar151._0_4_ = uVar1;
              auVar151._8_4_ = uVar1;
              auVar151._12_4_ = uVar1;
              auVar151._16_4_ = uVar1;
              auVar151._20_4_ = uVar1;
              auVar151._24_4_ = uVar1;
              auVar151._28_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var45))[1];
              auVar237._4_4_ = uVar1;
              auVar237._0_4_ = uVar1;
              auVar237._8_4_ = uVar1;
              auVar237._12_4_ = uVar1;
              auVar237._16_4_ = uVar1;
              auVar237._20_4_ = uVar1;
              auVar237._24_4_ = uVar1;
              auVar237._28_4_ = uVar1;
              auVar248 = vfmadd231ps_fma(auVar237,auVar471,auVar151);
              auVar471 = vmaxps_avx(ZEXT1632(auVar107),ZEXT1632(auVar248));
              auVar471 = vminps_avx(auVar471,auVar135);
              auVar212 = auVar471._0_28_;
LAB_00284249:
              auVar32._4_4_ = auVar212._4_4_ * auVar164._4_4_;
              auVar32._0_4_ = auVar212._0_4_ * auVar164._0_4_;
              auVar32._8_4_ = auVar212._8_4_ * auVar164._8_4_;
              auVar32._12_4_ = auVar212._12_4_ * auVar164._12_4_;
              auVar32._16_4_ = auVar212._16_4_ * auVar164._16_4_;
              auVar32._20_4_ = auVar212._20_4_ * auVar164._20_4_;
              auVar32._24_4_ = auVar212._24_4_ * auVar164._24_4_;
              auVar32._28_4_ = auVar473._28_4_;
              auVar473 = auVar32;
            }
switchD_00283dff_caseD_1:
            *(undefined1 (*) [32])local_188 = auVar473;
            local_188 = local_188 + 4;
            iVar44 = iVar44 + 1;
          }
          uVar48 = (ulong)(uVar60 + 1);
        }
      }
    }
    if ((iVar61 == 8) && (uVar51 == 4)) {
      p_Var45 = local_68[-3];
      uVar8 = *(uint *)(&this->field_0xd4 + (long)p_Var45);
      uVar10 = *(uint *)(&this->field_0xd8 + (long)p_Var45);
      iVar59 = *(int *)(&this->field_0xdc + (long)p_Var45);
      iVar7 = *(int *)(&this->field_0xe0 + (long)p_Var45);
      iVar58 = *(int *)(&this->field_0xe4 + (long)p_Var45);
      iVar64 = *(int *)(&this->field_0xe8 + (long)p_Var45);
      iVar69 = *(int *)(&this->field_0x114 + (long)p_Var45);
      lVar49 = *(long *)(&this->field_0x1a8 + (long)p_Var45);
      uVar73 = 0;
      uVar65 = 0;
      if (0 < (int)uVar8) {
        uVar65 = (ulong)uVar8;
      }
      uVar55 = 0;
      if (0 < (int)uVar10) {
        uVar55 = (ulong)uVar10;
      }
      uVar47 = (ulong)(uint)local_b8.c;
      if (local_b8.c < 1) {
        uVar47 = uVar73;
      }
      auVar325 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar97 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar78._8_4_ = 0x3f800000;
      auVar78._0_8_ = 0x3f8000003f800000;
      auVar78._12_4_ = 0x3f800000;
      auVar469._8_4_ = 0x3ab743ce;
      auVar469._0_8_ = 0x3ab743ce3ab743ce;
      auVar469._12_4_ = 0x3ab743ce;
      for (; uVar73 != uVar47; uVar73 = uVar73 + 1) {
        local_188 = (_func_int ***)
                    ((long)(_func_int ***)local_b8.data +
                    local_b8.cstep * uVar73 * local_b8.elemsize);
        iVar42 = bottom_blob->w;
        iVar43 = bottom_blob->h;
        uVar48 = 0;
        uVar74 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar74 = uVar48;
        }
        uVar39 = local_b8.w;
        if (local_b8.w < 1) {
          uVar39 = 0;
        }
        uVar57 = local_b8.h;
        if (local_b8.h < 1) {
          uVar57 = 0;
        }
        while (uVar60 = (uint)uVar48, uVar60 != uVar57) {
          iVar44 = (1 - uVar8) * iVar59;
          for (uVar40 = 0; uVar40 != uVar39; uVar40 = uVar40 + 1) {
            if (lVar49 == 0) {
              auVar107 = ZEXT816(0) << 0x40;
            }
            else {
              auVar107 = *(undefined1 (*) [16])(lVar49 + uVar73 * 0x10);
            }
            auVar370 = ZEXT1664(auVar107);
            pvVar67 = bottom_blob->data;
            lVar71 = (long)(this->weight_data_tm).data +
                     (this->weight_data_tm).cstep * uVar73 * (this->weight_data_tm).elemsize + 0x70;
            for (uVar48 = 0; uVar48 != uVar74; uVar48 = uVar48 + 1) {
              lVar72 = lVar71;
              for (uVar66 = 0; uVar66 != uVar55; uVar66 = uVar66 + 1) {
                iVar36 = (((int)uVar66 - uVar10) + 1) * iVar7 + uVar60;
                if (((-1 < iVar36) && (iVar37 = iVar36 / iVar64, iVar36 % iVar64 == 0)) &&
                   (iVar37 < iVar43)) {
                  lVar34 = (long)iVar37 * (long)bottom_blob->w * bottom_blob->elemsize +
                           bottom_blob->cstep * bottom_blob->elemsize * uVar48;
                  iVar36 = iVar44;
                  for (lVar62 = 0; uVar65 * 0x80 != lVar62; lVar62 = lVar62 + 0x80) {
                    if (((-1 < iVar36) && (iVar37 = iVar36 / iVar58, iVar36 % iVar58 == 0)) &&
                       (iVar37 < iVar42)) {
                      lVar46 = (long)(iVar37 << 3);
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34);
                      auVar101._4_4_ = uVar1;
                      auVar101._0_4_ = uVar1;
                      auVar101._8_4_ = uVar1;
                      auVar101._12_4_ = uVar1;
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34 + 4);
                      auVar166._4_4_ = uVar1;
                      auVar166._0_4_ = uVar1;
                      auVar166._8_4_ = uVar1;
                      auVar166._12_4_ = uVar1;
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34 + 8);
                      auVar271._4_4_ = uVar1;
                      auVar271._0_4_ = uVar1;
                      auVar271._8_4_ = uVar1;
                      auVar271._12_4_ = uVar1;
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34 + 0xc);
                      auVar378._4_4_ = uVar1;
                      auVar378._0_4_ = uVar1;
                      auVar378._8_4_ = uVar1;
                      auVar378._12_4_ = uVar1;
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34 + 0x10);
                      auVar394._4_4_ = uVar1;
                      auVar394._0_4_ = uVar1;
                      auVar394._8_4_ = uVar1;
                      auVar394._12_4_ = uVar1;
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34 + 0x14);
                      auVar409._4_4_ = uVar1;
                      auVar409._0_4_ = uVar1;
                      auVar409._8_4_ = uVar1;
                      auVar409._12_4_ = uVar1;
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34 + 0x18);
                      auVar436._4_4_ = uVar1;
                      auVar436._0_4_ = uVar1;
                      auVar436._8_4_ = uVar1;
                      auVar436._12_4_ = uVar1;
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34 + 0x1c);
                      auVar454._4_4_ = uVar1;
                      auVar454._0_4_ = uVar1;
                      auVar454._8_4_ = uVar1;
                      auVar454._12_4_ = uVar1;
                      auVar107 = vfmadd231ps_fma(auVar370._0_16_,auVar101,
                                                 *(undefined1 (*) [16])(lVar72 + -0x70 + lVar62));
                      auVar107 = vfmadd231ps_fma(auVar107,auVar166,
                                                 *(undefined1 (*) [16])(lVar72 + -0x60 + lVar62));
                      auVar107 = vfmadd231ps_fma(auVar107,auVar271,
                                                 *(undefined1 (*) [16])(lVar72 + -0x50 + lVar62));
                      auVar107 = vfmadd231ps_fma(auVar107,auVar378,
                                                 *(undefined1 (*) [16])(lVar72 + -0x40 + lVar62));
                      auVar107 = vfmadd231ps_fma(auVar107,auVar394,
                                                 *(undefined1 (*) [16])(lVar72 + -0x30 + lVar62));
                      auVar107 = vfmadd231ps_fma(auVar107,auVar409,
                                                 *(undefined1 (*) [16])(lVar72 + -0x20 + lVar62));
                      auVar107 = vfmadd231ps_fma(auVar107,auVar436,
                                                 *(undefined1 (*) [16])(lVar72 + -0x10 + lVar62));
                      auVar107 = vfmadd231ps_fma(auVar107,auVar454,
                                                 *(undefined1 (*) [16])(lVar72 + lVar62));
                      auVar370 = ZEXT1664(auVar107);
                    }
                    iVar36 = iVar36 + iVar59;
                  }
                }
                lVar72 = lVar72 + (long)(int)uVar8 * 0x80;
              }
              lVar71 = lVar71 + (long)(int)(uVar8 * uVar10 * 0x20) * 4;
            }
            auVar107 = auVar370._0_16_;
            auVar109 = auVar107;
            if (iVar69 - 1U < 6) {
              auVar407 = auVar325._0_16_;
              auVar109 = vmaxps_avx(auVar107,auVar407);
              auVar248 = auVar97._0_16_;
              switch(iVar69) {
              case 2:
                auVar107 = vminps_avx(auVar107,auVar407);
                uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var45);
                auVar379._4_4_ = uVar1;
                auVar379._0_4_ = uVar1;
                auVar379._8_4_ = uVar1;
                auVar379._12_4_ = uVar1;
                auVar109 = vfmadd231ps_fma(auVar109,auVar107,auVar379);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var45);
                auVar104._4_4_ = uVar1;
                auVar104._0_4_ = uVar1;
                auVar104._8_4_ = uVar1;
                auVar104._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var45))[1];
                auVar381._4_4_ = uVar1;
                auVar381._0_4_ = uVar1;
                auVar381._8_4_ = uVar1;
                auVar381._12_4_ = uVar1;
                auVar107 = vmaxps_avx(auVar107,auVar104);
                auVar109 = vminps_avx(auVar381,auVar107);
                break;
              case 4:
                auVar105._0_8_ = auVar370._0_8_ ^ 0x8000000080000000;
                auVar105._8_4_ = -auVar370._8_4_;
                auVar105._12_4_ = -auVar370._12_4_;
                auVar173._8_4_ = 0x42b0c0a5;
                auVar173._0_8_ = 0x42b0c0a542b0c0a5;
                auVar173._12_4_ = 0x42b0c0a5;
                auVar107 = vminps_avx(auVar105,auVar173);
                auVar174._8_4_ = 0xc2b0c0a5;
                auVar174._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar174._12_4_ = 0xc2b0c0a5;
                auVar380 = vmaxps_avx(auVar107,auVar174);
                auVar382._8_4_ = 0x3fb8aa3b;
                auVar382._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar382._12_4_ = 0x3fb8aa3b;
                auVar107 = vfmadd213ps_fma(auVar382,auVar380,auVar248);
                auVar480._0_4_ = (int)auVar107._0_4_;
                auVar480._4_4_ = (int)auVar107._4_4_;
                auVar480._8_4_ = (int)auVar107._8_4_;
                auVar480._12_4_ = (int)auVar107._12_4_;
                auVar407 = vcvtdq2ps_avx(auVar480);
                auVar107 = vcmpps_avx(auVar107,auVar407,1);
                auVar107 = vandps_avx(auVar107,auVar78);
                auVar107 = vsubps_avx(auVar407,auVar107);
                auVar175._8_4_ = 0x3f318000;
                auVar175._0_8_ = 0x3f3180003f318000;
                auVar175._12_4_ = 0x3f318000;
                auVar407 = vfmsub231ps_fma(auVar380,auVar107,auVar175);
                auVar176._8_4_ = 0x395e8083;
                auVar176._0_8_ = 0x395e8083395e8083;
                auVar176._12_4_ = 0x395e8083;
                auVar380 = vfmsub231ps_fma(auVar407,auVar107,auVar176);
                auVar481._0_4_ = auVar380._0_4_ * auVar380._0_4_;
                auVar481._4_4_ = auVar380._4_4_ * auVar380._4_4_;
                auVar481._8_4_ = auVar380._8_4_ * auVar380._8_4_;
                auVar481._12_4_ = auVar380._12_4_ * auVar380._12_4_;
                auVar413._8_4_ = 0x39506967;
                auVar413._0_8_ = 0x3950696739506967;
                auVar413._12_4_ = 0x39506967;
                auVar177._8_4_ = 0x3ab743ce;
                auVar177._0_8_ = 0x3ab743ce3ab743ce;
                auVar177._12_4_ = 0x3ab743ce;
                auVar407 = vfmadd213ps_fma(auVar413,auVar380,auVar177);
                auVar178._8_4_ = 0x3c088908;
                auVar178._0_8_ = 0x3c0889083c088908;
                auVar178._12_4_ = 0x3c088908;
                auVar407 = vfmadd213ps_fma(auVar407,auVar380,auVar178);
                auVar179._8_4_ = 0x3d2aa9c1;
                auVar179._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar179._12_4_ = 0x3d2aa9c1;
                auVar407 = vfmadd213ps_fma(auVar407,auVar380,auVar179);
                auVar180._8_4_ = 0x3e2aaaaa;
                auVar180._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar180._12_4_ = 0x3e2aaaaa;
                auVar407 = vfmadd213ps_fma(auVar407,auVar380,auVar180);
                auVar248 = vfmadd213ps_fma(auVar407,auVar380,auVar248);
                auVar248 = vfmadd213ps_fma(auVar248,auVar481,auVar380);
                auVar414._0_4_ = auVar248._0_4_ + 1.0;
                auVar414._4_4_ = auVar248._4_4_ + 1.0;
                auVar414._8_4_ = auVar248._8_4_ + 1.0;
                auVar414._12_4_ = auVar248._12_4_ + 1.0;
                auVar106._0_4_ = (int)auVar107._0_4_;
                auVar106._4_4_ = (int)auVar107._4_4_;
                auVar106._8_4_ = (int)auVar107._8_4_;
                auVar106._12_4_ = (int)auVar107._12_4_;
                auVar107 = vpslld_avx(auVar106,0x17);
                auVar107 = vpaddd_avx(auVar107,auVar78);
                auVar248 = vfmadd213ps_fma(auVar107,auVar414,auVar78);
                auVar107 = vrcpps_avx(auVar248);
                auVar248 = vfmsub213ps_fma(auVar248,auVar107,auVar78);
                auVar109 = vfnmadd132ps_fma(auVar248,auVar107,auVar107);
                break;
              case 5:
                auVar437._8_4_ = 0x42b0c0a5;
                auVar437._0_8_ = 0x42b0c0a542b0c0a5;
                auVar437._12_4_ = 0x42b0c0a5;
                auVar407 = vminps_avx(auVar107,auVar437);
                auVar455._8_4_ = 0xc2b0c0a5;
                auVar455._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar455._12_4_ = 0xc2b0c0a5;
                auVar116 = vmaxps_avx(auVar455,auVar407);
                auVar462._8_4_ = 0x3fb8aa3b;
                auVar462._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar462._12_4_ = 0x3fb8aa3b;
                auVar407 = vfmadd213ps_fma(auVar462,auVar116,auVar248);
                auVar410._0_4_ = (int)auVar407._0_4_;
                auVar410._4_4_ = (int)auVar407._4_4_;
                auVar410._8_4_ = (int)auVar407._8_4_;
                auVar410._12_4_ = (int)auVar407._12_4_;
                auVar380 = vcvtdq2ps_avx(auVar410);
                auVar407 = vcmpps_avx(auVar407,auVar380,1);
                auVar407 = vandps_avx(auVar407,auVar78);
                auVar407 = vsubps_avx(auVar380,auVar407);
                auVar438._8_4_ = 0x3f318000;
                auVar438._0_8_ = 0x3f3180003f318000;
                auVar438._12_4_ = 0x3f318000;
                auVar380 = vfmsub231ps_fma(auVar116,auVar407,auVar438);
                auVar456._8_4_ = 0xb95e8083;
                auVar456._0_8_ = 0xb95e8083b95e8083;
                auVar456._12_4_ = 0xb95e8083;
                auVar116 = vfnmsub231ps_fma(auVar380,auVar407,auVar456);
                auVar411._0_4_ = auVar116._0_4_ * auVar116._0_4_;
                auVar411._4_4_ = auVar116._4_4_ * auVar116._4_4_;
                auVar411._8_4_ = auVar116._8_4_ * auVar116._8_4_;
                auVar411._12_4_ = auVar116._12_4_ * auVar116._12_4_;
                auVar371._8_4_ = 0x39506967;
                auVar371._0_8_ = 0x3950696739506967;
                auVar371._12_4_ = 0x39506967;
                auVar380 = vfmadd213ps_fma(auVar371,auVar116,auVar469);
                auVar250._8_4_ = 0x3c088908;
                auVar250._0_8_ = 0x3c0889083c088908;
                auVar250._12_4_ = 0x3c088908;
                auVar380 = vfmadd213ps_fma(auVar380,auVar116,auVar250);
                auVar357._8_4_ = 0x3d2aa9c1;
                auVar357._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar357._12_4_ = 0x3d2aa9c1;
                auVar380 = vfmadd213ps_fma(auVar380,auVar116,auVar357);
                auVar358._8_4_ = 0x3e2aaaaa;
                auVar358._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar358._12_4_ = 0x3e2aaaaa;
                auVar380 = vfmadd213ps_fma(auVar380,auVar116,auVar358);
                auVar380 = vfmadd213ps_fma(auVar380,auVar116,auVar248);
                auVar380 = vfmadd213ps_fma(auVar380,auVar411,auVar116);
                auVar167._0_4_ = auVar380._0_4_ + 1.0;
                auVar167._4_4_ = auVar380._4_4_ + 1.0;
                auVar167._8_4_ = auVar380._8_4_ + 1.0;
                auVar167._12_4_ = auVar380._12_4_ + 1.0;
                auVar102._0_4_ = (int)auVar407._0_4_;
                auVar102._4_4_ = (int)auVar407._4_4_;
                auVar102._8_4_ = (int)auVar407._8_4_;
                auVar102._12_4_ = (int)auVar407._12_4_;
                auVar407 = vpslld_avx(auVar102,0x17);
                auVar407 = vpaddd_avx(auVar407,auVar78);
                auVar249 = vfmadd213ps_fma(auVar407,auVar167,auVar78);
                auVar168._8_4_ = 0x800000;
                auVar168._0_8_ = 0x80000000800000;
                auVar168._12_4_ = 0x800000;
                auVar407 = vmaxps_avx(auVar249,auVar168);
                auVar380 = vpsrld_avx(auVar407,0x17);
                auVar272._8_4_ = 0xffffff82;
                auVar272._0_8_ = 0xffffff82ffffff82;
                auVar272._12_4_ = 0xffffff82;
                auVar380 = vpaddd_avx(auVar380,auVar272);
                auVar273._8_4_ = 0x807fffff;
                auVar273._0_8_ = 0x807fffff807fffff;
                auVar273._12_4_ = 0x807fffff;
                auVar407 = vandps_avx(auVar407,auVar273);
                auVar99 = vorps_avx(auVar407,auVar248);
                auVar116 = vcvtdq2ps_avx(auVar380);
                auVar274._8_4_ = 0x3f3504f3;
                auVar274._0_8_ = 0x3f3504f33f3504f3;
                auVar274._12_4_ = 0x3f3504f3;
                auVar380 = vcmpps_avx(auVar99,auVar274,1);
                auVar407 = vandps_avx(auVar380,auVar99);
                auVar169._0_4_ = auVar407._0_4_ + auVar99._0_4_ + -1.0;
                auVar169._4_4_ = auVar407._4_4_ + auVar99._4_4_ + -1.0;
                auVar169._8_4_ = auVar407._8_4_ + auVar99._8_4_ + -1.0;
                auVar169._12_4_ = auVar407._12_4_ + auVar99._12_4_ + -1.0;
                auVar407 = vandps_avx(auVar380,auVar78);
                auVar380 = vsubps_avx(auVar116,auVar407);
                auVar395._0_4_ = auVar169._0_4_ * auVar169._0_4_;
                auVar395._4_4_ = auVar169._4_4_ * auVar169._4_4_;
                auVar395._8_4_ = auVar169._8_4_ * auVar169._8_4_;
                auVar395._12_4_ = auVar169._12_4_ * auVar169._12_4_;
                auVar412._8_4_ = 0x3d9021bb;
                auVar412._0_8_ = 0x3d9021bb3d9021bb;
                auVar412._12_4_ = 0x3d9021bb;
                auVar275._8_4_ = 0xbdebd1b8;
                auVar275._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar275._12_4_ = 0xbdebd1b8;
                auVar407 = vfmadd213ps_fma(auVar412,auVar169,auVar275);
                auVar276._8_4_ = 0x3def251a;
                auVar276._0_8_ = 0x3def251a3def251a;
                auVar276._12_4_ = 0x3def251a;
                auVar407 = vfmadd213ps_fma(auVar407,auVar169,auVar276);
                auVar277._8_4_ = 0xbdfe5d4f;
                auVar277._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar277._12_4_ = 0xbdfe5d4f;
                auVar407 = vfmadd213ps_fma(auVar407,auVar169,auVar277);
                auVar278._8_4_ = 0x3e11e9bf;
                auVar278._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar278._12_4_ = 0x3e11e9bf;
                auVar407 = vfmadd213ps_fma(auVar407,auVar169,auVar278);
                auVar279._8_4_ = 0xbe2aae50;
                auVar279._0_8_ = 0xbe2aae50be2aae50;
                auVar279._12_4_ = 0xbe2aae50;
                auVar407 = vfmadd213ps_fma(auVar407,auVar169,auVar279);
                auVar280._8_4_ = 0x3e4cceac;
                auVar280._0_8_ = 0x3e4cceac3e4cceac;
                auVar280._12_4_ = 0x3e4cceac;
                auVar407 = vfmadd213ps_fma(auVar407,auVar169,auVar280);
                auVar281._8_4_ = 0xbe7ffffc;
                auVar281._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar281._12_4_ = 0xbe7ffffc;
                auVar407 = vfmadd213ps_fma(auVar407,auVar169,auVar281);
                auVar282._8_4_ = 0x3eaaaaaa;
                auVar282._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar282._12_4_ = 0x3eaaaaaa;
                auVar407 = vfmadd213ps_fma(auVar407,auVar169,auVar282);
                auVar283._0_4_ = auVar407._0_4_ * auVar395._0_4_ * auVar169._0_4_;
                auVar283._4_4_ = auVar407._4_4_ * auVar395._4_4_ * auVar169._4_4_;
                auVar283._8_4_ = auVar407._8_4_ * auVar395._8_4_ * auVar169._8_4_;
                auVar283._12_4_ = auVar407._12_4_ * auVar395._12_4_ * auVar169._12_4_;
                auVar407 = vfmadd231ps_fma(auVar283,auVar380,auVar456);
                auVar116 = vfmsub231ps_fma(auVar407,auVar248,auVar395);
                auVar407 = vcmpps_avx(auVar249,_DAT_004c4ff0,2);
                auVar116 = vsubps_avx(auVar116,auVar169);
                auVar380 = vfnmadd231ps_fma(auVar116,auVar438,auVar380);
                auVar170._0_4_ = auVar380._0_4_ + auVar380._0_4_;
                auVar170._4_4_ = auVar380._4_4_ + auVar380._4_4_;
                auVar170._8_4_ = auVar380._8_4_ + auVar380._8_4_;
                auVar170._12_4_ = auVar380._12_4_ + auVar380._12_4_;
                auVar284._8_4_ = 0x7fffffff;
                auVar284._0_8_ = 0x7fffffff7fffffff;
                auVar284._12_4_ = 0x7fffffff;
                auVar407 = vblendvps_avx(auVar170,auVar284,auVar407);
                auVar171._8_4_ = 0x42b0c0a5;
                auVar171._0_8_ = 0x42b0c0a542b0c0a5;
                auVar171._12_4_ = 0x42b0c0a5;
                auVar407 = vminps_avx(auVar407,auVar171);
                auVar172._8_4_ = 0xc2b0c0a5;
                auVar172._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar172._12_4_ = 0xc2b0c0a5;
                auVar116 = vmaxps_avx(auVar407,auVar172);
                auVar407 = vfmadd213ps_fma(auVar462,auVar116,auVar248);
                auVar285._0_4_ = (int)auVar407._0_4_;
                auVar285._4_4_ = (int)auVar407._4_4_;
                auVar285._8_4_ = (int)auVar407._8_4_;
                auVar285._12_4_ = (int)auVar407._12_4_;
                auVar380 = vcvtdq2ps_avx(auVar285);
                auVar407 = vcmpps_avx(auVar407,auVar380,1);
                auVar407 = vandps_avx(auVar407,auVar78);
                auVar407 = vsubps_avx(auVar380,auVar407);
                auVar380 = vfmsub231ps_fma(auVar116,auVar407,auVar438);
                auVar116 = vfnmsub231ps_fma(auVar380,auVar407,auVar456);
                auVar286._0_4_ = auVar116._0_4_ * auVar116._0_4_;
                auVar286._4_4_ = auVar116._4_4_ * auVar116._4_4_;
                auVar286._8_4_ = auVar116._8_4_ * auVar116._8_4_;
                auVar286._12_4_ = auVar116._12_4_ * auVar116._12_4_;
                auVar380 = vfmadd213ps_fma(auVar371,auVar116,auVar469);
                auVar380 = vfmadd213ps_fma(auVar380,auVar116,auVar250);
                auVar97 = ZEXT1664(auVar248);
                auVar325 = ZEXT864(0);
                auVar372._8_4_ = 0x3d2aa9c1;
                auVar372._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar372._12_4_ = 0x3d2aa9c1;
                auVar380 = vfmadd213ps_fma(auVar380,auVar116,auVar372);
                auVar380 = vfmadd213ps_fma(auVar380,auVar116,auVar358);
                auVar248 = vfmadd213ps_fma(auVar380,auVar116,auVar248);
                auVar248 = vfmadd213ps_fma(auVar248,auVar286,auVar116);
                auVar287._0_4_ = auVar248._0_4_ + 1.0;
                auVar287._4_4_ = auVar248._4_4_ + 1.0;
                auVar287._8_4_ = auVar248._8_4_ + 1.0;
                auVar287._12_4_ = auVar248._12_4_ + 1.0;
                auVar103._0_4_ = (int)auVar407._0_4_;
                auVar103._4_4_ = (int)auVar407._4_4_;
                auVar103._8_4_ = (int)auVar407._8_4_;
                auVar103._12_4_ = (int)auVar407._12_4_;
                auVar248 = vpslld_avx(auVar103,0x17);
                auVar248 = vpaddd_avx(auVar248,auVar78);
                auVar407 = vfmadd213ps_fma(auVar248,auVar287,auVar78);
                auVar248 = vrcpps_avx(auVar407);
                auVar288._0_4_ = auVar248._0_4_ + auVar248._0_4_;
                auVar288._4_4_ = auVar248._4_4_ + auVar248._4_4_;
                auVar288._8_4_ = auVar248._8_4_ + auVar248._8_4_;
                auVar288._12_4_ = auVar248._12_4_ + auVar248._12_4_;
                auVar359._8_4_ = 0x40000000;
                auVar359._0_8_ = 0x4000000040000000;
                auVar359._12_4_ = 0x40000000;
                auVar407 = vfmsub213ps_fma(auVar407,auVar288,auVar359);
                auVar248 = vfnmadd213ps_fma(auVar407,auVar248,auVar288);
                auVar109 = vfmsub213ps_fma(auVar248,auVar107,auVar107);
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var45);
                auVar108._4_4_ = uVar1;
                auVar108._0_4_ = uVar1;
                auVar108._8_4_ = uVar1;
                auVar108._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var45))[1];
                auVar181._4_4_ = uVar1;
                auVar181._0_4_ = uVar1;
                auVar181._8_4_ = uVar1;
                auVar181._12_4_ = uVar1;
                auVar107 = vfmadd231ps_fma(auVar181,auVar107,auVar108);
                auVar107 = vmaxps_avx(auVar107,auVar407);
                auVar107 = vminps_avx(auVar107,auVar78);
                auVar109._0_4_ = auVar370._0_4_ * auVar107._0_4_;
                auVar109._4_4_ = auVar370._4_4_ * auVar107._4_4_;
                auVar109._8_4_ = auVar370._8_4_ * auVar107._8_4_;
                auVar109._12_4_ = auVar370._12_4_ * auVar107._12_4_;
              }
            }
            *(undefined1 (*) [16])local_188 = auVar109;
            local_188 = local_188 + 2;
            iVar44 = iVar44 + 1;
          }
          uVar48 = (ulong)(uVar60 + 1);
        }
      }
    }
    if ((iVar61 == 1) && (uVar51 == 8)) {
      p_Var45 = local_68[-3];
      uVar8 = *(uint *)(&this->field_0xd4 + (long)p_Var45);
      uVar10 = *(uint *)(&this->field_0xd8 + (long)p_Var45);
      iVar59 = *(int *)(&this->field_0xdc + (long)p_Var45);
      iVar7 = *(int *)(&this->field_0xe0 + (long)p_Var45);
      iVar58 = *(int *)(&this->field_0xe4 + (long)p_Var45);
      iVar64 = *(int *)(&this->field_0xe8 + (long)p_Var45);
      iVar69 = *(int *)(&this->field_0x114 + (long)p_Var45);
      lVar49 = *(long *)(&this->field_0x1a8 + (long)p_Var45);
      uVar73 = 0;
      uVar65 = 0;
      if (0 < (int)uVar8) {
        uVar65 = (ulong)uVar8;
      }
      uVar55 = 0;
      if (0 < (int)uVar10) {
        uVar55 = (ulong)uVar10;
      }
      uVar47 = (ulong)(uint)local_b8.c;
      if (local_b8.c < 1) {
        uVar47 = uVar73;
      }
      auVar453 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                    CONCAT424(0xc2b0c0a5,
                                              CONCAT420(0xc2b0c0a5,
                                                        CONCAT416(0xc2b0c0a5,
                                                                  CONCAT412(0xc2b0c0a5,
                                                                            CONCAT48(0xc2b0c0a5,
                                                                                                                                                                          
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar97 = ZEXT3264(CONCAT428(0x3f000000,
                                   CONCAT424(0x3f000000,
                                             CONCAT420(0x3f000000,
                                                       CONCAT416(0x3f000000,
                                                                 CONCAT412(0x3f000000,
                                                                           CONCAT48(0x3f000000,
                                                                                                                                                                        
                                                  0x3f0000003f000000)))))));
      auVar461 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                    CONCAT424(0x3fb8aa3b,
                                              CONCAT420(0x3fb8aa3b,
                                                        CONCAT416(0x3fb8aa3b,
                                                                  CONCAT412(0x3fb8aa3b,
                                                                            CONCAT48(0x3fb8aa3b,
                                                                                                                                                                          
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar325 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar164 = ZEXT3264(CONCAT428(0x3f318000,
                                    CONCAT424(0x3f318000,
                                              CONCAT420(0x3f318000,
                                                        CONCAT416(0x3f318000,
                                                                  CONCAT412(0x3f318000,
                                                                            CONCAT48(0x3f318000,
                                                                                                                                                                          
                                                  0x3f3180003f318000)))))));
      auVar468 = ZEXT3264(CONCAT428(0x3ab743ce,
                                    CONCAT424(0x3ab743ce,
                                              CONCAT420(0x3ab743ce,
                                                        CONCAT416(0x3ab743ce,
                                                                  CONCAT412(0x3ab743ce,
                                                                            CONCAT48(0x3ab743ce,
                                                                                                                                                                          
                                                  0x3ab743ce3ab743ce)))))));
      auVar393 = ZEXT3264(CONCAT428(0x39506967,
                                    CONCAT424(0x39506967,
                                              CONCAT420(0x39506967,
                                                        CONCAT416(0x39506967,
                                                                  CONCAT412(0x39506967,
                                                                            CONCAT48(0x39506967,
                                                                                                                                                                          
                                                  0x3950696739506967)))))));
      auVar377 = ZEXT3264(CONCAT428(0x3c088908,
                                    CONCAT424(0x3c088908,
                                              CONCAT420(0x3c088908,
                                                        CONCAT416(0x3c088908,
                                                                  CONCAT412(0x3c088908,
                                                                            CONCAT48(0x3c088908,
                                                                                                                                                                          
                                                  0x3c0889083c088908)))))));
      auVar491 = ZEXT3264(CONCAT428(0x3d2aa9c1,
                                    CONCAT424(0x3d2aa9c1,
                                              CONCAT420(0x3d2aa9c1,
                                                        CONCAT416(0x3d2aa9c1,
                                                                  CONCAT412(0x3d2aa9c1,
                                                                            CONCAT48(0x3d2aa9c1,
                                                                                                                                                                          
                                                  0x3d2aa9c13d2aa9c1)))))));
      auVar370 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                    CONCAT424(0x3e2aaaaa,
                                              CONCAT420(0x3e2aaaaa,
                                                        CONCAT416(0x3e2aaaaa,
                                                                  CONCAT412(0x3e2aaaaa,
                                                                            CONCAT48(0x3e2aaaaa,
                                                                                                                                                                          
                                                  0x3e2aaaaa3e2aaaaa)))))));
      auVar406 = ZEXT1664(ZEXT816(0) << 0x40);
      for (; uVar73 != uVar47; uVar73 = uVar73 + 1) {
        local_188 = (_func_int ***)
                    ((long)(_func_int ***)local_b8.data +
                    local_b8.cstep * uVar73 * local_b8.elemsize);
        iVar42 = bottom_blob->w;
        iVar43 = bottom_blob->h;
        uVar48 = 0;
        uVar74 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar74 = uVar48;
        }
        uVar39 = local_b8.w;
        if (local_b8.w < 1) {
          uVar39 = 0;
        }
        uVar57 = local_b8.h;
        if (local_b8.h < 1) {
          uVar57 = 0;
        }
        while (uVar60 = (uint)uVar48, uVar60 != uVar57) {
          iVar44 = (1 - uVar8) * iVar59;
          for (uVar40 = 0; uVar40 != uVar39; uVar40 = uVar40 + 1) {
            if (lVar49 == 0) {
              auVar98 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar98 = ZEXT3264(*(undefined1 (*) [32])(lVar49 + uVar73 * 0x20));
            }
            pvVar67 = (void *)((this->weight_data_tm).cstep * uVar73 *
                               (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
            for (uVar48 = 0; uVar48 != uVar74; uVar48 = uVar48 + 1) {
              pvVar68 = pvVar67;
              for (uVar66 = 0; uVar66 != uVar55; uVar66 = uVar66 + 1) {
                iVar36 = (((int)uVar66 - uVar10) + 1) * iVar7 + uVar60;
                if (((-1 < iVar36) && (iVar37 = iVar36 / iVar64, iVar36 % iVar64 == 0)) &&
                   (iVar37 < iVar43)) {
                  iVar36 = iVar44;
                  for (lVar71 = 0; uVar65 * 0x20 != lVar71; lVar71 = lVar71 + 0x20) {
                    if (((-1 < iVar36) && (iVar41 = iVar36 / iVar58, iVar36 % iVar58 == 0)) &&
                       (iVar41 < iVar42)) {
                      uVar1 = *(undefined4 *)
                               ((long)bottom_blob->data +
                               (long)iVar41 * 4 +
                               (long)iVar37 * (long)bottom_blob->w * bottom_blob->elemsize +
                               bottom_blob->cstep * bottom_blob->elemsize * uVar48);
                      auVar152._4_4_ = uVar1;
                      auVar152._0_4_ = uVar1;
                      auVar152._8_4_ = uVar1;
                      auVar152._12_4_ = uVar1;
                      auVar152._16_4_ = uVar1;
                      auVar152._20_4_ = uVar1;
                      auVar152._24_4_ = uVar1;
                      auVar152._28_4_ = uVar1;
                      auVar107 = vfmadd231ps_fma(auVar98._0_32_,auVar152,
                                                 *(undefined1 (*) [32])((long)pvVar68 + lVar71));
                      auVar98 = ZEXT1664(auVar107);
                    }
                    iVar36 = iVar36 + iVar59;
                  }
                }
                pvVar68 = (void *)((long)pvVar68 + (long)(int)uVar8 * 0x20);
              }
              pvVar67 = (void *)((long)pvVar67 + (long)(int)(uVar8 * uVar10 * 8) * 4);
            }
            auVar471 = auVar98._0_32_;
            auVar477 = auVar471;
            if (5 < iVar69 - 1U) goto switchD_00284dc3_caseD_1;
            auVar154 = auVar406._0_32_;
            auVar477 = vmaxps_avx(auVar154,auVar471);
            auVar135 = auVar325._0_32_;
            auVar90 = auVar164._0_32_;
            auVar464 = auVar453._0_32_;
            auVar486 = auVar461._0_32_;
            auVar144 = auVar97._0_32_;
            auVar442 = auVar393._0_32_;
            auVar224 = auVar468._0_32_;
            auVar428 = auVar377._0_32_;
            switch(iVar69) {
            case 2:
              auVar471 = vminps_avx(auVar154,auVar471);
              uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var45);
              auVar153._4_4_ = uVar1;
              auVar153._0_4_ = uVar1;
              auVar153._8_4_ = uVar1;
              auVar153._12_4_ = uVar1;
              auVar153._16_4_ = uVar1;
              auVar153._20_4_ = uVar1;
              auVar153._24_4_ = uVar1;
              auVar153._28_4_ = uVar1;
              auVar107 = vfmadd231ps_fma(auVar477,auVar471,auVar153);
              auVar477 = ZEXT1632(auVar107);
              break;
            case 3:
              uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var45);
              auVar161._4_4_ = uVar1;
              auVar161._0_4_ = uVar1;
              auVar161._8_4_ = uVar1;
              auVar161._12_4_ = uVar1;
              auVar161._16_4_ = uVar1;
              auVar161._20_4_ = uVar1;
              auVar161._24_4_ = uVar1;
              auVar161._28_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var45))[1];
              auVar478._4_4_ = uVar1;
              auVar478._0_4_ = uVar1;
              auVar478._8_4_ = uVar1;
              auVar478._12_4_ = uVar1;
              auVar478._16_4_ = uVar1;
              auVar478._20_4_ = uVar1;
              auVar478._24_4_ = uVar1;
              auVar478._28_4_ = uVar1;
              auVar471 = vmaxps_avx(auVar471,auVar161);
              auVar477 = vminps_avx(auVar478,auVar471);
              break;
            case 4:
              auVar94._0_8_ = auVar98._0_8_ ^ 0x8000000080000000;
              auVar94._8_4_ = -auVar98._8_4_;
              auVar94._12_4_ = -auVar98._12_4_;
              auVar94._16_4_ = -auVar98._16_4_;
              auVar94._20_4_ = -auVar98._20_4_;
              auVar94._24_4_ = -auVar98._24_4_;
              auVar94._28_4_ = auVar98._28_4_ ^ 0x80000000;
              auVar162._8_4_ = 0x42b0c0a5;
              auVar162._0_8_ = 0x42b0c0a542b0c0a5;
              auVar162._12_4_ = 0x42b0c0a5;
              auVar162._16_4_ = 0x42b0c0a5;
              auVar162._20_4_ = 0x42b0c0a5;
              auVar162._24_4_ = 0x42b0c0a5;
              auVar162._28_4_ = 0x42b0c0a5;
              auVar471 = vminps_avx(auVar94,auVar162);
              auVar154 = vmaxps_avx(auVar464,auVar471);
              auVar107 = vfmadd213ps_fma(auVar486,auVar154,auVar144);
              auVar464 = vroundps_avx(ZEXT1632(auVar107),1);
              auVar471 = vcmpps_avx(ZEXT1632(auVar107),auVar464,1);
              auVar471 = vandps_avx(auVar471,auVar135);
              auVar471 = vsubps_avx(auVar464,auVar471);
              auVar107 = vfmsub231ps_fma(auVar154,auVar471,auVar90);
              auVar244._8_4_ = 0x395e8083;
              auVar244._0_8_ = 0x395e8083395e8083;
              auVar244._12_4_ = 0x395e8083;
              auVar244._16_4_ = 0x395e8083;
              auVar244._20_4_ = 0x395e8083;
              auVar244._24_4_ = 0x395e8083;
              auVar244._28_4_ = 0x395e8083;
              auVar248 = vfmsub231ps_fma(ZEXT1632(auVar107),auVar471,auVar244);
              auVar90 = ZEXT1632(auVar248);
              auVar30._28_4_ = auVar464._28_4_;
              auVar30._0_28_ =
                   ZEXT1628(CONCAT412(auVar248._12_4_ * auVar248._12_4_,
                                      CONCAT48(auVar248._8_4_ * auVar248._8_4_,
                                               CONCAT44(auVar248._4_4_ * auVar248._4_4_,
                                                        auVar248._0_4_ * auVar248._0_4_))));
              auVar107 = vfmadd213ps_fma(auVar442,auVar90,auVar224);
              auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar90,auVar428);
              auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar90,auVar491._0_32_);
              auVar90 = ZEXT1632(auVar248);
              auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar90,auVar370._0_32_);
              auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar90,auVar144);
              auVar407 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar30,auVar90);
              auVar79._0_4_ = (int)auVar471._0_4_;
              auVar79._4_4_ = (int)auVar471._4_4_;
              auVar79._8_4_ = (int)auVar471._8_4_;
              auVar79._12_4_ = (int)auVar471._12_4_;
              auVar95._16_4_ = (int)auVar471._16_4_;
              auVar95._0_16_ = auVar79;
              auVar95._20_4_ = (int)auVar471._20_4_;
              auVar95._24_4_ = (int)auVar471._24_4_;
              auVar95._28_4_ = (int)auVar471._28_4_;
              auVar248 = vpslld_avx(auVar79,0x17);
              auVar107 = vpslld_avx(auVar95._16_16_,0x17);
              auVar183._8_4_ = 0x3f800000;
              auVar183._0_8_ = 0x3f8000003f800000;
              auVar183._12_4_ = 0x3f800000;
              auVar107 = vpaddd_avx(auVar107,auVar183);
              auVar248 = vpaddd_avx(auVar248,auVar183);
              auVar479._16_16_ = auVar107;
              auVar479._0_16_ = auVar248;
              auVar96._0_4_ = auVar407._0_4_ + auVar325._0_4_;
              auVar96._4_4_ = auVar407._4_4_ + auVar325._4_4_;
              auVar96._8_4_ = auVar407._8_4_ + auVar325._8_4_;
              auVar96._12_4_ = auVar407._12_4_ + auVar325._12_4_;
              auVar96._16_4_ = auVar325._16_4_ + 0.0;
              auVar96._20_4_ = auVar325._20_4_ + 0.0;
              auVar96._24_4_ = auVar325._24_4_ + 0.0;
              auVar96._28_4_ = auVar325._28_4_ + 0.0;
              auVar406 = ZEXT864(0) << 0x20;
              auVar107 = vfmadd213ps_fma(auVar479,auVar96,auVar135);
              auVar471 = vrcpps_avx(ZEXT1632(auVar107));
              auVar107 = vfmsub213ps_fma(ZEXT1632(auVar107),auVar471,auVar135);
              auVar107 = vfnmadd132ps_fma(ZEXT1632(auVar107),auVar471,auVar471);
              auVar477 = ZEXT1632(auVar107);
              break;
            case 5:
              auVar434._8_4_ = 0x42b0c0a5;
              auVar434._0_8_ = 0x42b0c0a542b0c0a5;
              auVar434._12_4_ = 0x42b0c0a5;
              auVar434._16_4_ = 0x42b0c0a5;
              auVar434._20_4_ = 0x42b0c0a5;
              auVar434._24_4_ = 0x42b0c0a5;
              auVar434._28_4_ = 0x42b0c0a5;
              auVar471 = vminps_avx(auVar434,auVar471);
              auVar154 = vmaxps_avx(auVar464,auVar471);
              auVar107 = vfmadd213ps_fma(auVar486,auVar154,auVar144);
              auVar266 = vroundps_avx(ZEXT1632(auVar107),1);
              auVar471 = vcmpps_avx(ZEXT1632(auVar107),auVar266,1);
              auVar471 = vandps_avx(auVar471,auVar135);
              auVar471 = vsubps_avx(auVar266,auVar471);
              auVar107 = vfmsub231ps_fma(auVar154,auVar471,auVar90);
              auVar238._8_4_ = 0xb95e8083;
              auVar238._0_8_ = 0xb95e8083b95e8083;
              auVar238._12_4_ = 0xb95e8083;
              auVar238._16_4_ = 0xb95e8083;
              auVar238._20_4_ = 0xb95e8083;
              auVar238._24_4_ = 0xb95e8083;
              auVar238._28_4_ = 0xb95e8083;
              auVar248 = vfnmsub231ps_fma(ZEXT1632(auVar107),auVar471,auVar238);
              auVar154 = ZEXT1632(auVar248);
              auVar27._28_4_ = auVar266._28_4_;
              auVar27._0_28_ =
                   ZEXT1628(CONCAT412(auVar248._12_4_ * auVar248._12_4_,
                                      CONCAT48(auVar248._8_4_ * auVar248._8_4_,
                                               CONCAT44(auVar248._4_4_ * auVar248._4_4_,
                                                        auVar248._0_4_ * auVar248._0_4_))));
              auVar107 = vfmadd213ps_fma(auVar442,auVar154,auVar224);
              auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar154,auVar428);
              auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar154,auVar491._0_32_);
              auVar154 = ZEXT1632(auVar248);
              auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar154,auVar370._0_32_);
              auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar154,auVar144);
              auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar27,auVar154);
              auVar155._0_4_ = auVar107._0_4_ + auVar325._0_4_;
              auVar155._4_4_ = auVar107._4_4_ + auVar325._4_4_;
              auVar155._8_4_ = auVar107._8_4_ + auVar325._8_4_;
              auVar155._12_4_ = auVar107._12_4_ + auVar325._12_4_;
              auVar155._16_4_ = auVar325._16_4_ + 0.0;
              auVar155._20_4_ = auVar325._20_4_ + 0.0;
              auVar155._24_4_ = auVar325._24_4_ + 0.0;
              auVar155._28_4_ = auVar325._28_4_ + 0.0;
              auVar182._0_4_ = (int)auVar471._0_4_;
              auVar182._4_4_ = (int)auVar471._4_4_;
              auVar182._8_4_ = (int)auVar471._8_4_;
              auVar182._12_4_ = (int)auVar471._12_4_;
              auVar239._16_4_ = (int)auVar471._16_4_;
              auVar239._0_16_ = auVar182;
              auVar239._20_4_ = (int)auVar471._20_4_;
              auVar239._24_4_ = (int)auVar471._24_4_;
              auVar239._28_4_ = (int)auVar471._28_4_;
              auVar248 = vpslld_avx(auVar182,0x17);
              auVar107 = vpslld_avx(auVar239._16_16_,0x17);
              auVar326._8_4_ = 0x3f800000;
              auVar326._0_8_ = 0x3f8000003f800000;
              auVar326._12_4_ = 0x3f800000;
              auVar107 = vpaddd_avx(auVar107,auVar326);
              auVar248 = vpaddd_avx(auVar248,auVar326);
              auVar476._16_16_ = auVar107;
              auVar476._0_16_ = auVar248;
              auVar407 = vfmadd213ps_fma(auVar476,auVar155,auVar135);
              auVar156._8_4_ = 0x800000;
              auVar156._0_8_ = 0x80000000800000;
              auVar156._12_4_ = 0x800000;
              auVar156._16_4_ = 0x800000;
              auVar156._20_4_ = 0x800000;
              auVar156._24_4_ = 0x800000;
              auVar156._28_4_ = 0x800000;
              auVar471 = vmaxps_avx(ZEXT1632(auVar407),auVar156);
              auVar248 = vpsrld_avx(auVar471._0_16_,0x17);
              auVar107 = vpsrld_avx(auVar471._16_16_,0x17);
              auVar322._8_4_ = 0x807fffff;
              auVar322._0_8_ = 0x807fffff807fffff;
              auVar322._12_4_ = 0x807fffff;
              auVar322._16_4_ = 0x807fffff;
              auVar322._20_4_ = 0x807fffff;
              auVar322._24_4_ = 0x807fffff;
              auVar322._28_4_ = 0x807fffff;
              auVar471 = vandps_avx(auVar471,auVar322);
              auVar154 = vorps_avx(auVar471,auVar144);
              auVar323._8_4_ = 0x3f3504f3;
              auVar323._0_8_ = 0x3f3504f33f3504f3;
              auVar323._12_4_ = 0x3f3504f3;
              auVar323._16_4_ = 0x3f3504f3;
              auVar323._20_4_ = 0x3f3504f3;
              auVar323._24_4_ = 0x3f3504f3;
              auVar323._28_4_ = 0x3f3504f3;
              auVar135 = vcmpps_avx(auVar323,auVar154,2);
              auVar471 = vandnps_avx(auVar135,auVar154);
              auVar157._0_4_ = auVar471._0_4_ + auVar154._0_4_ + -1.0;
              auVar157._4_4_ = auVar471._4_4_ + auVar154._4_4_ + -1.0;
              auVar157._8_4_ = auVar471._8_4_ + auVar154._8_4_ + -1.0;
              auVar157._12_4_ = auVar471._12_4_ + auVar154._12_4_ + -1.0;
              auVar157._16_4_ = auVar471._16_4_ + auVar154._16_4_ + -1.0;
              auVar157._20_4_ = auVar471._20_4_ + auVar154._20_4_ + -1.0;
              auVar157._24_4_ = auVar471._24_4_ + auVar154._24_4_ + -1.0;
              auVar157._28_4_ = auVar471._28_4_ + auVar154._28_4_ + -1.0;
              auVar107 = vpsubd_avx(auVar107,auVar135._16_16_);
              auVar415._8_4_ = 0xffffff81;
              auVar415._0_8_ = 0xffffff81ffffff81;
              auVar415._12_4_ = 0xffffff81;
              auVar107 = vpaddd_avx(auVar107,auVar415);
              auVar248 = vpsubd_avx(auVar248,auVar135._0_16_);
              auVar248 = vpaddd_avx(auVar415,auVar248);
              auVar240._16_16_ = auVar107;
              auVar240._0_16_ = auVar248;
              auVar28._4_4_ = auVar157._4_4_ * auVar157._4_4_;
              auVar28._0_4_ = auVar157._0_4_ * auVar157._0_4_;
              auVar28._8_4_ = auVar157._8_4_ * auVar157._8_4_;
              auVar28._12_4_ = auVar157._12_4_ * auVar157._12_4_;
              auVar28._16_4_ = auVar157._16_4_ * auVar157._16_4_;
              auVar28._20_4_ = auVar157._20_4_ * auVar157._20_4_;
              auVar28._24_4_ = auVar157._24_4_ * auVar157._24_4_;
              auVar28._28_4_ = auVar135._28_4_;
              auVar404._8_4_ = 0x3d9021bb;
              auVar404._0_8_ = 0x3d9021bb3d9021bb;
              auVar404._12_4_ = 0x3d9021bb;
              auVar404._16_4_ = 0x3d9021bb;
              auVar404._20_4_ = 0x3d9021bb;
              auVar404._24_4_ = 0x3d9021bb;
              auVar404._28_4_ = 0x3d9021bb;
              auVar347._8_4_ = 0xbdebd1b8;
              auVar347._0_8_ = 0xbdebd1b8bdebd1b8;
              auVar347._12_4_ = 0xbdebd1b8;
              auVar347._16_4_ = 0xbdebd1b8;
              auVar347._20_4_ = 0xbdebd1b8;
              auVar347._24_4_ = 0xbdebd1b8;
              auVar347._28_4_ = 0xbdebd1b8;
              auVar107 = vfmadd213ps_fma(auVar404,auVar157,auVar347);
              auVar348._8_4_ = 0x3def251a;
              auVar348._0_8_ = 0x3def251a3def251a;
              auVar348._12_4_ = 0x3def251a;
              auVar348._16_4_ = 0x3def251a;
              auVar348._20_4_ = 0x3def251a;
              auVar348._24_4_ = 0x3def251a;
              auVar348._28_4_ = 0x3def251a;
              auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar157,auVar348);
              auVar349._8_4_ = 0xbdfe5d4f;
              auVar349._0_8_ = 0xbdfe5d4fbdfe5d4f;
              auVar349._12_4_ = 0xbdfe5d4f;
              auVar349._16_4_ = 0xbdfe5d4f;
              auVar349._20_4_ = 0xbdfe5d4f;
              auVar349._24_4_ = 0xbdfe5d4f;
              auVar349._28_4_ = 0xbdfe5d4f;
              auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar157,auVar349);
              auVar350._8_4_ = 0x3e11e9bf;
              auVar350._0_8_ = 0x3e11e9bf3e11e9bf;
              auVar350._12_4_ = 0x3e11e9bf;
              auVar350._16_4_ = 0x3e11e9bf;
              auVar350._20_4_ = 0x3e11e9bf;
              auVar350._24_4_ = 0x3e11e9bf;
              auVar350._28_4_ = 0x3e11e9bf;
              auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar157,auVar350);
              auVar351._8_4_ = 0xbe2aae50;
              auVar351._0_8_ = 0xbe2aae50be2aae50;
              auVar351._12_4_ = 0xbe2aae50;
              auVar351._16_4_ = 0xbe2aae50;
              auVar351._20_4_ = 0xbe2aae50;
              auVar351._24_4_ = 0xbe2aae50;
              auVar351._28_4_ = 0xbe2aae50;
              auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar157,auVar351);
              auVar352._8_4_ = 0x3e4cceac;
              auVar352._0_8_ = 0x3e4cceac3e4cceac;
              auVar352._12_4_ = 0x3e4cceac;
              auVar352._16_4_ = 0x3e4cceac;
              auVar352._20_4_ = 0x3e4cceac;
              auVar352._24_4_ = 0x3e4cceac;
              auVar352._28_4_ = 0x3e4cceac;
              auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar157,auVar352);
              auVar353._8_4_ = 0xbe7ffffc;
              auVar353._0_8_ = 0xbe7ffffcbe7ffffc;
              auVar353._12_4_ = 0xbe7ffffc;
              auVar353._16_4_ = 0xbe7ffffc;
              auVar353._20_4_ = 0xbe7ffffc;
              auVar353._24_4_ = 0xbe7ffffc;
              auVar353._28_4_ = 0xbe7ffffc;
              auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar157,auVar353);
              auVar354._8_4_ = 0x3eaaaaaa;
              auVar354._0_8_ = 0x3eaaaaaa3eaaaaaa;
              auVar354._12_4_ = 0x3eaaaaaa;
              auVar354._16_4_ = 0x3eaaaaaa;
              auVar354._20_4_ = 0x3eaaaaaa;
              auVar354._24_4_ = 0x3eaaaaaa;
              auVar354._28_4_ = 0x3eaaaaaa;
              auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar157,auVar354);
              auVar405._0_4_ = auVar157._0_4_ * auVar157._0_4_ * auVar157._0_4_ * auVar107._0_4_;
              auVar405._4_4_ = auVar157._4_4_ * auVar157._4_4_ * auVar157._4_4_ * auVar107._4_4_;
              auVar405._8_4_ = auVar157._8_4_ * auVar157._8_4_ * auVar157._8_4_ * auVar107._8_4_;
              auVar405._12_4_ =
                   auVar157._12_4_ * auVar157._12_4_ * auVar157._12_4_ * auVar107._12_4_;
              auVar405._16_4_ = auVar157._16_4_ * auVar157._16_4_ * auVar157._16_4_ * 0.0;
              auVar405._20_4_ = auVar157._20_4_ * auVar157._20_4_ * auVar157._20_4_ * 0.0;
              auVar405._24_4_ = auVar157._24_4_ * auVar157._24_4_ * auVar157._24_4_ * 0.0;
              auVar405._28_4_ = 0;
              auVar453 = ZEXT3264(auVar464);
              auVar461 = ZEXT3264(auVar486);
              auVar468 = ZEXT3264(auVar224);
              auVar393 = ZEXT3264(auVar442);
              auVar164 = ZEXT3264(auVar90);
              auVar377 = ZEXT3264(auVar428);
              auVar97 = ZEXT3264(auVar144);
              auVar490._8_4_ = 0x3d2aa9c1;
              auVar490._0_8_ = 0x3d2aa9c13d2aa9c1;
              auVar490._12_4_ = 0x3d2aa9c1;
              auVar490._16_4_ = 0x3d2aa9c1;
              auVar490._20_4_ = 0x3d2aa9c1;
              auVar490._24_4_ = 0x3d2aa9c1;
              auVar490._28_4_ = 0x3d2aa9c1;
              auVar491 = ZEXT3264(auVar490);
              auVar135 = vcvtdq2ps_avx(auVar240);
              auVar435._8_4_ = 0xb95e8083;
              auVar435._0_8_ = 0xb95e8083b95e8083;
              auVar435._12_4_ = 0xb95e8083;
              auVar435._16_4_ = 0xb95e8083;
              auVar435._20_4_ = 0xb95e8083;
              auVar435._24_4_ = 0xb95e8083;
              auVar435._28_4_ = 0xb95e8083;
              auVar107 = vfmadd231ps_fma(auVar405,auVar135,auVar435);
              auVar107 = vfmsub231ps_fma(ZEXT1632(auVar107),auVar144,auVar28);
              auVar471 = vcmpps_avx(ZEXT1632(auVar407),_DAT_004c71e0,2);
              auVar154 = vsubps_avx(ZEXT1632(auVar107),auVar157);
              auVar107 = vfmsub231ps_fma(auVar154,auVar90,auVar135);
              auVar477._8_4_ = 0xc0000000;
              auVar477._0_8_ = 0xc0000000c0000000;
              auVar477._12_4_ = 0xc0000000;
              auVar477._16_4_ = 0xc0000000;
              auVar477._20_4_ = 0xc0000000;
              auVar477._24_4_ = 0xc0000000;
              auVar477._28_4_ = 0xc0000000;
              auVar158._0_4_ = auVar107._0_4_ * -2.0;
              auVar158._4_4_ = auVar107._4_4_ * -2.0;
              auVar158._8_4_ = auVar107._8_4_ * -2.0;
              auVar158._12_4_ = auVar107._12_4_ * -2.0;
              auVar158._16_4_ = 0x80000000;
              auVar158._20_4_ = 0x80000000;
              auVar158._24_4_ = 0x80000000;
              auVar158._28_4_ = 0;
              auVar241._8_4_ = 0x7fffffff;
              auVar241._0_8_ = 0x7fffffff7fffffff;
              auVar241._12_4_ = 0x7fffffff;
              auVar241._16_4_ = 0x7fffffff;
              auVar241._20_4_ = 0x7fffffff;
              auVar241._24_4_ = 0x7fffffff;
              auVar241._28_4_ = 0x7fffffff;
              auVar471 = vblendvps_avx(auVar158,auVar241,auVar471);
              auVar471 = vminps_avx(auVar471,auVar434);
              auVar135 = vmaxps_avx(auVar464,auVar471);
              auVar107 = vfmadd213ps_fma(auVar486,auVar135,auVar144);
              auVar154 = vroundps_avx(ZEXT1632(auVar107),1);
              auVar471 = vcmpps_avx(ZEXT1632(auVar107),auVar154,1);
              auVar355._8_4_ = 0x3f800000;
              auVar355._0_8_ = 0x3f8000003f800000;
              auVar355._12_4_ = 0x3f800000;
              auVar355._16_4_ = 0x3f800000;
              auVar355._20_4_ = 0x3f800000;
              auVar355._24_4_ = 0x3f800000;
              auVar355._28_4_ = 0x3f800000;
              auVar471 = vandps_avx(auVar471,auVar355);
              auVar356._8_4_ = 0x3e2aaaaa;
              auVar356._0_8_ = 0x3e2aaaaa3e2aaaaa;
              auVar356._12_4_ = 0x3e2aaaaa;
              auVar356._16_4_ = 0x3e2aaaaa;
              auVar356._20_4_ = 0x3e2aaaaa;
              auVar356._24_4_ = 0x3e2aaaaa;
              auVar356._28_4_ = 0x3e2aaaaa;
              auVar370 = ZEXT3264(auVar356);
              auVar471 = vsubps_avx(auVar154,auVar471);
              auVar107 = vfmsub231ps_fma(auVar135,auVar471,auVar90);
              auVar248 = vfnmsub231ps_fma(ZEXT1632(auVar107),auVar471,auVar435);
              auVar135 = ZEXT1632(auVar248);
              auVar29._28_4_ = auVar154._28_4_;
              auVar29._0_28_ =
                   ZEXT1628(CONCAT412(auVar248._12_4_ * auVar248._12_4_,
                                      CONCAT48(auVar248._8_4_ * auVar248._8_4_,
                                               CONCAT44(auVar248._4_4_ * auVar248._4_4_,
                                                        auVar248._0_4_ * auVar248._0_4_))));
              auVar107 = vfmadd213ps_fma(auVar442,auVar135,auVar224);
              auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar135,auVar428);
              auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar135,auVar490);
              auVar135 = ZEXT1632(auVar248);
              auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar135,auVar356);
              auVar107 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar135,auVar144);
              auVar407 = vfmadd213ps_fma(ZEXT1632(auVar107),auVar29,auVar135);
              auVar324._8_4_ = 0x3f800000;
              auVar324._0_8_ = 0x3f8000003f800000;
              auVar324._12_4_ = 0x3f800000;
              auVar324._16_4_ = 0x3f800000;
              auVar324._20_4_ = 0x3f800000;
              auVar324._24_4_ = 0x3f800000;
              auVar324._28_4_ = 0x3f800000;
              auVar325 = ZEXT3264(auVar324);
              auVar110._0_4_ = (int)auVar471._0_4_;
              auVar110._4_4_ = (int)auVar471._4_4_;
              auVar110._8_4_ = (int)auVar471._8_4_;
              auVar110._12_4_ = (int)auVar471._12_4_;
              auVar159._16_4_ = (int)auVar471._16_4_;
              auVar159._0_16_ = auVar110;
              auVar159._20_4_ = (int)auVar471._20_4_;
              auVar159._24_4_ = (int)auVar471._24_4_;
              auVar159._28_4_ = (int)auVar471._28_4_;
              auVar248 = vpslld_avx(auVar110,0x17);
              auVar107 = vpslld_avx(auVar159._16_16_,0x17);
              auVar416._8_4_ = 0x3f800000;
              auVar416._0_8_ = 0x3f8000003f800000;
              auVar416._12_4_ = 0x3f800000;
              auVar107 = vpaddd_avx(auVar416,auVar107);
              auVar248 = vpaddd_avx(auVar416,auVar248);
              auVar160._16_16_ = auVar107;
              auVar160._0_16_ = auVar248;
              auVar242._0_4_ = auVar407._0_4_ + 1.0;
              auVar242._4_4_ = auVar407._4_4_ + 1.0;
              auVar242._8_4_ = auVar407._8_4_ + 1.0;
              auVar242._12_4_ = auVar407._12_4_ + 1.0;
              auVar242._16_4_ = 0x3f800000;
              auVar242._20_4_ = 0x3f800000;
              auVar242._24_4_ = 0x3f800000;
              auVar242._28_4_ = 0x3f800000;
              auVar406 = ZEXT864(0) << 0x20;
              auVar107 = vfmadd213ps_fma(auVar160,auVar242,auVar324);
              auVar471 = vrcpps_avx(ZEXT1632(auVar107));
              auVar107 = vfmsub213ps_fma(ZEXT1632(auVar107),auVar471,auVar324);
              auVar107 = vfnmadd132ps_fma(ZEXT1632(auVar107),auVar471,auVar471);
              auVar243._8_4_ = 0xbf800000;
              auVar243._0_8_ = 0xbf800000bf800000;
              auVar243._12_4_ = 0xbf800000;
              auVar243._16_4_ = 0xbf800000;
              auVar243._20_4_ = 0xbf800000;
              auVar243._24_4_ = 0xbf800000;
              auVar243._28_4_ = 0xbf800000;
              auVar107 = vfnmadd213ps_fma(ZEXT1632(auVar107),auVar477,auVar243);
              auVar212 = ZEXT1628(auVar107);
              goto LAB_002851ea;
            case 6:
              uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var45);
              auVar163._4_4_ = uVar1;
              auVar163._0_4_ = uVar1;
              auVar163._8_4_ = uVar1;
              auVar163._12_4_ = uVar1;
              auVar163._16_4_ = uVar1;
              auVar163._20_4_ = uVar1;
              auVar163._24_4_ = uVar1;
              auVar163._28_4_ = uVar1;
              uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var45))[1];
              auVar245._4_4_ = uVar1;
              auVar245._0_4_ = uVar1;
              auVar245._8_4_ = uVar1;
              auVar245._12_4_ = uVar1;
              auVar245._16_4_ = uVar1;
              auVar245._20_4_ = uVar1;
              auVar245._24_4_ = uVar1;
              auVar245._28_4_ = uVar1;
              auVar107 = vfmadd231ps_fma(auVar245,auVar471,auVar163);
              auVar471 = vmaxps_avx(auVar154,ZEXT1632(auVar107));
              auVar471 = vminps_avx(auVar471,auVar135);
              auVar212 = auVar471._0_28_;
LAB_002851ea:
              auVar33._4_4_ = auVar212._4_4_ * auVar98._4_4_;
              auVar33._0_4_ = auVar212._0_4_ * auVar98._0_4_;
              auVar33._8_4_ = auVar212._8_4_ * auVar98._8_4_;
              auVar33._12_4_ = auVar212._12_4_ * auVar98._12_4_;
              auVar33._16_4_ = auVar212._16_4_ * auVar98._16_4_;
              auVar33._20_4_ = auVar212._20_4_ * auVar98._20_4_;
              auVar33._24_4_ = auVar212._24_4_ * auVar98._24_4_;
              auVar33._28_4_ = auVar477._28_4_;
              auVar477 = auVar33;
            }
switchD_00284dc3_caseD_1:
            *(undefined1 (*) [32])local_188 = auVar477;
            local_188 = local_188 + 4;
            iVar44 = iVar44 + 1;
          }
          uVar48 = (ulong)(uVar60 + 1);
        }
      }
    }
    if ((iVar61 == 8) && (uVar51 == 1)) {
      p_Var45 = local_68[-3];
      uVar8 = *(uint *)(&this->field_0xd4 + (long)p_Var45);
      uVar10 = *(uint *)(&this->field_0xd8 + (long)p_Var45);
      iVar59 = *(int *)(&this->field_0xdc + (long)p_Var45);
      iVar7 = *(int *)(&this->field_0x114 + (long)p_Var45);
      local_50 = local_b8.elemsize * local_b8.cstep;
      uVar73 = 0;
      uVar65 = 0;
      if (0 < (int)uVar8) {
        uVar65 = (ulong)uVar8;
      }
      uVar55 = 0;
      if (0 < (int)uVar10) {
        uVar55 = (ulong)uVar10;
      }
      uVar47 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar47 = uVar73;
      }
      uVar39 = local_b8.w;
      if (local_b8.w < 1) {
        uVar39 = 0;
      }
      uVar57 = local_b8.h;
      if (local_b8.h < 1) {
        uVar57 = 0;
      }
      local_48 = (ulong)(uint)local_b8.c;
      if (local_b8.c < 1) {
        local_48 = uVar73;
      }
      iVar58 = *(int *)(&this->field_0xe0 + (long)p_Var45);
      iVar64 = *(int *)(&this->field_0xe4 + (long)p_Var45);
      iVar69 = *(int *)(&this->field_0xe8 + (long)p_Var45);
      lVar49 = *(long *)(&this->field_0x1a8 + (long)p_Var45);
      local_58 = (Allocator *)local_b8.data;
      iVar42 = bottom_blob->w;
      iVar43 = bottom_blob->h;
      for (; uVar73 != local_48; uVar73 = uVar73 + 1) {
        local_188 = (_func_int ***)((long)&local_58->_vptr_Allocator + local_50 * uVar73);
        for (uVar60 = 0; uVar60 != uVar57; uVar60 = uVar60 + 1) {
          pfVar12 = *(float **)(&this->field_0x118 + (long)p_Var45);
          sVar13 = (this->weight_data_tm).cstep;
          sVar14 = (this->weight_data_tm).elemsize;
          pvVar67 = (this->weight_data_tm).data;
          iVar44 = (1 - uVar8) * iVar59;
          for (uVar40 = 0; uVar40 != uVar39; uVar40 = uVar40 + 1) {
            if (lVar49 == 0) {
              fVar76 = 0.0;
            }
            else {
              fVar76 = *(float *)(lVar49 + uVar73 * 4);
            }
            auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
            pvVar68 = (void *)(sVar13 * uVar73 * sVar14 + (long)pvVar67);
            for (uVar74 = 0; uVar74 != uVar47; uVar74 = uVar74 + 1) {
              pvVar70 = pvVar68;
              for (uVar48 = 0; uVar48 != uVar55; uVar48 = uVar48 + 1) {
                iVar36 = (((int)uVar48 - uVar10) + 1) * iVar58 + uVar60;
                if (((-1 < iVar36) && (iVar37 = iVar36 / iVar69, iVar36 % iVar69 == 0)) &&
                   (iVar37 < iVar43)) {
                  iVar36 = iVar44;
                  for (lVar71 = 0; uVar65 * 0x20 != lVar71; lVar71 = lVar71 + 0x20) {
                    if (((-1 < iVar36) && (iVar41 = iVar36 / iVar64, iVar36 % iVar64 == 0)) &&
                       (iVar41 < iVar42)) {
                      auVar107 = vfmadd231ps_fma(auVar97._0_32_,
                                                 *(undefined1 (*) [32])
                                                  ((long)bottom_blob->data +
                                                  (long)(iVar41 << 3) * 4 +
                                                  (long)iVar37 *
                                                  (long)bottom_blob->w * bottom_blob->elemsize +
                                                  bottom_blob->cstep * bottom_blob->elemsize *
                                                  uVar74),*(undefined1 (*) [32])
                                                           ((long)pvVar70 + lVar71));
                      auVar97 = ZEXT1664(auVar107);
                    }
                    iVar36 = iVar36 + iVar59;
                  }
                }
                pvVar70 = (void *)((long)pvVar70 + (long)(int)uVar8 * 0x20);
              }
              pvVar68 = (void *)((long)pvVar68 + (long)(int)(uVar8 * uVar10 * 8) * 4);
            }
            auVar111._0_4_ = auVar97._16_4_ + auVar97._0_4_;
            auVar111._4_4_ = auVar97._20_4_ + auVar97._4_4_;
            auVar111._8_4_ = auVar97._24_4_ + auVar97._8_4_;
            auVar111._12_4_ = auVar97._28_4_ + auVar97._12_4_;
            auVar107 = vshufpd_avx(auVar111,auVar111,1);
            auVar112._0_4_ = auVar107._0_4_ + auVar111._0_4_;
            auVar112._4_4_ = auVar107._4_4_ + auVar111._4_4_;
            auVar112._8_4_ = auVar107._8_4_ + auVar111._8_4_;
            auVar112._12_4_ = auVar107._12_4_ + auVar111._12_4_;
            auVar107 = vmovshdup_avx(auVar112);
            fVar76 = auVar107._0_4_ + fVar76 + auVar112._0_4_;
            auVar107 = ZEXT416((uint)fVar76);
            fVar75 = fVar76;
            if (iVar7 - 1U < 6) {
              switch(iVar7) {
              case 1:
                auVar107 = vmaxss_avx(ZEXT416((uint)fVar76),ZEXT416(0));
                fVar75 = auVar107._0_4_;
                break;
              case 2:
                auVar80._0_12_ = ZEXT812(0);
                auVar80._12_4_ = 0;
                auVar107 = vcmpss_avx(auVar80,ZEXT416((uint)fVar76),1);
                auVar185._8_4_ = 0x3f800000;
                auVar185._0_8_ = 0x3f8000003f800000;
                auVar185._12_4_ = 0x3f800000;
                auVar107 = vblendvps_avx(ZEXT416((uint)*pfVar12),auVar185,auVar107);
                fVar75 = auVar107._0_4_ * fVar76;
                break;
              case 3:
                auVar107 = vmaxss_avx(auVar107,ZEXT416((uint)*pfVar12));
                fVar75 = auVar107._0_4_;
                if (pfVar12[1] < auVar107._0_4_) {
                  fVar75 = pfVar12[1];
                }
                break;
              case 4:
                auVar107 = vminss_avx(auVar107,ZEXT416(0x42b0c0a5));
                auVar113._0_8_ = auVar107._0_8_ ^ 0x8000000080000000;
                auVar113._8_4_ = auVar107._8_4_ ^ 0x80000000;
                auVar113._12_4_ = auVar107._12_4_ ^ 0x80000000;
                auVar107 = vcmpss_avx(auVar107,ZEXT416(0xc2b0c0a5),1);
                auVar184._8_4_ = 0x42b0c0a5;
                auVar184._0_8_ = 0x42b0c0a542b0c0a5;
                auVar184._12_4_ = 0x42b0c0a5;
                auVar107 = vblendvps_avx(auVar113,auVar184,auVar107);
                fVar76 = expf(auVar107._0_4_);
                fVar75 = 1.0 / (fVar76 + 1.0);
                break;
              case 5:
                fVar75 = expf(fVar76);
                fVar75 = logf(fVar75 + 1.0);
                fVar75 = tanhf(fVar75);
                fVar75 = fVar75 * fVar76;
                break;
              case 6:
                fVar2 = *pfVar12;
                fVar246 = -pfVar12[1] / fVar2;
                fVar75 = 0.0;
                if ((fVar246 <= fVar76) && (fVar75 = fVar76, fVar76 <= fVar246 + 1.0 / fVar2)) {
                  auVar107 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar107,ZEXT416((uint)pfVar12[1])
                                            );
                  fVar75 = auVar107._0_4_ * fVar76;
                }
              }
            }
            *(float *)local_188 = fVar75;
            local_188 = (_func_int ***)((long)local_188 + 4);
            iVar44 = iVar44 + 1;
          }
        }
      }
    }
    if ((iVar61 == 4) && (uVar51 == 4)) {
      p_Var45 = local_68[-3];
      uVar8 = *(uint *)(&this->field_0xd4 + (long)p_Var45);
      uVar10 = *(uint *)(&this->field_0xd8 + (long)p_Var45);
      iVar59 = *(int *)(&this->field_0xdc + (long)p_Var45);
      iVar7 = *(int *)(&this->field_0xe0 + (long)p_Var45);
      iVar58 = *(int *)(&this->field_0xe4 + (long)p_Var45);
      iVar64 = *(int *)(&this->field_0xe8 + (long)p_Var45);
      iVar69 = *(int *)(&this->field_0x114 + (long)p_Var45);
      lVar49 = *(long *)(&this->field_0x1a8 + (long)p_Var45);
      uVar73 = 0;
      uVar65 = 0;
      if (0 < (int)uVar8) {
        uVar65 = (ulong)uVar8;
      }
      uVar55 = 0;
      if (0 < (int)uVar10) {
        uVar55 = (ulong)uVar10;
      }
      uVar47 = (ulong)(uint)local_b8.c;
      if (local_b8.c < 1) {
        uVar47 = uVar73;
      }
      auVar164 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar377 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
      auVar393 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
      auVar327._8_4_ = 0x3f000000;
      auVar327._0_8_ = 0x3f0000003f000000;
      auVar327._12_4_ = 0x3f000000;
      auVar325 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      auVar370 = ZEXT1664(CONCAT412(0x3f318000,CONCAT48(0x3f318000,0x3f3180003f318000)));
      auVar406 = ZEXT1664(CONCAT412(0x3ab743ce,CONCAT48(0x3ab743ce,0x3ab743ce3ab743ce)));
      auVar97 = ZEXT1664(CONCAT412(0x39506967,CONCAT48(0x39506967,0x3950696739506967)));
      auVar453 = ZEXT1664(CONCAT412(0x3c088908,CONCAT48(0x3c088908,0x3c0889083c088908)));
      for (; uVar73 != uVar47; uVar73 = uVar73 + 1) {
        local_188 = (_func_int ***)
                    ((long)(_func_int ***)local_b8.data +
                    local_b8.cstep * uVar73 * local_b8.elemsize);
        iVar42 = bottom_blob->w;
        iVar43 = bottom_blob->h;
        uVar48 = 0;
        uVar74 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar74 = uVar48;
        }
        uVar39 = local_b8.w;
        if (local_b8.w < 1) {
          uVar39 = 0;
        }
        uVar57 = local_b8.h;
        if (local_b8.h < 1) {
          uVar57 = 0;
        }
        while (uVar60 = (uint)uVar48, uVar60 != uVar57) {
          iVar44 = (1 - uVar8) * iVar59;
          for (uVar40 = 0; uVar40 != uVar39; uVar40 = uVar40 + 1) {
            if (lVar49 == 0) {
              auVar107 = ZEXT816(0) << 0x40;
            }
            else {
              auVar107 = *(undefined1 (*) [16])(lVar49 + uVar73 * 0x10);
            }
            auVar461 = ZEXT1664(auVar107);
            pvVar67 = bottom_blob->data;
            lVar71 = (long)(this->weight_data_tm).data +
                     (this->weight_data_tm).cstep * uVar73 * (this->weight_data_tm).elemsize + 0x30;
            for (uVar48 = 0; uVar48 != uVar74; uVar48 = uVar48 + 1) {
              lVar72 = lVar71;
              for (uVar66 = 0; uVar66 != uVar55; uVar66 = uVar66 + 1) {
                iVar36 = (((int)uVar66 - uVar10) + 1) * iVar7 + uVar60;
                if (((-1 < iVar36) && (iVar37 = iVar36 / iVar64, iVar36 % iVar64 == 0)) &&
                   (iVar37 < iVar43)) {
                  lVar34 = (long)iVar37 * (long)bottom_blob->w * bottom_blob->elemsize +
                           bottom_blob->cstep * bottom_blob->elemsize * uVar48;
                  iVar36 = iVar44;
                  for (lVar62 = 0; uVar65 * 0x40 != lVar62; lVar62 = lVar62 + 0x40) {
                    if (((-1 < iVar36) && (iVar37 = iVar36 / iVar58, iVar36 % iVar58 == 0)) &&
                       (iVar37 < iVar42)) {
                      lVar46 = (long)(iVar37 << 2);
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34);
                      auVar114._4_4_ = uVar1;
                      auVar114._0_4_ = uVar1;
                      auVar114._8_4_ = uVar1;
                      auVar114._12_4_ = uVar1;
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34 + 4);
                      auVar186._4_4_ = uVar1;
                      auVar186._0_4_ = uVar1;
                      auVar186._8_4_ = uVar1;
                      auVar186._12_4_ = uVar1;
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34 + 8);
                      auVar289._4_4_ = uVar1;
                      auVar289._0_4_ = uVar1;
                      auVar289._8_4_ = uVar1;
                      auVar289._12_4_ = uVar1;
                      uVar1 = *(undefined4 *)((long)pvVar67 + lVar46 * 4 + lVar34 + 0xc);
                      auVar383._4_4_ = uVar1;
                      auVar383._0_4_ = uVar1;
                      auVar383._8_4_ = uVar1;
                      auVar383._12_4_ = uVar1;
                      auVar107 = vfmadd231ps_fma(auVar461._0_16_,auVar114,
                                                 *(undefined1 (*) [16])(lVar72 + -0x30 + lVar62));
                      auVar107 = vfmadd231ps_fma(auVar107,auVar186,
                                                 *(undefined1 (*) [16])(lVar72 + -0x20 + lVar62));
                      auVar107 = vfmadd231ps_fma(auVar107,auVar289,
                                                 *(undefined1 (*) [16])(lVar72 + -0x10 + lVar62));
                      auVar107 = vfmadd231ps_fma(auVar107,auVar383,
                                                 *(undefined1 (*) [16])(lVar72 + lVar62));
                      auVar461 = ZEXT1664(auVar107);
                    }
                    iVar36 = iVar36 + iVar59;
                  }
                }
                lVar72 = lVar72 + (long)(int)uVar8 * 0x40;
              }
              lVar71 = lVar71 + (long)(int)(uVar8 * uVar10 * 0x10) * 4;
            }
            auVar107 = auVar461._0_16_;
            auVar122 = auVar107;
            if (iVar69 - 1U < 6) {
              auVar116 = auVar164._0_16_;
              auVar122 = vmaxps_avx(auVar107,auVar116);
              auVar407 = auVar325._0_16_;
              auVar380 = auVar370._0_16_;
              auVar248 = auVar97._0_16_;
              auVar270 = auVar453._0_16_;
              auVar100 = auVar406._0_16_;
              auVar249 = auVar393._0_16_;
              auVar99 = auVar377._0_16_;
              fVar76 = auVar325._0_4_;
              fVar75 = auVar325._4_4_;
              fVar2 = auVar325._8_4_;
              fVar246 = auVar325._12_4_;
              switch(iVar69) {
              case 2:
                auVar107 = vminps_avx(auVar107,auVar116);
                uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var45);
                auVar384._4_4_ = uVar1;
                auVar384._0_4_ = uVar1;
                auVar384._8_4_ = uVar1;
                auVar384._12_4_ = uVar1;
                auVar122 = vfmadd231ps_fma(auVar122,auVar107,auVar384);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var45);
                auVar118._4_4_ = uVar1;
                auVar118._0_4_ = uVar1;
                auVar118._8_4_ = uVar1;
                auVar118._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var45))[1];
                auVar386._4_4_ = uVar1;
                auVar386._0_4_ = uVar1;
                auVar386._8_4_ = uVar1;
                auVar386._12_4_ = uVar1;
                auVar107 = vmaxps_avx(auVar107,auVar118);
                auVar122 = vminps_avx(auVar386,auVar107);
                break;
              case 4:
                auVar119._0_8_ = auVar461._0_8_ ^ 0x8000000080000000;
                auVar119._8_4_ = -auVar461._8_4_;
                auVar119._12_4_ = -auVar461._12_4_;
                auVar84._8_4_ = 0x42b0c0a5;
                auVar84._0_8_ = 0x42b0c0a542b0c0a5;
                auVar84._12_4_ = 0x42b0c0a5;
                auVar107 = vminps_avx(auVar119,auVar84);
                auVar99 = vmaxps_avx(auVar99,auVar107);
                auVar107 = vfmadd213ps_fma(auVar249,auVar99,auVar327);
                auVar482._0_4_ = (int)auVar107._0_4_;
                auVar482._4_4_ = (int)auVar107._4_4_;
                auVar482._8_4_ = (int)auVar107._8_4_;
                auVar482._12_4_ = (int)auVar107._12_4_;
                auVar116 = vcvtdq2ps_avx(auVar482);
                auVar107 = vcmpps_avx(auVar107,auVar116,1);
                auVar107 = vandps_avx(auVar107,auVar407);
                auVar107 = vsubps_avx(auVar116,auVar107);
                auVar380 = vfmsub231ps_fma(auVar99,auVar107,auVar380);
                auVar191._8_4_ = 0x395e8083;
                auVar191._0_8_ = 0x395e8083395e8083;
                auVar191._12_4_ = 0x395e8083;
                auVar380 = vfmsub231ps_fma(auVar380,auVar107,auVar191);
                auVar483._0_4_ = auVar380._0_4_ * auVar380._0_4_;
                auVar483._4_4_ = auVar380._4_4_ * auVar380._4_4_;
                auVar483._8_4_ = auVar380._8_4_ * auVar380._8_4_;
                auVar483._12_4_ = auVar380._12_4_ * auVar380._12_4_;
                auVar248 = vfmadd213ps_fma(auVar248,auVar380,auVar100);
                auVar248 = vfmadd213ps_fma(auVar248,auVar380,auVar270);
                auVar192._8_4_ = 0x3d2aa9c1;
                auVar192._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar192._12_4_ = 0x3d2aa9c1;
                auVar248 = vfmadd213ps_fma(auVar248,auVar380,auVar192);
                auVar85._8_4_ = 0x3e2aaaaa;
                auVar85._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar85._12_4_ = 0x3e2aaaaa;
                auVar248 = vfmadd213ps_fma(auVar248,auVar380,auVar85);
                auVar248 = vfmadd213ps_fma(auVar248,auVar380,auVar327);
                auVar248 = vfmadd213ps_fma(auVar248,auVar483,auVar380);
                auVar421._0_4_ = auVar248._0_4_ + fVar76;
                auVar421._4_4_ = auVar248._4_4_ + fVar75;
                auVar421._8_4_ = auVar248._8_4_ + fVar2;
                auVar421._12_4_ = auVar248._12_4_ + fVar246;
                auVar120._0_4_ = (int)auVar107._0_4_;
                auVar120._4_4_ = (int)auVar107._4_4_;
                auVar120._8_4_ = (int)auVar107._8_4_;
                auVar120._12_4_ = (int)auVar107._12_4_;
                auVar107 = vpslld_avx(auVar120,0x17);
                auVar107 = vpaddd_avx(auVar107,auVar407);
                auVar248 = vfmadd213ps_fma(auVar107,auVar421,auVar407);
                auVar107 = vrcpps_avx(auVar248);
                auVar248 = vfmsub213ps_fma(auVar248,auVar107,auVar407);
                auVar122 = vfnmadd132ps_fma(auVar248,auVar107,auVar107);
                break;
              case 5:
                auVar290._8_4_ = 0x42b0c0a5;
                auVar290._0_8_ = 0x42b0c0a542b0c0a5;
                auVar290._12_4_ = 0x42b0c0a5;
                auVar116 = vminps_avx(auVar107,auVar290);
                auVar408 = vmaxps_avx(auVar99,auVar116);
                auVar116 = vfmadd213ps_fma(auVar249,auVar408,auVar327);
                auVar417._0_4_ = (int)auVar116._0_4_;
                auVar417._4_4_ = (int)auVar116._4_4_;
                auVar417._8_4_ = (int)auVar116._8_4_;
                auVar417._12_4_ = (int)auVar116._12_4_;
                auVar385 = vcvtdq2ps_avx(auVar417);
                auVar116 = vcmpps_avx(auVar116,auVar385,1);
                auVar116 = vandps_avx(auVar116,auVar407);
                auVar116 = vsubps_avx(auVar385,auVar116);
                auVar385 = vfmsub231ps_fma(auVar408,auVar116,auVar380);
                auVar81._8_4_ = 0xb95e8083;
                auVar81._0_8_ = 0xb95e8083b95e8083;
                auVar81._12_4_ = 0xb95e8083;
                auVar408 = vfnmsub231ps_fma(auVar385,auVar116,auVar81);
                auVar418._0_4_ = auVar408._0_4_ * auVar408._0_4_;
                auVar418._4_4_ = auVar408._4_4_ * auVar408._4_4_;
                auVar418._8_4_ = auVar408._8_4_ * auVar408._8_4_;
                auVar418._12_4_ = auVar408._12_4_ * auVar408._12_4_;
                auVar385 = vfmadd213ps_fma(auVar248,auVar408,auVar100);
                auVar385 = vfmadd213ps_fma(auVar385,auVar408,auVar270);
                auVar360._8_4_ = 0x3d2aa9c1;
                auVar360._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar360._12_4_ = 0x3d2aa9c1;
                auVar385 = vfmadd213ps_fma(auVar385,auVar408,auVar360);
                auVar361._8_4_ = 0x3e2aaaaa;
                auVar361._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar361._12_4_ = 0x3e2aaaaa;
                auVar385 = vfmadd213ps_fma(auVar385,auVar408,auVar361);
                auVar385 = vfmadd213ps_fma(auVar385,auVar408,auVar327);
                auVar385 = vfmadd213ps_fma(auVar385,auVar418,auVar408);
                auVar187._0_4_ = auVar385._0_4_ + fVar76;
                auVar187._4_4_ = auVar385._4_4_ + fVar75;
                auVar187._8_4_ = auVar385._8_4_ + fVar2;
                auVar187._12_4_ = auVar385._12_4_ + fVar246;
                auVar115._0_4_ = (int)auVar116._0_4_;
                auVar115._4_4_ = (int)auVar116._4_4_;
                auVar115._8_4_ = (int)auVar116._8_4_;
                auVar115._12_4_ = (int)auVar116._12_4_;
                auVar116 = vpslld_avx(auVar115,0x17);
                auVar116 = vpaddd_avx(auVar116,auVar407);
                auVar165 = vfmadd213ps_fma(auVar116,auVar187,auVar407);
                auVar188._8_4_ = 0x800000;
                auVar188._0_8_ = 0x80000000800000;
                auVar188._12_4_ = 0x800000;
                auVar116 = vmaxps_avx(auVar165,auVar188);
                auVar385 = vpsrld_avx(auVar116,0x17);
                auVar362._8_4_ = 0xffffff82;
                auVar362._0_8_ = 0xffffff82ffffff82;
                auVar362._12_4_ = 0xffffff82;
                auVar385 = vpaddd_avx(auVar385,auVar362);
                auVar363._8_4_ = 0x807fffff;
                auVar363._0_8_ = 0x807fffff807fffff;
                auVar363._12_4_ = 0x807fffff;
                auVar116 = vandps_avx(auVar116,auVar363);
                auVar77 = vorps_avx(auVar116,auVar327);
                auVar408 = vcvtdq2ps_avx(auVar385);
                auVar364._8_4_ = 0x3f3504f3;
                auVar364._0_8_ = 0x3f3504f33f3504f3;
                auVar364._12_4_ = 0x3f3504f3;
                auVar385 = vcmpps_avx(auVar77,auVar364,1);
                auVar116 = vandps_avx(auVar385,auVar77);
                auVar189._0_4_ = auVar116._0_4_ + auVar77._0_4_ + -1.0;
                auVar189._4_4_ = auVar116._4_4_ + auVar77._4_4_ + -1.0;
                auVar189._8_4_ = auVar116._8_4_ + auVar77._8_4_ + -1.0;
                auVar189._12_4_ = auVar116._12_4_ + auVar77._12_4_ + -1.0;
                auVar116 = vandps_avx(auVar385,auVar407);
                auVar385 = vsubps_avx(auVar408,auVar116);
                auVar396._0_4_ = auVar189._0_4_ * auVar189._0_4_;
                auVar396._4_4_ = auVar189._4_4_ * auVar189._4_4_;
                auVar396._8_4_ = auVar189._8_4_ * auVar189._8_4_;
                auVar396._12_4_ = auVar189._12_4_ * auVar189._12_4_;
                auVar419._8_4_ = 0x3d9021bb;
                auVar419._0_8_ = 0x3d9021bb3d9021bb;
                auVar419._12_4_ = 0x3d9021bb;
                auVar291._8_4_ = 0xbdebd1b8;
                auVar291._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar291._12_4_ = 0xbdebd1b8;
                auVar116 = vfmadd213ps_fma(auVar419,auVar189,auVar291);
                auVar292._8_4_ = 0x3def251a;
                auVar292._0_8_ = 0x3def251a3def251a;
                auVar292._12_4_ = 0x3def251a;
                auVar116 = vfmadd213ps_fma(auVar116,auVar189,auVar292);
                auVar293._8_4_ = 0xbdfe5d4f;
                auVar293._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar293._12_4_ = 0xbdfe5d4f;
                auVar116 = vfmadd213ps_fma(auVar116,auVar189,auVar293);
                auVar294._8_4_ = 0x3e11e9bf;
                auVar294._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar294._12_4_ = 0x3e11e9bf;
                auVar116 = vfmadd213ps_fma(auVar116,auVar189,auVar294);
                auVar295._8_4_ = 0xbe2aae50;
                auVar295._0_8_ = 0xbe2aae50be2aae50;
                auVar295._12_4_ = 0xbe2aae50;
                auVar116 = vfmadd213ps_fma(auVar116,auVar189,auVar295);
                auVar296._8_4_ = 0x3e4cceac;
                auVar296._0_8_ = 0x3e4cceac3e4cceac;
                auVar296._12_4_ = 0x3e4cceac;
                auVar116 = vfmadd213ps_fma(auVar116,auVar189,auVar296);
                auVar297._8_4_ = 0xbe7ffffc;
                auVar297._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar297._12_4_ = 0xbe7ffffc;
                auVar116 = vfmadd213ps_fma(auVar116,auVar189,auVar297);
                auVar298._8_4_ = 0x3eaaaaaa;
                auVar298._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar298._12_4_ = 0x3eaaaaaa;
                auVar116 = vfmadd213ps_fma(auVar116,auVar189,auVar298);
                auVar299._0_4_ = auVar116._0_4_ * auVar396._0_4_ * auVar189._0_4_;
                auVar299._4_4_ = auVar116._4_4_ * auVar396._4_4_ * auVar189._4_4_;
                auVar299._8_4_ = auVar116._8_4_ * auVar396._8_4_ * auVar189._8_4_;
                auVar299._12_4_ = auVar116._12_4_ * auVar396._12_4_ * auVar189._12_4_;
                auVar420._8_4_ = 0xb95e8083;
                auVar420._0_8_ = 0xb95e8083b95e8083;
                auVar420._12_4_ = 0xb95e8083;
                auVar116 = vfmadd231ps_fma(auVar299,auVar385,auVar420);
                auVar408 = vfmsub231ps_fma(auVar116,auVar327,auVar396);
                auVar377 = ZEXT1664(auVar99);
                auVar393 = ZEXT1664(auVar249);
                auVar406 = ZEXT1664(auVar100);
                auVar453 = ZEXT1664(auVar270);
                auVar97 = ZEXT1664(auVar248);
                auVar370 = ZEXT1664(auVar380);
                auVar31._12_4_ = 0;
                auVar31._0_12_ = ZEXT412(0);
                auVar164 = ZEXT1264(ZEXT412(0)) << 0x20;
                auVar116 = vcmpps_avx(auVar165,auVar31 << 0x20,2);
                auVar408 = vsubps_avx(auVar408,auVar189);
                auVar385 = vfnmadd231ps_fma(auVar408,auVar380,auVar385);
                auVar190._0_4_ = auVar385._0_4_ + auVar385._0_4_;
                auVar190._4_4_ = auVar385._4_4_ + auVar385._4_4_;
                auVar190._8_4_ = auVar385._8_4_ + auVar385._8_4_;
                auVar190._12_4_ = auVar385._12_4_ + auVar385._12_4_;
                auVar300._8_4_ = 0x7fffffff;
                auVar300._0_8_ = 0x7fffffff7fffffff;
                auVar300._12_4_ = 0x7fffffff;
                auVar116 = vblendvps_avx(auVar190,auVar300,auVar116);
                auVar116 = vminps_avx(auVar290,auVar116);
                auVar385 = vmaxps_avx(auVar99,auVar116);
                auVar116 = vfmadd213ps_fma(auVar249,auVar385,auVar327);
                auVar301._0_4_ = (int)auVar116._0_4_;
                auVar301._4_4_ = (int)auVar116._4_4_;
                auVar301._8_4_ = (int)auVar116._8_4_;
                auVar301._12_4_ = (int)auVar116._12_4_;
                auVar99 = vcvtdq2ps_avx(auVar301);
                auVar116 = vcmpps_avx(auVar116,auVar99,1);
                auVar116 = vandps_avx(auVar116,auVar407);
                auVar116 = vsubps_avx(auVar99,auVar116);
                auVar380 = vfmsub231ps_fma(auVar385,auVar116,auVar380);
                auVar302._8_4_ = 0xb95e8083;
                auVar302._0_8_ = 0xb95e8083b95e8083;
                auVar302._12_4_ = 0xb95e8083;
                auVar380 = vfnmsub231ps_fma(auVar380,auVar116,auVar302);
                auVar303._0_4_ = auVar380._0_4_ * auVar380._0_4_;
                auVar303._4_4_ = auVar380._4_4_ * auVar380._4_4_;
                auVar303._8_4_ = auVar380._8_4_ * auVar380._8_4_;
                auVar303._12_4_ = auVar380._12_4_ * auVar380._12_4_;
                auVar248 = vfmadd213ps_fma(auVar248,auVar380,auVar100);
                auVar248 = vfmadd213ps_fma(auVar248,auVar380,auVar270);
                auVar365._8_4_ = 0x3d2aa9c1;
                auVar365._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar365._12_4_ = 0x3d2aa9c1;
                auVar248 = vfmadd213ps_fma(auVar248,auVar380,auVar365);
                auVar325 = ZEXT1664(auVar407);
                auVar82._8_4_ = 0x3e2aaaaa;
                auVar82._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar82._12_4_ = 0x3e2aaaaa;
                auVar248 = vfmadd213ps_fma(auVar248,auVar380,auVar82);
                auVar248 = vfmadd213ps_fma(auVar248,auVar380,auVar327);
                auVar248 = vfmadd213ps_fma(auVar248,auVar303,auVar380);
                auVar304._0_4_ = auVar248._0_4_ + fVar76;
                auVar304._4_4_ = auVar248._4_4_ + fVar75;
                auVar304._8_4_ = auVar248._8_4_ + fVar2;
                auVar304._12_4_ = auVar248._12_4_ + fVar246;
                auVar117._0_4_ = (int)auVar116._0_4_;
                auVar117._4_4_ = (int)auVar116._4_4_;
                auVar117._8_4_ = (int)auVar116._8_4_;
                auVar117._12_4_ = (int)auVar116._12_4_;
                auVar248 = vpslld_avx(auVar117,0x17);
                auVar248 = vpaddd_avx(auVar248,auVar407);
                auVar407 = vfmadd213ps_fma(auVar248,auVar304,auVar407);
                auVar248 = vrcpps_avx(auVar407);
                auVar305._0_4_ = auVar248._0_4_ + auVar248._0_4_;
                auVar305._4_4_ = auVar248._4_4_ + auVar248._4_4_;
                auVar305._8_4_ = auVar248._8_4_ + auVar248._8_4_;
                auVar305._12_4_ = auVar248._12_4_ + auVar248._12_4_;
                auVar83._8_4_ = 0x40000000;
                auVar83._0_8_ = 0x4000000040000000;
                auVar83._12_4_ = 0x40000000;
                auVar407 = vfmsub213ps_fma(auVar407,auVar305,auVar83);
                auVar248 = vfnmadd213ps_fma(auVar407,auVar248,auVar305);
                auVar122 = vfmsub213ps_fma(auVar248,auVar107,auVar107);
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var45);
                auVar121._4_4_ = uVar1;
                auVar121._0_4_ = uVar1;
                auVar121._8_4_ = uVar1;
                auVar121._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var45))[1];
                auVar193._4_4_ = uVar1;
                auVar193._0_4_ = uVar1;
                auVar193._8_4_ = uVar1;
                auVar193._12_4_ = uVar1;
                auVar107 = vfmadd231ps_fma(auVar193,auVar107,auVar121);
                auVar107 = vmaxps_avx(auVar116,auVar107);
                auVar107 = vminps_avx(auVar107,auVar407);
                auVar122._0_4_ = auVar461._0_4_ * auVar107._0_4_;
                auVar122._4_4_ = auVar461._4_4_ * auVar107._4_4_;
                auVar122._8_4_ = auVar461._8_4_ * auVar107._8_4_;
                auVar122._12_4_ = auVar461._12_4_ * auVar107._12_4_;
              }
            }
            *(undefined1 (*) [16])local_188 = auVar122;
            local_188 = local_188 + 2;
            iVar44 = iVar44 + 1;
          }
          uVar48 = (ulong)(uVar60 + 1);
        }
      }
    }
    if ((iVar61 == 1) && (uVar51 == 4)) {
      p_Var45 = local_68[-3];
      uVar8 = *(uint *)(&this->field_0xd4 + (long)p_Var45);
      uVar10 = *(uint *)(&this->field_0xd8 + (long)p_Var45);
      iVar59 = *(int *)(&this->field_0xdc + (long)p_Var45);
      iVar7 = *(int *)(&this->field_0xe0 + (long)p_Var45);
      iVar58 = *(int *)(&this->field_0xe4 + (long)p_Var45);
      iVar64 = *(int *)(&this->field_0xe8 + (long)p_Var45);
      iVar69 = *(int *)(&this->field_0x114 + (long)p_Var45);
      lVar49 = *(long *)(&this->field_0x1a8 + (long)p_Var45);
      uVar73 = 0;
      uVar65 = 0;
      if (0 < (int)uVar8) {
        uVar65 = (ulong)uVar8;
      }
      uVar55 = 0;
      if (0 < (int)uVar10) {
        uVar55 = (ulong)uVar10;
      }
      uVar47 = (ulong)(uint)local_b8.c;
      if (local_b8.c < 1) {
        uVar47 = uVar73;
      }
      auVar325 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar97 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      auVar457._8_4_ = 0xc2b0c0a5;
      auVar457._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar457._12_4_ = 0xc2b0c0a5;
      auVar470._8_4_ = 0x3ab743ce;
      auVar470._0_8_ = 0x3ab743ce3ab743ce;
      auVar470._12_4_ = 0x3ab743ce;
      for (; uVar73 != uVar47; uVar73 = uVar73 + 1) {
        local_188 = (_func_int ***)
                    ((long)(_func_int ***)local_b8.data +
                    local_b8.cstep * uVar73 * local_b8.elemsize);
        iVar42 = bottom_blob->w;
        iVar43 = bottom_blob->h;
        uVar48 = 0;
        uVar74 = (ulong)(uint)bottom_blob->c;
        if (bottom_blob->c < 1) {
          uVar74 = uVar48;
        }
        uVar39 = local_b8.w;
        if (local_b8.w < 1) {
          uVar39 = 0;
        }
        uVar57 = local_b8.h;
        if (local_b8.h < 1) {
          uVar57 = 0;
        }
        while (uVar60 = (uint)uVar48, uVar60 != uVar57) {
          iVar44 = (1 - uVar8) * iVar59;
          for (uVar40 = 0; uVar40 != uVar39; uVar40 = uVar40 + 1) {
            if (lVar49 == 0) {
              auVar107 = ZEXT816(0) << 0x40;
            }
            else {
              auVar107 = *(undefined1 (*) [16])(lVar49 + uVar73 * 0x10);
            }
            auVar370 = ZEXT1664(auVar107);
            pvVar67 = (void *)((this->weight_data_tm).cstep * uVar73 *
                               (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
            for (uVar48 = 0; uVar48 != uVar74; uVar48 = uVar48 + 1) {
              pvVar68 = pvVar67;
              for (uVar66 = 0; uVar66 != uVar55; uVar66 = uVar66 + 1) {
                iVar36 = (((int)uVar66 - uVar10) + 1) * iVar7 + uVar60;
                if (((-1 < iVar36) && (iVar37 = iVar36 / iVar64, iVar36 % iVar64 == 0)) &&
                   (iVar37 < iVar43)) {
                  iVar36 = iVar44;
                  for (lVar71 = 0; uVar65 * 0x10 != lVar71; lVar71 = lVar71 + 0x10) {
                    if (((-1 < iVar36) && (iVar41 = iVar36 / iVar58, iVar36 % iVar58 == 0)) &&
                       (iVar41 < iVar42)) {
                      uVar1 = *(undefined4 *)
                               ((long)bottom_blob->data +
                               (long)iVar41 * 4 +
                               (long)iVar37 * (long)bottom_blob->w * bottom_blob->elemsize +
                               bottom_blob->cstep * bottom_blob->elemsize * uVar48);
                      auVar123._4_4_ = uVar1;
                      auVar123._0_4_ = uVar1;
                      auVar123._8_4_ = uVar1;
                      auVar123._12_4_ = uVar1;
                      auVar107 = vfmadd231ps_fma(auVar370._0_16_,auVar123,
                                                 *(undefined1 (*) [16])((long)pvVar68 + lVar71));
                      auVar370 = ZEXT1664(auVar107);
                    }
                    iVar36 = iVar36 + iVar59;
                  }
                }
                pvVar68 = (void *)((long)pvVar68 + (long)(int)uVar8 * 0x10);
              }
              pvVar67 = (void *)((long)pvVar67 + (long)(int)(uVar8 * uVar10 * 4) * 4);
            }
            auVar107 = auVar370._0_16_;
            auVar130 = auVar107;
            if (iVar69 - 1U < 6) {
              auVar130 = vmaxps_avx(auVar107,_DAT_004c4ff0);
              auVar248 = auVar97._0_16_;
              auVar407 = auVar325._0_16_;
              switch(iVar69) {
              case 2:
                auVar107 = vminps_avx(auVar107,_DAT_004c4ff0);
                uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var45);
                auVar387._4_4_ = uVar1;
                auVar387._0_4_ = uVar1;
                auVar387._8_4_ = uVar1;
                auVar387._12_4_ = uVar1;
                auVar130 = vfmadd231ps_fma(auVar130,auVar107,auVar387);
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var45);
                auVar126._4_4_ = uVar1;
                auVar126._0_4_ = uVar1;
                auVar126._8_4_ = uVar1;
                auVar126._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var45))[1];
                auVar389._4_4_ = uVar1;
                auVar389._0_4_ = uVar1;
                auVar389._8_4_ = uVar1;
                auVar389._12_4_ = uVar1;
                auVar107 = vmaxps_avx(auVar107,auVar126);
                auVar130 = vminps_avx(auVar389,auVar107);
                break;
              case 4:
                auVar127._0_8_ = auVar370._0_8_ ^ 0x8000000080000000;
                auVar127._8_4_ = -auVar370._8_4_;
                auVar127._12_4_ = -auVar370._12_4_;
                auVar199._8_4_ = 0x42b0c0a5;
                auVar199._0_8_ = 0x42b0c0a542b0c0a5;
                auVar199._12_4_ = 0x42b0c0a5;
                auVar107 = vminps_avx(auVar127,auVar199);
                auVar200._8_4_ = 0xc2b0c0a5;
                auVar200._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar200._12_4_ = 0xc2b0c0a5;
                auVar116 = vmaxps_avx(auVar107,auVar200);
                auVar390._8_4_ = 0x3fb8aa3b;
                auVar390._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar390._12_4_ = 0x3fb8aa3b;
                auVar107 = vfmadd213ps_fma(auVar390,auVar116,auVar407);
                auVar484._0_4_ = (int)auVar107._0_4_;
                auVar484._4_4_ = (int)auVar107._4_4_;
                auVar484._8_4_ = (int)auVar107._8_4_;
                auVar484._12_4_ = (int)auVar107._12_4_;
                auVar380 = vcvtdq2ps_avx(auVar484);
                auVar107 = vcmpps_avx(auVar107,auVar380,1);
                auVar107 = vandps_avx(auVar107,auVar248);
                auVar107 = vsubps_avx(auVar380,auVar107);
                auVar201._8_4_ = 0x3f318000;
                auVar201._0_8_ = 0x3f3180003f318000;
                auVar201._12_4_ = 0x3f318000;
                auVar380 = vfmsub231ps_fma(auVar116,auVar107,auVar201);
                auVar202._8_4_ = 0x395e8083;
                auVar202._0_8_ = 0x395e8083395e8083;
                auVar202._12_4_ = 0x395e8083;
                auVar116 = vfmsub231ps_fma(auVar380,auVar107,auVar202);
                auVar485._0_4_ = auVar116._0_4_ * auVar116._0_4_;
                auVar485._4_4_ = auVar116._4_4_ * auVar116._4_4_;
                auVar485._8_4_ = auVar116._8_4_ * auVar116._8_4_;
                auVar485._12_4_ = auVar116._12_4_ * auVar116._12_4_;
                auVar426._8_4_ = 0x39506967;
                auVar426._0_8_ = 0x3950696739506967;
                auVar426._12_4_ = 0x39506967;
                auVar203._8_4_ = 0x3ab743ce;
                auVar203._0_8_ = 0x3ab743ce3ab743ce;
                auVar203._12_4_ = 0x3ab743ce;
                auVar380 = vfmadd213ps_fma(auVar426,auVar116,auVar203);
                auVar204._8_4_ = 0x3c088908;
                auVar204._0_8_ = 0x3c0889083c088908;
                auVar204._12_4_ = 0x3c088908;
                auVar380 = vfmadd213ps_fma(auVar380,auVar116,auVar204);
                auVar205._8_4_ = 0x3d2aa9c1;
                auVar205._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar205._12_4_ = 0x3d2aa9c1;
                auVar380 = vfmadd213ps_fma(auVar380,auVar116,auVar205);
                auVar206._8_4_ = 0x3e2aaaaa;
                auVar206._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar206._12_4_ = 0x3e2aaaaa;
                auVar380 = vfmadd213ps_fma(auVar380,auVar116,auVar206);
                auVar407 = vfmadd213ps_fma(auVar380,auVar116,auVar407);
                auVar407 = vfmadd213ps_fma(auVar407,auVar485,auVar116);
                auVar427._0_4_ = auVar407._0_4_ + auVar97._0_4_;
                auVar427._4_4_ = auVar407._4_4_ + auVar97._4_4_;
                auVar427._8_4_ = auVar407._8_4_ + auVar97._8_4_;
                auVar427._12_4_ = auVar407._12_4_ + auVar97._12_4_;
                auVar128._0_4_ = (int)auVar107._0_4_;
                auVar128._4_4_ = (int)auVar107._4_4_;
                auVar128._8_4_ = (int)auVar107._8_4_;
                auVar128._12_4_ = (int)auVar107._12_4_;
                auVar107 = vpslld_avx(auVar128,0x17);
                auVar107 = vpaddd_avx(auVar107,auVar248);
                auVar407 = vfmadd213ps_fma(auVar107,auVar427,auVar248);
                auVar107 = vrcpps_avx(auVar407);
                auVar248 = vfmsub213ps_fma(auVar407,auVar107,auVar248);
                auVar130 = vfnmadd132ps_fma(auVar248,auVar107,auVar107);
                break;
              case 5:
                auVar439._8_4_ = 0x42b0c0a5;
                auVar439._0_8_ = 0x42b0c0a542b0c0a5;
                auVar439._12_4_ = 0x42b0c0a5;
                auVar380 = vminps_avx(auVar107,auVar439);
                auVar99 = vmaxps_avx(auVar457,auVar380);
                auVar463._8_4_ = 0x3fb8aa3b;
                auVar463._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar463._12_4_ = 0x3fb8aa3b;
                auVar380 = vfmadd213ps_fma(auVar463,auVar99,auVar407);
                auVar422._0_4_ = (int)auVar380._0_4_;
                auVar422._4_4_ = (int)auVar380._4_4_;
                auVar422._8_4_ = (int)auVar380._8_4_;
                auVar422._12_4_ = (int)auVar380._12_4_;
                auVar116 = vcvtdq2ps_avx(auVar422);
                auVar380 = vcmpps_avx(auVar380,auVar116,1);
                auVar380 = vandps_avx(auVar380,auVar248);
                auVar380 = vsubps_avx(auVar116,auVar380);
                auVar86._8_4_ = 0x3f318000;
                auVar86._0_8_ = 0x3f3180003f318000;
                auVar86._12_4_ = 0x3f318000;
                auVar116 = vfmsub231ps_fma(auVar99,auVar380,auVar86);
                auVar194._8_4_ = 0xb95e8083;
                auVar194._0_8_ = 0xb95e8083b95e8083;
                auVar194._12_4_ = 0xb95e8083;
                auVar99 = vfnmsub231ps_fma(auVar116,auVar380,auVar194);
                auVar423._0_4_ = auVar99._0_4_ * auVar99._0_4_;
                auVar423._4_4_ = auVar99._4_4_ * auVar99._4_4_;
                auVar423._8_4_ = auVar99._8_4_ * auVar99._8_4_;
                auVar423._12_4_ = auVar99._12_4_ * auVar99._12_4_;
                auVar440._8_4_ = 0x39506967;
                auVar440._0_8_ = 0x3950696739506967;
                auVar440._12_4_ = 0x39506967;
                auVar116 = vfmadd213ps_fma(auVar440,auVar99,auVar470);
                auVar251._8_4_ = 0x3c088908;
                auVar251._0_8_ = 0x3c0889083c088908;
                auVar251._12_4_ = 0x3c088908;
                auVar116 = vfmadd213ps_fma(auVar116,auVar99,auVar251);
                auVar366._8_4_ = 0x3d2aa9c1;
                auVar366._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar366._12_4_ = 0x3d2aa9c1;
                auVar116 = vfmadd213ps_fma(auVar116,auVar99,auVar366);
                auVar306._8_4_ = 0x3e2aaaaa;
                auVar306._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar306._12_4_ = 0x3e2aaaaa;
                auVar116 = vfmadd213ps_fma(auVar116,auVar99,auVar306);
                auVar116 = vfmadd213ps_fma(auVar116,auVar99,auVar407);
                auVar116 = vfmadd213ps_fma(auVar116,auVar423,auVar99);
                auVar195._0_4_ = auVar116._0_4_ + auVar97._0_4_;
                auVar195._4_4_ = auVar116._4_4_ + auVar97._4_4_;
                auVar195._8_4_ = auVar116._8_4_ + auVar97._8_4_;
                auVar195._12_4_ = auVar116._12_4_ + auVar97._12_4_;
                auVar124._0_4_ = (int)auVar380._0_4_;
                auVar124._4_4_ = (int)auVar380._4_4_;
                auVar124._8_4_ = (int)auVar380._8_4_;
                auVar124._12_4_ = (int)auVar380._12_4_;
                auVar380 = vpslld_avx(auVar124,0x17);
                auVar380 = vpaddd_avx(auVar380,auVar248);
                auVar100 = vfmadd213ps_fma(auVar380,auVar195,auVar248);
                auVar196._8_4_ = 0x800000;
                auVar196._0_8_ = 0x80000000800000;
                auVar196._12_4_ = 0x800000;
                auVar380 = vmaxps_avx(auVar100,auVar196);
                auVar116 = vpsrld_avx(auVar380,0x17);
                auVar307._8_4_ = 0xffffff82;
                auVar307._0_8_ = 0xffffff82ffffff82;
                auVar307._12_4_ = 0xffffff82;
                auVar116 = vpaddd_avx(auVar116,auVar307);
                auVar308._8_4_ = 0x807fffff;
                auVar308._0_8_ = 0x807fffff807fffff;
                auVar308._12_4_ = 0x807fffff;
                auVar380 = vandps_avx(auVar380,auVar308);
                auVar249 = vorps_avx(auVar380,auVar407);
                auVar99 = vcvtdq2ps_avx(auVar116);
                auVar309._8_4_ = 0x3f3504f3;
                auVar309._0_8_ = 0x3f3504f33f3504f3;
                auVar309._12_4_ = 0x3f3504f3;
                auVar116 = vcmpps_avx(auVar249,auVar309,1);
                auVar380 = vandps_avx(auVar116,auVar249);
                auVar197._0_4_ = auVar249._0_4_ + -1.0 + auVar380._0_4_;
                auVar197._4_4_ = auVar249._4_4_ + -1.0 + auVar380._4_4_;
                auVar197._8_4_ = auVar249._8_4_ + -1.0 + auVar380._8_4_;
                auVar197._12_4_ = auVar249._12_4_ + -1.0 + auVar380._12_4_;
                auVar248 = vandps_avx(auVar116,auVar248);
                auVar380 = vsubps_avx(auVar99,auVar248);
                auVar388._0_4_ = auVar197._0_4_ * auVar197._0_4_;
                auVar388._4_4_ = auVar197._4_4_ * auVar197._4_4_;
                auVar388._8_4_ = auVar197._8_4_ * auVar197._8_4_;
                auVar388._12_4_ = auVar197._12_4_ * auVar197._12_4_;
                auVar424._8_4_ = 0x3d9021bb;
                auVar424._0_8_ = 0x3d9021bb3d9021bb;
                auVar424._12_4_ = 0x3d9021bb;
                auVar328._8_4_ = 0xbdebd1b8;
                auVar328._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar328._12_4_ = 0xbdebd1b8;
                auVar248 = vfmadd213ps_fma(auVar424,auVar197,auVar328);
                auVar329._8_4_ = 0x3def251a;
                auVar329._0_8_ = 0x3def251a3def251a;
                auVar329._12_4_ = 0x3def251a;
                auVar248 = vfmadd213ps_fma(auVar248,auVar197,auVar329);
                auVar330._8_4_ = 0xbdfe5d4f;
                auVar330._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar330._12_4_ = 0xbdfe5d4f;
                auVar248 = vfmadd213ps_fma(auVar248,auVar197,auVar330);
                auVar331._8_4_ = 0x3e11e9bf;
                auVar331._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar331._12_4_ = 0x3e11e9bf;
                auVar248 = vfmadd213ps_fma(auVar248,auVar197,auVar331);
                auVar332._8_4_ = 0xbe2aae50;
                auVar332._0_8_ = 0xbe2aae50be2aae50;
                auVar332._12_4_ = 0xbe2aae50;
                auVar248 = vfmadd213ps_fma(auVar248,auVar197,auVar332);
                auVar333._8_4_ = 0x3e4cceac;
                auVar333._0_8_ = 0x3e4cceac3e4cceac;
                auVar333._12_4_ = 0x3e4cceac;
                auVar248 = vfmadd213ps_fma(auVar248,auVar197,auVar333);
                auVar334._8_4_ = 0xbe7ffffc;
                auVar334._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar334._12_4_ = 0xbe7ffffc;
                auVar248 = vfmadd213ps_fma(auVar248,auVar197,auVar334);
                auVar335._8_4_ = 0x3eaaaaaa;
                auVar335._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar335._12_4_ = 0x3eaaaaaa;
                auVar248 = vfmadd213ps_fma(auVar248,auVar197,auVar335);
                auVar397._0_4_ = auVar388._0_4_ * auVar197._0_4_ * auVar248._0_4_;
                auVar397._4_4_ = auVar388._4_4_ * auVar197._4_4_ * auVar248._4_4_;
                auVar397._8_4_ = auVar388._8_4_ * auVar197._8_4_ * auVar248._8_4_;
                auVar397._12_4_ = auVar388._12_4_ * auVar197._12_4_ * auVar248._12_4_;
                auVar425._8_4_ = 0xb95e8083;
                auVar425._0_8_ = 0xb95e8083b95e8083;
                auVar425._12_4_ = 0xb95e8083;
                auVar248 = vfmadd231ps_fma(auVar397,auVar380,auVar425);
                auVar116 = vfmsub231ps_fma(auVar248,auVar407,auVar388);
                auVar248 = vcmpps_avx(auVar100,ZEXT816(0) << 0x20,2);
                auVar116 = vsubps_avx(auVar116,auVar197);
                auVar441._8_4_ = 0x42b0c0a5;
                auVar441._0_8_ = 0x42b0c0a542b0c0a5;
                auVar441._12_4_ = 0x42b0c0a5;
                auVar367._8_4_ = 0x3f800000;
                auVar367._0_8_ = 0x3f8000003f800000;
                auVar367._12_4_ = 0x3f800000;
                auVar380 = vfnmadd231ps_fma(auVar116,auVar86,auVar380);
                auVar198._0_4_ = auVar380._0_4_ + auVar380._0_4_;
                auVar198._4_4_ = auVar380._4_4_ + auVar380._4_4_;
                auVar198._8_4_ = auVar380._8_4_ + auVar380._8_4_;
                auVar198._12_4_ = auVar380._12_4_ + auVar380._12_4_;
                auVar310._8_4_ = 0x7fffffff;
                auVar310._0_8_ = 0x7fffffff7fffffff;
                auVar310._12_4_ = 0x7fffffff;
                auVar248 = vblendvps_avx(auVar198,auVar310,auVar248);
                auVar248 = vminps_avx(auVar441,auVar248);
                auVar116 = vmaxps_avx(auVar457,auVar248);
                auVar248 = vfmadd213ps_fma(auVar463,auVar116,auVar407);
                auVar311._0_4_ = (int)auVar248._0_4_;
                auVar311._4_4_ = (int)auVar248._4_4_;
                auVar311._8_4_ = (int)auVar248._8_4_;
                auVar311._12_4_ = (int)auVar248._12_4_;
                auVar380 = vcvtdq2ps_avx(auVar311);
                auVar248 = vcmpps_avx(auVar248,auVar380,1);
                auVar248 = vandps_avx(auVar248,auVar367);
                auVar248 = vsubps_avx(auVar380,auVar248);
                auVar380 = vfmsub231ps_fma(auVar116,auVar248,auVar86);
                auVar87._8_4_ = 0xb95e8083;
                auVar87._0_8_ = 0xb95e8083b95e8083;
                auVar87._12_4_ = 0xb95e8083;
                auVar116 = vfnmsub231ps_fma(auVar380,auVar248,auVar87);
                auVar312._0_4_ = auVar116._0_4_ * auVar116._0_4_;
                auVar312._4_4_ = auVar116._4_4_ * auVar116._4_4_;
                auVar312._8_4_ = auVar116._8_4_ * auVar116._8_4_;
                auVar312._12_4_ = auVar116._12_4_ * auVar116._12_4_;
                auVar380 = vfmadd213ps_fma(auVar440,auVar116,auVar470);
                auVar380 = vfmadd213ps_fma(auVar380,auVar116,auVar251);
                auVar380 = vfmadd213ps_fma(auVar380,auVar116,auVar366);
                auVar88._8_4_ = 0x3e2aaaaa;
                auVar88._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar88._12_4_ = 0x3e2aaaaa;
                auVar380 = vfmadd213ps_fma(auVar380,auVar116,auVar88);
                auVar325 = ZEXT1664(auVar407);
                auVar407 = vfmadd213ps_fma(auVar380,auVar116,auVar407);
                auVar407 = vfmadd213ps_fma(auVar407,auVar312,auVar116);
                auVar313._0_4_ = auVar407._0_4_ + 1.0;
                auVar313._4_4_ = auVar407._4_4_ + 1.0;
                auVar313._8_4_ = auVar407._8_4_ + 1.0;
                auVar313._12_4_ = auVar407._12_4_ + 1.0;
                auVar125._0_4_ = (int)auVar248._0_4_;
                auVar125._4_4_ = (int)auVar248._4_4_;
                auVar125._8_4_ = (int)auVar248._8_4_;
                auVar125._12_4_ = (int)auVar248._12_4_;
                auVar248 = vpslld_avx(auVar125,0x17);
                auVar248 = vpaddd_avx(auVar248,auVar367);
                auVar97 = ZEXT1664(auVar367);
                auVar407 = vfmadd213ps_fma(auVar248,auVar313,auVar367);
                auVar248 = vrcpps_avx(auVar407);
                auVar314._0_4_ = auVar248._0_4_ + auVar248._0_4_;
                auVar314._4_4_ = auVar248._4_4_ + auVar248._4_4_;
                auVar314._8_4_ = auVar248._8_4_ + auVar248._8_4_;
                auVar314._12_4_ = auVar248._12_4_ + auVar248._12_4_;
                auVar252._8_4_ = 0x40000000;
                auVar252._0_8_ = 0x4000000040000000;
                auVar252._12_4_ = 0x40000000;
                auVar407 = vfmsub213ps_fma(auVar407,auVar314,auVar252);
                auVar248 = vfnmadd213ps_fma(auVar407,auVar248,auVar314);
                auVar130 = vfmsub213ps_fma(auVar248,auVar107,auVar107);
                break;
              case 6:
                uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var45);
                auVar129._4_4_ = uVar1;
                auVar129._0_4_ = uVar1;
                auVar129._8_4_ = uVar1;
                auVar129._12_4_ = uVar1;
                uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var45))[1];
                auVar207._4_4_ = uVar1;
                auVar207._0_4_ = uVar1;
                auVar207._8_4_ = uVar1;
                auVar207._12_4_ = uVar1;
                auVar107 = vfmadd231ps_fma(auVar207,auVar107,auVar129);
                auVar107 = vmaxps_avx(auVar107,_DAT_004c4ff0);
                auVar107 = vminps_avx(auVar107,auVar248);
                auVar130._0_4_ = auVar370._0_4_ * auVar107._0_4_;
                auVar130._4_4_ = auVar370._4_4_ * auVar107._4_4_;
                auVar130._8_4_ = auVar370._8_4_ * auVar107._8_4_;
                auVar130._12_4_ = auVar370._12_4_ * auVar107._12_4_;
              }
            }
            *(undefined1 (*) [16])local_188 = auVar130;
            local_188 = local_188 + 2;
            iVar44 = iVar44 + 1;
          }
          uVar48 = (ulong)(uVar60 + 1);
        }
      }
    }
    if ((iVar61 == 4) && (uVar51 == 1)) {
      p_Var45 = local_68[-3];
      uVar8 = *(uint *)(&this->field_0xd4 + (long)p_Var45);
      uVar10 = *(uint *)(&this->field_0xd8 + (long)p_Var45);
      iVar59 = *(int *)(&this->field_0xdc + (long)p_Var45);
      iVar7 = *(int *)(&this->field_0x114 + (long)p_Var45);
      local_50 = local_b8.elemsize * local_b8.cstep;
      uVar73 = 0;
      uVar65 = 0;
      if (0 < (int)uVar8) {
        uVar65 = (ulong)uVar8;
      }
      uVar55 = 0;
      if (0 < (int)uVar10) {
        uVar55 = (ulong)uVar10;
      }
      uVar47 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar47 = uVar73;
      }
      uVar39 = local_b8.w;
      if (local_b8.w < 1) {
        uVar39 = 0;
      }
      uVar57 = local_b8.h;
      if (local_b8.h < 1) {
        uVar57 = 0;
      }
      local_48 = (ulong)(uint)local_b8.c;
      if (local_b8.c < 1) {
        local_48 = uVar73;
      }
      iVar58 = *(int *)(&this->field_0xe0 + (long)p_Var45);
      iVar64 = *(int *)(&this->field_0xe4 + (long)p_Var45);
      iVar69 = *(int *)(&this->field_0xe8 + (long)p_Var45);
      lVar49 = *(long *)(&this->field_0x1a8 + (long)p_Var45);
      local_58 = (Allocator *)local_b8.data;
      iVar42 = bottom_blob->w;
      iVar43 = bottom_blob->h;
      for (; uVar73 != local_48; uVar73 = uVar73 + 1) {
        ppp_Var56 = (_func_int ***)((long)&local_58->_vptr_Allocator + local_50 * uVar73);
        for (uVar60 = 0; uVar60 != uVar57; uVar60 = uVar60 + 1) {
          pfVar12 = *(float **)(&this->field_0x118 + (long)p_Var45);
          sVar13 = (this->weight_data_tm).cstep;
          sVar14 = (this->weight_data_tm).elemsize;
          pvVar67 = (this->weight_data_tm).data;
          iVar44 = (1 - uVar8) * iVar59;
          for (uVar40 = 0; uVar40 != uVar39; uVar40 = uVar40 + 1) {
            if (lVar49 == 0) {
              fVar76 = 0.0;
            }
            else {
              fVar76 = *(float *)(lVar49 + uVar73 * 4);
            }
            auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
            pvVar68 = (void *)(sVar13 * uVar73 * sVar14 + (long)pvVar67);
            for (uVar74 = 0; uVar74 != uVar47; uVar74 = uVar74 + 1) {
              pvVar70 = pvVar68;
              for (uVar48 = 0; uVar48 != uVar55; uVar48 = uVar48 + 1) {
                iVar36 = (((int)uVar48 - uVar10) + 1) * iVar58 + uVar60;
                if (((-1 < iVar36) && (iVar37 = iVar36 / iVar69, iVar36 % iVar69 == 0)) &&
                   (iVar37 < iVar43)) {
                  iVar36 = iVar44;
                  for (lVar71 = 0; uVar65 * 0x10 != lVar71; lVar71 = lVar71 + 0x10) {
                    if (((-1 < iVar36) && (iVar41 = iVar36 / iVar64, iVar36 % iVar64 == 0)) &&
                       (iVar41 < iVar42)) {
                      auVar107 = vfmadd231ps_fma(auVar97._0_16_,
                                                 *(undefined1 (*) [16])
                                                  ((long)bottom_blob->data +
                                                  (long)(iVar41 << 2) * 4 +
                                                  (long)iVar37 *
                                                  (long)bottom_blob->w * bottom_blob->elemsize +
                                                  bottom_blob->cstep * bottom_blob->elemsize *
                                                  uVar74),*(undefined1 (*) [16])
                                                           ((long)pvVar70 + lVar71));
                      auVar97 = ZEXT1664(auVar107);
                    }
                    iVar36 = iVar36 + iVar59;
                  }
                }
                pvVar70 = (void *)((long)pvVar70 + (long)(int)uVar8 * 0x10);
              }
              pvVar68 = (void *)((long)pvVar68 + (long)(int)(uVar8 * uVar10 * 4) * 4);
            }
            auVar107 = vshufpd_avx(auVar97._0_16_,auVar97._0_16_,1);
            auVar131._0_4_ = auVar107._0_4_ + auVar97._0_4_;
            auVar131._4_4_ = auVar107._4_4_ + auVar97._4_4_;
            auVar131._8_4_ = auVar107._8_4_ + auVar97._8_4_;
            auVar131._12_4_ = auVar107._12_4_ + auVar97._12_4_;
            auVar107 = vmovshdup_avx(auVar131);
            fVar76 = auVar107._0_4_ + fVar76 + auVar131._0_4_;
            auVar107 = ZEXT416((uint)fVar76);
            fVar75 = fVar76;
            if (iVar7 - 1U < 6) {
              switch(iVar7) {
              case 1:
                auVar107 = vmaxss_avx(ZEXT416((uint)fVar76),ZEXT416(0));
                fVar75 = auVar107._0_4_;
                break;
              case 2:
                auVar89._0_12_ = ZEXT812(0);
                auVar89._12_4_ = 0;
                auVar107 = vcmpss_avx(auVar89,ZEXT416((uint)fVar76),1);
                auVar209._8_4_ = 0x3f800000;
                auVar209._0_8_ = 0x3f8000003f800000;
                auVar209._12_4_ = 0x3f800000;
                auVar107 = vblendvps_avx(ZEXT416((uint)*pfVar12),auVar209,auVar107);
                fVar75 = auVar107._0_4_ * fVar76;
                break;
              case 3:
                auVar107 = vmaxss_avx(auVar107,ZEXT416((uint)*pfVar12));
                fVar75 = auVar107._0_4_;
                if (pfVar12[1] < auVar107._0_4_) {
                  fVar75 = pfVar12[1];
                }
                break;
              case 4:
                auVar107 = vminss_avx(auVar107,ZEXT416(0x42b0c0a5));
                auVar132._0_8_ = auVar107._0_8_ ^ 0x8000000080000000;
                auVar132._8_4_ = auVar107._8_4_ ^ 0x80000000;
                auVar132._12_4_ = auVar107._12_4_ ^ 0x80000000;
                auVar107 = vcmpss_avx(auVar107,ZEXT416(0xc2b0c0a5),1);
                auVar208._8_4_ = 0x42b0c0a5;
                auVar208._0_8_ = 0x42b0c0a542b0c0a5;
                auVar208._12_4_ = 0x42b0c0a5;
                auVar107 = vblendvps_avx(auVar132,auVar208,auVar107);
                fVar76 = expf(auVar107._0_4_);
                fVar75 = 1.0 / (fVar76 + 1.0);
                break;
              case 5:
                fVar75 = expf(fVar76);
                fVar75 = logf(fVar75 + 1.0);
                fVar75 = tanhf(fVar75);
                fVar75 = fVar75 * fVar76;
                break;
              case 6:
                fVar2 = *pfVar12;
                fVar246 = -pfVar12[1] / fVar2;
                fVar75 = 0.0;
                if ((fVar246 <= fVar76) && (fVar75 = fVar76, fVar76 <= fVar246 + 1.0 / fVar2)) {
                  auVar107 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar107,ZEXT416((uint)pfVar12[1])
                                            );
                  fVar75 = auVar107._0_4_ * fVar76;
                }
              }
            }
            *(float *)ppp_Var56 = fVar75;
            ppp_Var56 = (_func_int ***)((long)ppp_Var56 + 4);
            iVar44 = iVar44 + 1;
          }
        }
      }
    }
    pvVar67 = local_b8.data;
    pp_Var50 = this->_vptr_Deconvolution_x86_fma;
    if ((iVar61 == 1) && (uVar51 == 1)) {
      iVar61 = uVar9 * (int)local_40;
      lVar49 = local_b8.cstep * local_b8.elemsize;
      iVar59 = bottom_blob->w;
      iVar7 = bottom_blob->h;
      lVar71 = (long)local_b8.w;
      uVar73 = 0;
      uVar65 = (ulong)(uint)bottom_blob->c;
      if (bottom_blob->c < 1) {
        uVar65 = uVar73;
      }
      uVar55 = 0;
      if (0 < local_b8.w) {
        uVar55 = (ulong)(uint)local_b8.w;
      }
      uVar47 = (ulong)(uint)local_b8.h;
      if (local_b8.h < 1) {
        uVar47 = uVar73;
      }
      for (; (long)uVar73 < (long)*(int *)(&this->field_0xd0 + (long)pp_Var50[-3]);
          uVar73 = uVar73 + 1) {
        local_128 = (_func_int ***)((long)(_func_int ***)pvVar67 + lVar49 * uVar73);
        for (iVar58 = 0; iVar58 != (int)uVar47; iVar58 = iVar58 + 1) {
          pp_Var15 = this->_vptr_Deconvolution_x86_fma;
          sVar13 = (this->weight_data_tm).cstep;
          sVar14 = (this->weight_data_tm).elemsize;
          pvVar68 = (this->weight_data_tm).data;
          for (uVar74 = 0; uVar74 != uVar55; uVar74 = uVar74 + 1) {
            p_Var45 = pp_Var15[-3];
            if (*(int *)(&this->field_0x10c + (long)p_Var45) == 0) {
              auVar97 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            else {
              auVar97 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var45) + uVar73 * 4
                                         ));
            }
            pvVar70 = (void *)(sVar13 * uVar73 * sVar14 + (long)pvVar68);
            for (uVar48 = 0; uVar48 != uVar65; uVar48 = uVar48 + 1) {
              p_Var54 = this->_vptr_Deconvolution_x86_fma[-3];
              iVar69 = 0;
              iVar64 = *(int *)(&this->field_0xd8 + (long)p_Var54);
              if (*(int *)(&this->field_0xd8 + (long)p_Var54) < 1) {
                iVar64 = iVar69;
              }
              for (; iVar69 != iVar64; iVar69 = iVar69 + 1) {
                iVar42 = *(int *)(&this->field_0xe0 + (long)p_Var54) * iVar69 + (iVar58 - iVar53);
                if (((-1 < iVar42) &&
                    (iVar43 = iVar42 / *(int *)(&this->field_0xe8 + (long)p_Var54),
                    iVar42 % *(int *)(&this->field_0xe8 + (long)p_Var54) == 0)) && (iVar43 < iVar7))
                {
                  uVar51 = *(uint *)(&this->field_0xd4 + (long)p_Var54);
                  uVar66 = 0;
                  if (0 < (int)uVar51) {
                    uVar66 = (ulong)uVar51;
                  }
                  for (uVar63 = 0; uVar66 != uVar63; uVar63 = uVar63 + 1) {
                    iVar42 = *(int *)(&this->field_0xdc + (long)p_Var54) * (int)uVar63 +
                             ((int)uVar74 - iVar52);
                    if (((-1 < iVar42) &&
                        (iVar44 = iVar42 / *(int *)(&this->field_0xe4 + (long)p_Var54),
                        iVar42 % *(int *)(&this->field_0xe4 + (long)p_Var54) == 0)) &&
                       (iVar44 < iVar59)) {
                      auVar107 = vfmadd231ss_fma(auVar97._0_16_,
                                                 ZEXT416(*(uint *)((long)pvVar70 +
                                                                  uVar63 * 4 +
                                                                  (long)(int)(uVar51 * iVar69) * 4))
                                                 ,ZEXT416(*(uint *)((long)bottom_blob->data +
                                                                   (long)iVar44 * 4 +
                                                                   (long)iVar43 *
                                                                   (long)bottom_blob->w *
                                                                   bottom_blob->elemsize +
                                                                   bottom_blob->cstep *
                                                                   bottom_blob->elemsize * uVar48)))
                      ;
                      auVar97 = ZEXT1664(auVar107);
                    }
                  }
                }
              }
              pvVar70 = (void *)((long)pvVar70 + (long)iVar61 * 4);
            }
            auVar107 = auVar97._0_16_;
            fVar75 = auVar97._0_4_;
            fVar76 = fVar75;
            switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var45)) {
            case 1:
              auVar107 = vmaxss_avx(auVar107,ZEXT416(0));
              fVar76 = auVar107._0_4_;
              break;
            case 2:
              auVar107 = vcmpss_avx(ZEXT816(0) << 0x40,auVar107,1);
              auVar211._8_4_ = 0x3f800000;
              auVar211._0_8_ = 0x3f8000003f800000;
              auVar211._12_4_ = 0x3f800000;
              auVar107 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var45)),
                                       auVar211,auVar107);
              fVar76 = auVar107._0_4_ * fVar75;
              break;
            case 3:
              fVar75 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var45))[1];
              auVar107 = vmaxss_avx(auVar107,ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var45)
                                                    ));
              fVar76 = auVar107._0_4_;
              if (fVar75 < auVar107._0_4_) {
                fVar76 = fVar75;
              }
              break;
            case 4:
              auVar107 = vminss_avx(auVar107,ZEXT416(0x42b0c0a5));
              auVar133._0_8_ = auVar107._0_8_ ^ 0x8000000080000000;
              auVar133._8_4_ = auVar107._8_4_ ^ 0x80000000;
              auVar133._12_4_ = auVar107._12_4_ ^ 0x80000000;
              auVar107 = vcmpss_avx(auVar107,ZEXT416(0xc2b0c0a5),1);
              auVar210._8_4_ = 0x42b0c0a5;
              auVar210._0_8_ = 0x42b0c0a542b0c0a5;
              auVar210._12_4_ = 0x42b0c0a5;
              auVar107 = vblendvps_avx(auVar133,auVar210,auVar107);
              fVar76 = expf(auVar107._0_4_);
              fVar76 = 1.0 / (fVar76 + 1.0);
              break;
            case 5:
              fVar76 = expf(fVar75);
              fVar76 = logf(fVar76 + 1.0);
              fVar76 = tanhf(fVar76);
              fVar76 = fVar76 * fVar75;
              break;
            case 6:
              fVar2 = **(float **)(&this->field_0x118 + (long)p_Var45);
              fVar246 = (*(float **)(&this->field_0x118 + (long)p_Var45))[1];
              fVar247 = -fVar246 / fVar2;
              fVar76 = 0.0;
              if ((fVar247 <= fVar75) && (fVar76 = fVar75, fVar75 <= fVar247 + 1.0 / fVar2)) {
                auVar107 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar107,ZEXT416((uint)fVar246));
                fVar76 = auVar107._0_4_ * fVar75;
              }
            }
            *(float *)((long)local_128 + uVar74 * 4) = fVar76;
          }
          local_128 = (_func_int ***)((long)local_128 + lVar71 * 4);
        }
      }
      pp_Var50 = this->_vptr_Deconvolution_x86_fma;
    }
    pMVar35 = local_60;
    Deconvolution::cut_padding
              ((Deconvolution *)((long)&this->_vptr_Deconvolution_x86_fma + (long)pp_Var50[-3]),
               &local_b8,local_60,local_38);
    if ((pMVar35->data == (void *)0x0) || (iVar59 = 0, (long)pMVar35->c * pMVar35->cstep == 0)) {
      iVar59 = -100;
    }
  }
  piVar11 = (int *)CONCAT44(local_b8.refcount._4_4_,(int)local_b8.refcount);
  if (piVar11 != (int *)0x0) {
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        free(local_b8.data);
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar59;
}

Assistant:

int Deconvolution_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __AVX__

    if (elempack == 4 && out_elempack == 4)
    {
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}